

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

lzham_decompress_status_t
lzham::lzham_lib_decompress
          (lzham_decompress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  uint *puVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  size_t sVar4;
  byte *pbVar5;
  long lVar6;
  ulong uVar7;
  char cVar8;
  bool bVar9;
  lzham_decompress_status_t lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong *puVar16;
  ushort *puVar17;
  uint64 uVar18;
  long *plVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  uint *puVar26;
  uint *puVar27;
  decoder_tables *pdVar28;
  undefined4 uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  void *pvVar33;
  undefined4 uVar34;
  lzham_decompressor *pState;
  raw_quasi_adaptive_huffman_data_model *prVar35;
  uint *puVar36;
  undefined4 uVar37;
  ulong uVar38;
  uint uVar39;
  undefined4 uVar40;
  byte *pbVar41;
  uint uVar42;
  uint uVar43;
  byte *pbVar44;
  ulong uVar45;
  int iVar46;
  size_t sVar47;
  int iVar48;
  uint uVar49;
  undefined4 uStack_ac;
  int iStack_a8;
  int iStack_a4;
  undefined8 uStack_a0;
  uint uStack_8c;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  undefined8 uStack_58;
  uint uStack_50;
  uint *puStack_40;
  
  if (((((p == (lzham_decompress_state_ptr)0x0) || (pOut_buf_size == (size_t *)0x0)) ||
       (pIn_buf_size == (size_t *)0x0)) || (*(int *)((long)p + 0x58c) == 0)) ||
     (((pIn_buf == (lzham_uint8 *)0x0 && (*pIn_buf_size != 0)) ||
      (sVar4 = *pOut_buf_size, pOut_buf == (lzham_uint8 *)0x0 && sVar4 != 0)))) {
    return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  *(lzham_uint8 **)((long)p + 0x550) = pIn_buf;
  *(size_t **)((long)p + 0x558) = pIn_buf_size;
  *(lzham_uint8 **)((long)p + 0x560) = pOut_buf;
  *(size_t **)((long)p + 0x568) = pOut_buf_size;
  *(bool *)((long)p + 0x570) = no_more_input_bytes_flag != 0;
  if (*(int *)((long)p + 0x590) != 0) {
    if (*(lzham_uint8 **)((long)p + 0x578) == (lzham_uint8 *)0x0) {
      *(lzham_uint8 **)((long)p + 0x578) = pOut_buf;
      *(size_t *)((long)p + 0x580) = sVar4;
      lVar10 = lzham_decompressor::decompress<true>((lzham_decompressor *)p);
      return lVar10;
    }
    if (*(lzham_uint8 **)((long)p + 0x578) != pOut_buf) {
      return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
    }
    if (*(size_t *)((long)p + 0x580) != sVar4) {
      return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
    }
    puVar16 = *(ulong **)((long)p + 0x568);
    uVar32 = *puVar16;
    pbVar5 = *(byte **)((long)p + 0x560);
    iVar48 = *p;
    if (iVar48 < 0x22b) {
      if (iVar48 < 0x17c) {
        if (iVar48 < 0x137) {
          if (iVar48 < 0x11a) {
            if (iVar48 == 0) {
              uStack_68 = 0;
              bVar9 = symbol_codec::start_decoding
                                ((symbol_codec *)((long)p + 0x490),*(uint8 **)((long)p + 0x550),
                                 **(size_t **)((long)p + 0x558),*(bool *)((long)p + 0x570),
                                 (need_bytes_func_ptr)0x0,(void *)0x0);
              if (bVar9) {
                uVar14 = *(uint *)((long)p + 0x510);
                uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
                uStack_78 = *(uint **)((long)p + 0x498);
                uVar22 = *(ulong *)((long)p + 0x4c8);
                iVar48 = *(int *)((long)p + 0x4d0);
                uStack_58 = 0;
                uVar11 = 0;
                uStack_8c = 0;
                iStack_a8 = 0;
                uStack_a0._0_4_ = 0;
                iStack_a4 = 0;
                iVar46 = 0;
                goto LAB_001106bd;
              }
              return LZHAM_DECOMP_STATUS_FAILED;
            }
            if (iVar48 == 0xff) {
              uStack_78 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar23 = *plVar19;
              *(uint **)((long)p + 0x490) = uStack_78;
              *(uint **)((long)p + 0x498) = uStack_78;
              *(long *)((long)p + 0x4a8) = lVar23;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_78 + lVar23);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              puVar26 = uStack_78;
              if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_00111641:
                *plVar19 = (long)uStack_78 - (long)puVar26;
                *puVar16 = 0;
                *(undefined4 *)p = 0xff;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              iVar46 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uVar11 = *(uint *)((long)p + 0x4f44);
              uStack_58 = (ulong)*(uint *)((long)p + 0x4f48) << 0x20;
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar14 = *(uint *)((long)p + 0x510);
              uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
              uVar22 = *(ulong *)((long)p + 0x4c8);
              iVar48 = *(int *)((long)p + 0x4d0);
              if (lVar23 < 1) {
                uVar32 = 0;
                goto LAB_0010fb07;
              }
LAB_0010fafd:
              uVar32 = (ulong)(byte)*uStack_78;
              uStack_78 = (uint *)((long)uStack_78 + 1);
LAB_0010fb07:
              cVar8 = (char)iVar48;
              iVar48 = iVar48 + 8;
              uVar22 = uVar22 | uVar32 << (0x38U - cVar8 & 0x3f);
LAB_001106bd:
              if (1 < iVar48) {
                uVar22 = uVar22 * 4;
                lVar23 = 0;
                do {
                  raw_quasi_adaptive_huffman_data_model::init
                            ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar23 + 0x5a0),
                             (EVP_PKEY_CTX *)0x0);
                  lVar23 = lVar23 + 0x80;
                } while (lVar23 != 0x2000);
                lVar23 = 0;
                do {
                  raw_quasi_adaptive_huffman_data_model::init
                            ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar23 + 0x25a0),
                             (EVP_PKEY_CTX *)0x0);
                  lVar23 = lVar23 + 0x80;
                } while (lVar23 != 0x2000);
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0),
                           (EVP_PKEY_CTX *)0x0);
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4620),
                           (EVP_PKEY_CTX *)0x0);
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4720),
                           (EVP_PKEY_CTX *)0x0);
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x46a0),
                           (EVP_PKEY_CTX *)0x0);
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x47a0),
                           (EVP_PKEY_CTX *)0x0);
                uVar30 = iVar48 - 2;
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820),
                           (EVP_PKEY_CTX *)0x0);
                uVar38 = (ulong)uVar11;
                uVar45 = uStack_58 >> 0x20;
                goto LAB_00113128;
              }
              if (uStack_78 == *(uint **)((long)p + 0x4a0)) goto LAB_0011262e;
              goto LAB_0010fafd;
            }
          }
          else {
            if (iVar48 == 0x11a) {
              puVar26 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar23 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar26;
              *(uint **)((long)p + 0x498) = puVar26;
              *(long *)((long)p + 0x4a8) = lVar23;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_78 = puVar26;
              if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                iVar46 = *(int *)((long)p + 0x4f2c);
                iStack_a4 = *(int *)((long)p + 0x4f30);
                uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
                iStack_a8 = *(int *)((long)p + 0x4f38);
                uStack_8c = *(uint *)((long)p + 0x4f3c);
                uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
                uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
                uVar14 = *(uint *)((long)p + 0x510);
                uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
                uVar22 = *(ulong *)((long)p + 0x4c8);
                uVar30 = *(uint *)((long)p + 0x4d0);
                if (lVar23 < 1) {
                  uVar32 = 0;
                  uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
                  goto LAB_0011026f;
                }
                uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
                goto LAB_00110266;
              }
LAB_00111731:
              *plVar19 = (long)uStack_78 - (long)puVar26;
              *puVar16 = 0;
              *(undefined4 *)p = 0x11a;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar48 == 0x126) {
              puVar26 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar23 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar26;
              *(uint **)((long)p + 0x498) = puVar26;
              *(long *)((long)p + 0x4a8) = lVar23;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_78 = puVar26;
              if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_00111961:
                *plVar19 = (long)uStack_78 - (long)puVar26;
                *puVar16 = 0;
                *(undefined4 *)p = 0x126;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              iVar46 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar40 = *(undefined4 *)((long)p + 0x510);
              uStack_a0._4_4_ = *(undefined4 *)((long)p + 0x514);
              uVar22 = *(ulong *)((long)p + 0x4c8);
              uVar14 = *(uint *)((long)p + 0x4d0);
              if (lVar23 < 1) goto LAB_00112700;
              do {
                uVar38 = (ulong)(byte)*uStack_78;
                uStack_78 = (uint *)((long)uStack_78 + 1);
                uVar11 = uVar14;
                while( true ) {
                  uVar14 = uVar11 + 8;
                  uVar22 = uVar22 | uVar38 << (0x38U - (char)uVar11 & 0x3f);
                  uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
                  if (0x17 < (int)uVar14) {
                    uVar31 = uVar22 << 0x18;
                    uVar11 = uVar11 - 0x10;
                    uVar30 = (uint)(uVar22 >> 0x28) + 1;
                    if ((uVar14 & 7) != 0) goto LAB_00110cd0;
                    goto LAB_00112ed0;
                  }
                  if (uStack_78 != *(uint **)((long)p + 0x4a0)) break;
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(undefined4 *)((long)p + 0x510) = uVar40;
                    *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                    *(ulong *)((long)p + 0x4c8) = uVar22;
                    *(uint *)((long)p + 0x4d0) = uVar14;
                    *(uint **)((long)p + 0x498) = uStack_78;
                    *(undefined4 *)((long)p + 0x4f90) = *(undefined4 *)((long)p + 0x4f90);
                    *(int *)((long)p + 0x4f2c) = iVar46;
                    *(int *)((long)p + 0x4f30) = iStack_a4;
                    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                    *(int *)((long)p + 0x4f38) = iStack_a8;
                    *(uint *)((long)p + 0x4f3c) = uStack_8c;
                    *(uint *)((long)p + 0x4f44) = *(uint *)((long)p + 0x4f44);
                    *(uint *)((long)p + 0x4f48) = *(uint *)((long)p + 0x4f48);
                    *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
                    puVar26 = *(uint **)((long)p + 0x490);
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    goto LAB_00111961;
                  }
LAB_00112700:
                  uVar38 = 0;
                  uVar11 = uVar14;
                }
              } while( true );
            }
            if (iVar48 == 0x129) {
              puVar26 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar23 = *plVar19;
              *(uint **)((long)p + 0x490) = puVar26;
              *(uint **)((long)p + 0x498) = puVar26;
              *(long *)((long)p + 0x4a8) = lVar23;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              uStack_78 = puVar26;
              if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_00111779:
                *plVar19 = (long)uStack_78 - (long)puVar26;
                *puVar16 = 0;
                *(undefined4 *)p = 0x129;
                return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
              }
              uVar30 = *(uint *)((long)p + 0x4f90);
              iVar46 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uVar14 = *(uint *)((long)p + 0x4f44);
              uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar40 = *(undefined4 *)((long)p + 0x510);
              uStack_a0._4_4_ = *(undefined4 *)((long)p + 0x514);
              uVar31 = *(ulong *)((long)p + 0x4c8);
              uVar11 = *(uint *)((long)p + 0x4d0);
              if (lVar23 < 1) goto LAB_001126f1;
              do {
                uVar22 = (ulong)(byte)*uStack_78;
                uStack_78 = (uint *)((long)uStack_78 + 1);
                while( true ) {
                  cVar8 = (char)uVar11;
                  uVar11 = uVar11 + 8;
                  uVar31 = uVar31 | uVar22 << (0x38U - cVar8 & 0x3f);
                  uVar38 = (ulong)uVar14;
LAB_00110cd0:
                  if (-1 < (int)uVar11) {
                    bVar20 = (byte)uVar11;
                    uVar11 = uVar11 & 0x7ffffff8;
                    uVar31 = uVar31 << (bVar20 & 7);
                    goto LAB_00112ed0;
                  }
                  uVar14 = (uint)uVar38;
                  if (uStack_78 != *(uint **)((long)p + 0x4a0)) break;
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(undefined4 *)((long)p + 0x510) = uVar40;
                    *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                    *(ulong *)((long)p + 0x4c8) = uVar31;
                    *(uint *)((long)p + 0x4d0) = uVar11;
                    *(uint **)((long)p + 0x498) = uStack_78;
                    *(uint *)((long)p + 0x4f90) = uVar30;
                    *(int *)((long)p + 0x4f2c) = iVar46;
                    *(int *)((long)p + 0x4f30) = iStack_a4;
                    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                    *(int *)((long)p + 0x4f38) = iStack_a8;
                    *(uint *)((long)p + 0x4f3c) = uStack_8c;
                    *(uint *)((long)p + 0x4f44) = uVar14;
                    *(int *)((long)p + 0x4f48) = (int)uVar45;
                    *(int *)((long)p + 0x4f18) = (int)uStack_68;
                    puVar26 = *(uint **)((long)p + 0x490);
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    goto LAB_00111779;
                  }
LAB_001126f1:
                  uVar22 = 0;
                }
              } while( true );
            }
          }
          goto switchD_0010f80a_caseD_338;
        }
        if (0x155 < iVar48) {
          if (iVar48 == 0x156) {
LAB_0011309b:
            *(undefined4 *)p = 0x156;
            return LZHAM_DECOMP_STATUS_FAILED;
          }
          if (iVar48 == 0x15a) {
            uVar30 = *(uint *)((long)p + 0x4f90);
            iVar46 = *(int *)((long)p + 0x4f2c);
            iStack_a4 = *(int *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
            iStack_a8 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            lVar23 = *(long *)((long)p + 0x550);
            puVar16 = *(ulong **)((long)p + 0x558);
            uVar22 = *puVar16;
            *(long *)((long)p + 0x490) = lVar23;
            *(long *)((long)p + 0x498) = lVar23;
            *(ulong *)((long)p + 0x4a8) = uVar22;
            *(ulong *)((long)p + 0x4a0) = lVar23 + uVar22;
            *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
            uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
            uVar31 = 0;
            goto LAB_00112f98;
          }
          if (iVar48 == 0x16c) {
LAB_001130bd:
            *(undefined4 *)p = 0x16c;
            return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
          }
          goto switchD_0010f80a_caseD_338;
        }
        if (iVar48 == 0x137) {
LAB_00112f70:
          *(undefined4 *)p = 0x137;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
        if (iVar48 != 0x13f) goto switchD_0010f80a_caseD_338;
        uStack_78 = *(uint **)((long)p + 0x550);
        lVar23 = **(long **)((long)p + 0x558);
        *(uint **)((long)p + 0x490) = uStack_78;
        *(uint **)((long)p + 0x498) = uStack_78;
        *(long *)((long)p + 0x4a8) = lVar23;
        *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_78);
        *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
        pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
        *(void **)((long)p + 0x4f50) = pvVar33;
        uVar22 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
        *(ulong *)((long)p + 0x4f58) = uVar22;
        if (uVar22 != 0) {
          uVar32 = *puVar16;
          if (uVar22 < *puVar16) {
            uVar32 = uVar22;
          }
          *(ulong *)((long)p + 0x4f60) = uVar32;
          if (*(int *)((long)p + 0x594) == 0) {
            memcpy(pbVar5,pvVar33,uVar32);
          }
          else if (uVar32 != 0) {
            uVar22 = 0;
            do {
              sVar47 = uVar32 - uVar22;
              if (0x1fff < sVar47) {
                sVar47 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x560) + uVar22),
                     (void *)(*(long *)((long)p + 0x4f50) + uVar22),sVar47);
              uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar22),sVar47,
                               *(uint *)((long)p + 0x548));
              *(uint *)((long)p + 0x548) = uVar13;
              uVar22 = uVar22 + sVar47;
              uVar32 = *(ulong *)((long)p + 0x4f60);
            } while (uVar22 < uVar32);
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
          *(undefined4 *)p = 0x13f;
          return LZHAM_DECOMP_STATUS_NOT_FINISHED;
        }
        uVar30 = *(uint *)((long)p + 0x4f90);
        iVar46 = *(int *)((long)p + 0x4f2c);
        iStack_a4 = *(int *)((long)p + 0x4f30);
        uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
        iStack_a8 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
        uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
        uVar40 = *(undefined4 *)((long)p + 0x510);
        uStack_a0._4_4_ = *(undefined4 *)((long)p + 0x514);
        uVar22 = *(ulong *)((long)p + 0x4c8);
        uVar11 = *(uint *)((long)p + 0x4d0);
        uStack_68 = 0;
        while (uVar30 = uVar30 - 1, uVar31 = uVar22, uVar30 != 0) {
LAB_00112ed0:
          if ((int)uVar11 < 8) goto LAB_00112efb;
          uVar22 = uVar31 << 8;
          uVar11 = uVar11 - 8;
          if (uVar32 <= uStack_68) {
            *(undefined4 *)((long)p + 0x510) = uVar40;
            *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
            *(ulong *)((long)p + 0x4c8) = uVar22;
            *(uint *)((long)p + 0x4d0) = uVar11;
            *(uint **)((long)p + 0x498) = uStack_78;
            **(long **)((long)p + 0x558) = (long)uStack_78 - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            goto LAB_00112f70;
          }
          pbVar5[uStack_68] = (byte)(uVar31 >> 0x38);
          uStack_68 = (ulong)((int)uStack_68 + 1);
        }
        uVar30 = 0;
LAB_00112efb:
        *(undefined4 *)((long)p + 0x510) = uVar40;
        *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
        *(ulong *)((long)p + 0x4c8) = uVar31;
        *(uint *)((long)p + 0x4d0) = uVar11;
        *(uint **)((long)p + 0x498) = uStack_78;
      }
      else {
        if (0x1c8 < iVar48) {
          if (iVar48 < 0x1e6) {
            if (iVar48 == 0x1c9) {
              uStack_78 = *(uint **)((long)p + 0x550);
              plVar19 = *(long **)((long)p + 0x558);
              lVar23 = *plVar19;
              *(uint **)((long)p + 0x490) = uStack_78;
              *(uint **)((long)p + 0x498) = uStack_78;
              *(long *)((long)p + 0x4a8) = lVar23;
              *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_78 + lVar23);
              *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
              puVar26 = uStack_78;
              if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
                iVar48 = *(int *)((long)p + 0x4f2c);
                iStack_a4 = *(int *)((long)p + 0x4f30);
                uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
                iStack_a8 = *(int *)((long)p + 0x4f38);
                uStack_8c = *(uint *)((long)p + 0x4f3c);
                uVar11 = *(uint *)((long)p + 0x4f44);
                uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
                uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
                uVar14 = *(uint *)((long)p + 0x510);
                uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
                uVar31 = *(ulong *)((long)p + 0x4c8);
                uVar30 = *(uint *)((long)p + 0x4d0);
                if (0 < lVar23) goto LAB_00110b58;
                goto LAB_0011278e;
              }
LAB_00111945:
              *plVar19 = (long)uStack_78 - (long)puVar26;
              *puVar16 = 0;
              *(undefined4 *)p = 0x1c9;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar48 == 0x1dd) {
LAB_0010fea3:
              *(undefined4 *)p = 0x1dd;
              return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
            }
            goto switchD_0010f80a_caseD_338;
          }
          if (iVar48 == 0x1e6) {
            puVar27 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = puVar27;
            *(uint **)((long)p + 0x498) = puVar27;
            *(long *)((long)p + 0x4a8) = lVar23;
            puVar26 = (uint *)((long)puVar27 + lVar23);
            *(uint **)((long)p + 0x4a0) = puVar26;
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            uStack_78 = puVar27;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              iVar48 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uVar39 = *(uint *)((long)p + 0x4f44);
              uVar40 = *(undefined4 *)((long)p + 0x4f48);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar14 = *(uint *)((long)p + 0x510);
              uVar11 = *(uint *)((long)p + 0x514);
              uVar22 = *(ulong *)((long)p + 0x4c8);
              uVar30 = *(uint *)((long)p + 0x4d0);
              prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
              pdVar28 = prVar35->m_pDecode_tables;
              goto LAB_001137ad;
            }
LAB_0011387e:
            *plVar19 = (long)uStack_78 - (long)puVar27;
            *puVar16 = 0;
            *(undefined4 *)p = 0x1e6;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar48 == 0x206) {
            uStack_78 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = uStack_78;
            *(uint **)((long)p + 0x498) = uStack_78;
            *(long *)((long)p + 0x4a8) = lVar23;
            puVar26 = (uint *)((long)uStack_78 + lVar23);
            *(uint **)((long)p + 0x4a0) = puVar26;
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puVar27 = uStack_78;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              uVar21 = *(uint *)((long)p + 0x4f6c);
              iVar48 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uVar39 = *(uint *)((long)p + 0x4f44);
              uVar40 = *(undefined4 *)((long)p + 0x4f48);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar14 = *(uint *)((long)p + 0x510);
              uVar11 = *(uint *)((long)p + 0x514);
              uVar22 = *(ulong *)((long)p + 0x4c8);
              uVar30 = *(uint *)((long)p + 0x4d0);
              prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
              pdVar28 = prVar35->m_pDecode_tables;
              goto LAB_001138b5;
            }
LAB_00113a18:
            *plVar19 = (long)uStack_78 - (long)puVar27;
            *puVar16 = 0;
            *(undefined4 *)p = 0x206;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar48 != 0x21c) goto switchD_0010f80a_caseD_338;
          uStack_78 = *(uint **)((long)p + 0x550);
          lVar23 = **(long **)((long)p + 0x558);
          *(uint **)((long)p + 0x490) = uStack_78;
          *(uint **)((long)p + 0x498) = uStack_78;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_78);
          *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
          pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
          *(void **)((long)p + 0x4f50) = pvVar33;
          uVar22 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
          *(ulong *)((long)p + 0x4f58) = uVar22;
          if (uVar22 != 0) {
            uVar32 = *puVar16;
            if (uVar22 < *puVar16) {
              uVar32 = uVar22;
            }
            *(ulong *)((long)p + 0x4f60) = uVar32;
            if (*(int *)((long)p + 0x594) == 0) {
              memcpy(pbVar5,pvVar33,uVar32);
            }
            else if (uVar32 != 0) {
              uVar22 = 0;
              do {
                sVar47 = uVar32 - uVar22;
                if (0x1fff < sVar47) {
                  sVar47 = 0x2000;
                }
                memcpy((void *)(*(long *)((long)p + 0x560) + uVar22),
                       (void *)(*(long *)((long)p + 0x4f50) + uVar22),sVar47);
                uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar22),sVar47,
                                 *(uint *)((long)p + 0x548));
                *(uint *)((long)p + 0x548) = uVar13;
                uVar22 = uVar22 + sVar47;
                uVar32 = *(ulong *)((long)p + 0x4f60);
              } while (uVar22 < uVar32);
            }
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
            *(undefined4 *)p = 0x21c;
            return LZHAM_DECOMP_STATUS_NOT_FINISHED;
          }
          iVar48 = *(int *)((long)p + 0x4f2c);
          iStack_a4 = *(int *)((long)p + 0x4f30);
          uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
          iStack_a8 = *(int *)((long)p + 0x4f38);
          uStack_8c = *(uint *)((long)p + 0x4f3c);
          uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
          uVar11 = *(uint *)((long)p + 0x4f48);
          uVar14 = *(uint *)((long)p + 0x510);
          uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
          uVar22 = *(ulong *)((long)p + 0x4c8);
          uVar30 = *(uint *)((long)p + 0x4d0);
          goto LAB_0010f7e1;
        }
        switch(iVar48) {
        case 0x18d:
          puVar26 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar26;
          *(uint **)((long)p + 0x498) = puVar26;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          uStack_78 = puVar26;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_00111995:
            *plVar19 = (long)uStack_78 - (long)puVar26;
            *puVar16 = 0;
            *(undefined4 *)p = 0x18d;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          uVar40 = *(undefined4 *)((long)p + 0x4f2c);
          iStack_a4 = *(undefined4 *)((long)p + 0x4f30);
          uStack_a0._0_4_ = *(undefined4 *)((long)p + 0x4f34);
          iStack_a8 = *(undefined4 *)((long)p + 0x4f38);
          uVar29 = *(undefined4 *)((long)p + 0x4f3c);
          uVar34 = *(undefined4 *)((long)p + 0x4f44);
          uVar37 = *(undefined4 *)((long)p + 0x4f48);
          uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
          uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
          uVar22 = *(ulong *)((long)p + 0x4c8);
          iVar46 = *(int *)((long)p + 0x4d0);
          if (lVar23 < 1) goto LAB_0011270f;
          do {
            uVar38 = (ulong)(byte)*uStack_78;
            uStack_78 = (uint *)((long)uStack_78 + 1);
            iVar48 = iVar46;
            while( true ) {
              iVar46 = iVar48 + 8;
              uVar22 = uVar22 | uVar38 << (0x38U - (char)iVar48 & 0x3f);
              if (7 < iVar46) {
                uVar38 = uVar22 << 8;
                uVar14 = (uint)(uVar22 >> 0x20) & 0xff000000;
                goto LAB_00111133;
              }
              if (uStack_78 != *(uint **)((long)p + 0x4a0)) break;
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(undefined4 *)((long)p + 0x510) = *(undefined4 *)((long)p + 0x510);
                *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                *(ulong *)((long)p + 0x4c8) = uVar22;
                *(int *)((long)p + 0x4d0) = iVar46;
                *(uint **)((long)p + 0x498) = uStack_78;
                *(undefined4 *)((long)p + 0x4f2c) = uVar40;
                *(int *)((long)p + 0x4f30) = iStack_a4;
                *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                *(int *)((long)p + 0x4f38) = iStack_a8;
                *(undefined4 *)((long)p + 0x4f3c) = uVar29;
                *(undefined4 *)((long)p + 0x4f44) = uVar34;
                *(undefined4 *)((long)p + 0x4f48) = uVar37;
                *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
                puVar26 = *(uint **)((long)p + 0x490);
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                goto LAB_00111995;
              }
LAB_0011270f:
              uVar38 = 0;
              iVar48 = iVar46;
            }
          } while( true );
        case 0x18e:
          puVar26 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar26;
          *(uint **)((long)p + 0x498) = puVar26;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          uStack_78 = puVar26;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar40 = *(undefined4 *)((long)p + 0x4f2c);
            iStack_a4 = *(undefined4 *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(undefined4 *)((long)p + 0x4f34);
            iStack_a8 = *(undefined4 *)((long)p + 0x4f38);
            uVar29 = *(undefined4 *)((long)p + 0x4f3c);
            uVar34 = *(undefined4 *)((long)p + 0x4f44);
            uVar37 = *(undefined4 *)((long)p + 0x4f48);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar14 = *(uint *)((long)p + 0x510);
            uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            iVar48 = *(int *)((long)p + 0x4d0);
            if (0 < lVar23) goto LAB_00111110;
            goto LAB_001126e2;
          }
LAB_001119b1:
          *plVar19 = (long)uStack_78 - (long)puVar26;
          *puVar16 = 0;
          *(undefined4 *)p = 0x18e;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        case 399:
          puVar26 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar26;
          *(uint **)((long)p + 0x498) = puVar26;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          uStack_78 = puVar26;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar40 = *(undefined4 *)((long)p + 0x4f2c);
            iStack_a4 = *(undefined4 *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(undefined4 *)((long)p + 0x4f34);
            iStack_a8 = *(undefined4 *)((long)p + 0x4f38);
            uVar29 = *(undefined4 *)((long)p + 0x4f3c);
            uVar34 = *(undefined4 *)((long)p + 0x4f44);
            uVar37 = *(undefined4 *)((long)p + 0x4f48);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar14 = *(uint *)((long)p + 0x510);
            uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
            uVar22 = *(ulong *)((long)p + 0x4c8);
            iVar48 = *(int *)((long)p + 0x4d0);
            if (0 < lVar23) goto LAB_00110175;
            goto LAB_001126d3;
          }
LAB_00111625:
          *plVar19 = (long)uStack_78 - (long)puVar26;
          *puVar16 = 0;
          *(undefined4 *)p = 399;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        case 400:
          uStack_78 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = uStack_78;
          *(uint **)((long)p + 0x498) = uStack_78;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_78 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar26 = uStack_78;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar40 = *(undefined4 *)((long)p + 0x4f2c);
            iStack_a4 = *(undefined4 *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(undefined4 *)((long)p + 0x4f34);
            iStack_a8 = *(undefined4 *)((long)p + 0x4f38);
            uVar29 = *(undefined4 *)((long)p + 0x4f3c);
            uVar34 = *(undefined4 *)((long)p + 0x4f44);
            uVar37 = *(undefined4 *)((long)p + 0x4f48);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar14 = *(uint *)((long)p + 0x510);
            uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            iVar48 = *(int *)((long)p + 0x4d0);
            if (0 < lVar23) goto LAB_001136ab;
            uVar22 = 0;
            goto LAB_001136b4;
          }
LAB_001118f1:
          *plVar19 = (long)uStack_78 - (long)puVar26;
          *puVar16 = 0;
          *(undefined4 *)p = 400;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar48 != 0x17c) goto switchD_0010f80a_caseD_338;
        uStack_78 = *(uint **)((long)p + 0x550);
        lVar23 = **(long **)((long)p + 0x558);
        *(uint **)((long)p + 0x490) = uStack_78;
        *(uint **)((long)p + 0x498) = uStack_78;
        *(long *)((long)p + 0x4a8) = lVar23;
        *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_78);
        *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
        pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
        *(void **)((long)p + 0x4f50) = pvVar33;
        uVar22 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
        *(ulong *)((long)p + 0x4f58) = uVar22;
        if (uVar22 != 0) {
          uVar32 = *puVar16;
          if (uVar22 < *puVar16) {
            uVar32 = uVar22;
          }
          *(ulong *)((long)p + 0x4f60) = uVar32;
          if (*(int *)((long)p + 0x594) == 0) {
            memcpy(pbVar5,pvVar33,uVar32);
          }
          else if (uVar32 != 0) {
            uVar22 = 0;
            do {
              sVar47 = uVar32 - uVar22;
              if (0x1fff < sVar47) {
                sVar47 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x560) + uVar22),
                     (void *)(*(long *)((long)p + 0x4f50) + uVar22),sVar47);
              uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar22),sVar47,
                               *(uint *)((long)p + 0x548));
              *(uint *)((long)p + 0x548) = uVar13;
              uVar22 = uVar22 + sVar47;
              uVar32 = *(ulong *)((long)p + 0x4f60);
            } while (uVar22 < uVar32);
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
          *(undefined4 *)p = 0x17c;
          return LZHAM_DECOMP_STATUS_NOT_FINISHED;
        }
        uVar30 = *(uint *)((long)p + 0x4f90);
        iVar46 = *(int *)((long)p + 0x4f2c);
        iStack_a4 = *(int *)((long)p + 0x4f30);
        uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
        iStack_a8 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
        uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
        uStack_68 = 0;
      }
      for (; uVar30 != 0; uVar30 = uVar30 - (int)uVar24) {
        uVar31 = (long)uStack_78 - *(long *)((long)p + 0x490);
        puVar16 = *(ulong **)((long)p + 0x558);
        uVar22 = *puVar16 - uVar31;
LAB_00112f98:
        if (uVar22 == 0) {
          *puVar16 = uVar31;
          **(undefined8 **)((long)p + 0x568) = 0;
          if (*(char *)((long)p + 0x570) != '\x01') {
            *(uint *)((long)p + 0x4f90) = uVar30;
            *(int *)((long)p + 0x4f2c) = iVar46;
            *(int *)((long)p + 0x4f30) = iStack_a4;
            *(int *)((long)p + 0x4f34) = (int)uStack_a0;
            *(int *)((long)p + 0x4f38) = iStack_a8;
            *(uint *)((long)p + 0x4f3c) = uStack_8c;
            *(int *)((long)p + 0x4f44) = (int)uVar38;
            *(int *)((long)p + 0x4f48) = (int)uVar45;
            *(int *)((long)p + 0x4f18) = (int)uStack_68;
            *(undefined4 *)p = 0x15a;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          goto LAB_0011309b;
        }
        uVar24 = (ulong)uVar30;
        if (uVar22 < uVar30) {
          uVar24 = uVar22;
        }
        uVar22 = (ulong)(uint)((int)uStack_68 + (int)uVar24);
        if (uVar32 < uVar22) {
          *puVar16 = uVar31;
          **(undefined8 **)((long)p + 0x568) = 0;
          goto LAB_001130bd;
        }
        memcpy(pbVar5 + uStack_68,(void *)(*(long *)((long)p + 0x550) + uVar31),uVar24);
        lVar23 = *(long *)((long)p + 0x550);
        lVar6 = **(long **)((long)p + 0x558);
        uStack_78 = (uint *)(uVar31 + lVar23 + uVar24);
        *(long *)((long)p + 0x490) = lVar23;
        *(uint **)((long)p + 0x498) = uStack_78;
        *(long *)((long)p + 0x4a8) = lVar6;
        *(long *)((long)p + 0x4a0) = lVar23 + lVar6;
        *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
        uStack_68 = uVar22;
      }
      uVar14 = *(uint *)((long)p + 0x510);
      uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
      uVar22 = *(ulong *)((long)p + 0x4c8);
      uVar30 = *(uint *)((long)p + 0x4d0);
      goto LAB_00113178;
    }
    if (iVar48 < 0x29c) {
      if (iVar48 < 0x243) {
        if (iVar48 < 0x231) {
          if (iVar48 == 0x22b) {
            uStack_78 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = uStack_78;
            *(uint **)((long)p + 0x498) = uStack_78;
            *(long *)((long)p + 0x4a8) = lVar23;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_78 + lVar23);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puVar26 = uStack_78;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              uVar39 = *(uint *)((long)p + 0x4f70);
              iVar46 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uVar43 = *(uint *)((long)p + 0x4f44);
              uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar42 = *(uint *)((long)p + 0x510);
              uVar11 = *(uint *)((long)p + 0x514);
              uVar38 = *(ulong *)((long)p + 0x4c8);
              uVar30 = *(uint *)((long)p + 0x4d0);
              if (0 < lVar23) goto LAB_00110921;
              goto LAB_00112816;
            }
LAB_0011190d:
            *plVar19 = (long)uStack_78 - (long)puVar26;
            *puVar16 = 0;
            *(undefined4 *)p = 0x22b;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar48 == 0x22e) {
            uStack_78 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = uStack_78;
            *(uint **)((long)p + 0x498) = uStack_78;
            *(long *)((long)p + 0x4a8) = lVar23;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_78 + lVar23);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puVar26 = uStack_78;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              uVar39 = *(uint *)((long)p + 0x4f70);
              iVar46 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uStack_80 = (ulong)*(uint *)((long)p + 0x4f44) << 0x20;
              uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar21 = *(uint *)((long)p + 0x510);
              uVar11 = *(uint *)((long)p + 0x514);
              uVar38 = *(ulong *)((long)p + 0x4c8);
              uVar30 = *(uint *)((long)p + 0x4d0);
              if (0 < lVar23) goto LAB_0010fc07;
              goto LAB_0011276a;
            }
LAB_0011165d:
            *plVar19 = (long)uStack_78 - (long)puVar26;
            *puVar16 = 0;
            *(undefined4 *)p = 0x22e;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
        }
        else {
          if (iVar48 == 0x231) {
            uStack_78 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = uStack_78;
            *(uint **)((long)p + 0x498) = uStack_78;
            *(long *)((long)p + 0x4a8) = lVar23;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_78 + lVar23);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puVar26 = uStack_78;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              uVar39 = *(uint *)((long)p + 0x4f70);
              iVar48 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uStack_80 = (ulong)*(uint *)((long)p + 0x4f44) << 0x20;
              uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar42 = *(uint *)((long)p + 0x510);
              uVar11 = *(uint *)((long)p + 0x514);
              uVar38 = *(ulong *)((long)p + 0x4c8);
              uVar30 = *(uint *)((long)p + 0x4d0);
              if (0 < lVar23) goto LAB_0011035e;
              goto LAB_0011273e;
            }
LAB_0011174d:
            *plVar19 = (long)uStack_78 - (long)puVar26;
            *puVar16 = 0;
            *(undefined4 *)p = 0x231;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar48 == 0x238) {
            puVar27 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = puVar27;
            *(uint **)((long)p + 0x498) = puVar27;
            *(long *)((long)p + 0x4a8) = lVar23;
            puVar26 = (uint *)((long)puVar27 + lVar23);
            *(uint **)((long)p + 0x4a0) = puVar26;
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            uStack_78 = puVar27;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              uVar39 = *(uint *)((long)p + 0x4f70);
              iVar48 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uStack_80 = (ulong)*(uint *)((long)p + 0x4f44) << 0x20;
              uVar14 = *(uint *)((long)p + 0x4f48);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar42 = *(uint *)((long)p + 0x510);
              uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
              uVar22 = *(ulong *)((long)p + 0x4c8);
              uVar30 = *(uint *)((long)p + 0x4d0);
              prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
              pdVar28 = prVar35->m_pDecode_tables;
              goto LAB_00113adc;
            }
LAB_00113c20:
            *plVar19 = (long)uStack_78 - (long)puVar27;
            *puVar16 = 0;
            *(undefined4 *)p = 0x238;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar48 == 0x240) {
            puVar36 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = puVar36;
            *(uint **)((long)p + 0x498) = puVar36;
            *(long *)((long)p + 0x4a8) = lVar23;
            puVar27 = (uint *)((long)puVar36 + lVar23);
            *(uint **)((long)p + 0x4a0) = puVar27;
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puVar26 = puVar36;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              uVar39 = *(uint *)((long)p + 0x4f70);
              iVar46 = *(int *)((long)p + 0x4f2c);
              iStack_a4 = *(int *)((long)p + 0x4f30);
              uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
              iStack_a8 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uStack_80 = (ulong)*(uint *)((long)p + 0x4f44) << 0x20;
              uVar14 = *(uint *)((long)p + 0x4f48);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar21 = *(uint *)((long)p + 0x510);
              uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
              uVar22 = *(ulong *)((long)p + 0x4c8);
              uVar30 = *(uint *)((long)p + 0x4d0);
              prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
              pdVar28 = prVar35->m_pDecode_tables;
              goto LAB_00113cd6;
            }
LAB_00113f1d:
            *plVar19 = (long)puVar26 - (long)puVar36;
            *puVar16 = 0;
            *(undefined4 *)p = 0x240;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
        }
      }
      else if (iVar48 < 0x266) {
        if (iVar48 == 0x243) {
          puVar27 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar27;
          *(uint **)((long)p + 0x498) = puVar27;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar27 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar26 = puVar27;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar39 = *(uint *)((long)p + 0x4f70);
            iVar46 = *(int *)((long)p + 0x4f2c);
            iStack_a4 = *(int *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
            iStack_a8 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_80 = (ulong)*(uint *)((long)p + 0x4f44) << 0x20;
            uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar21 = *(uint *)((long)p + 0x510);
            uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            uVar30 = *(uint *)((long)p + 0x4d0);
            if (0 < lVar23) goto LAB_00110a45;
            uVar22 = 0;
            goto LAB_00110a4b;
          }
LAB_00111929:
          *plVar19 = (long)puVar26 - (long)puVar27;
          *puVar16 = 0;
          *(undefined4 *)p = 0x243;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar48 == 0x24c) {
          puVar27 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar27;
          *(uint **)((long)p + 0x498) = puVar27;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar27 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar26 = puVar27;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar39 = *(uint *)((long)p + 0x4f70);
            iVar46 = *(int *)((long)p + 0x4f2c);
            iStack_a4 = *(int *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
            iStack_a8 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_80 = (ulong)*(uint *)((long)p + 0x4f44) << 0x20;
            uStack_58 = (ulong)*(uint *)((long)p + 0x4f48) << 0x20;
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar21 = *(uint *)((long)p + 0x510);
            uVar11 = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            uVar30 = *(uint *)((long)p + 0x4d0);
            if (0 < lVar23) goto LAB_0010fe2e;
            uVar22 = 0;
            goto LAB_0010fe38;
          }
LAB_00111715:
          *plVar19 = (long)puVar26 - (long)puVar27;
          *puVar16 = 0;
          *(undefined4 *)p = 0x24c;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      else {
        if (iVar48 == 0x266) {
          puVar27 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar27;
          *(uint **)((long)p + 0x498) = puVar27;
          *(long *)((long)p + 0x4a8) = lVar23;
          puVar26 = (uint *)((long)puVar27 + lVar23);
          *(uint **)((long)p + 0x4a0) = puVar26;
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          uStack_78 = puVar27;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar39 = *(uint *)((long)p + 0x4f70);
            iVar46 = *(int *)((long)p + 0x4f2c);
            iStack_a4 = *(int *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
            iStack_a8 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uVar43 = *(uint *)((long)p + 0x4f44);
            uStack_58 = (ulong)*(uint *)((long)p + 0x4f48) << 0x20;
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar42 = *(uint *)((long)p + 0x510);
            uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
            uVar22 = *(ulong *)((long)p + 0x4c8);
            uVar30 = *(uint *)((long)p + 0x4d0);
            prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar28 = prVar35->m_pDecode_tables;
            goto LAB_00114011;
          }
LAB_00114172:
          *plVar19 = (long)uStack_78 - (long)puVar27;
          *puVar16 = 0;
          *(undefined4 *)p = 0x266;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar48 == 0x285) {
          uStack_78 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = uStack_78;
          *(uint **)((long)p + 0x498) = uStack_78;
          *(long *)((long)p + 0x4a8) = lVar23;
          puVar26 = (uint *)((long)uStack_78 + lVar23);
          *(uint **)((long)p + 0x4a0) = puVar26;
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar27 = uStack_78;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uStack_80._4_4_ = *(int *)((long)p + 0x4f70);
            uVar11 = *(uint *)((long)p + 0x4f74);
            iVar46 = *(int *)((long)p + 0x4f2c);
            iStack_a4 = *(int *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
            iStack_a8 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uVar21 = *(uint *)((long)p + 0x4f44);
            uVar42 = *(uint *)((long)p + 0x4f48);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar14 = *(uint *)((long)p + 0x510);
            uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
            uVar22 = *(ulong *)((long)p + 0x4c8);
            uVar30 = *(uint *)((long)p + 0x4d0);
            prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar28 = prVar35->m_pDecode_tables;
            goto LAB_0011430e;
          }
LAB_001144d6:
          *plVar19 = (long)uStack_78 - (long)puVar27;
          *puVar16 = 0;
          *(undefined4 *)p = 0x285;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar48 == 0x295) {
          puVar26 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar26;
          *(uint **)((long)p + 0x498) = puVar26;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puStack_40 = puVar26;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar39 = *(uint *)((long)p + 0x4f70);
            uVar11 = *(uint *)((long)p + 0x4f74);
            uVar42 = *(uint *)((long)p + 0x4f7c);
            iVar46 = *(int *)((long)p + 0x4f2c);
            iStack_a4 = *(int *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
            iStack_a8 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x4f44);
            uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar14 = *(uint *)((long)p + 0x510);
            uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
            uVar22 = *(ulong *)((long)p + 0x4c8);
            uVar30 = *(uint *)((long)p + 0x4d0);
            if (0 < lVar23) goto LAB_0010f68f;
            uVar38 = 0;
            goto LAB_0010f699;
          }
LAB_0011179d:
          *plVar19 = (long)puStack_40 - (long)puVar26;
          *puVar16 = 0;
          *(undefined4 *)p = 0x295;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      goto switchD_0010f80a_caseD_338;
    }
    if (iVar48 < 0x325) {
      if (iVar48 < 0x2c2) {
        if (iVar48 == 0x29c) {
          puStack_40 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puStack_40;
          *(uint **)((long)p + 0x498) = puStack_40;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puStack_40 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar26 = puStack_40;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar39 = *(uint *)((long)p + 0x4f70);
            uVar11 = *(uint *)((long)p + 0x4f74);
            uVar42 = *(uint *)((long)p + 0x4f7c);
            iVar46 = *(int *)((long)p + 0x4f2c);
            iStack_a4 = *(int *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
            iStack_a8 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x4f44);
            uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar14 = *(uint *)((long)p + 0x510);
            uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
            uVar22 = *(ulong *)((long)p + 0x4c8);
            uVar30 = *(uint *)((long)p + 0x4d0);
            if (0 < lVar23) goto LAB_0010ffaf;
            goto LAB_001146df;
          }
LAB_00111609:
          *plVar19 = (long)puStack_40 - (long)puVar26;
          *puVar16 = 0;
          *(undefined4 *)p = 0x29c;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar48 == 0x2a5) {
          puStack_40 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puStack_40;
          *(uint **)((long)p + 0x498) = puStack_40;
          *(long *)((long)p + 0x4a8) = lVar23;
          puVar26 = (uint *)((long)puStack_40 + lVar23);
          *(uint **)((long)p + 0x4a0) = puVar26;
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar27 = puStack_40;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar39 = *(uint *)((long)p + 0x4f70);
            uVar11 = *(uint *)((long)p + 0x4f74);
            iVar48 = *(int *)((long)p + 0x4f78);
            iVar46 = *(int *)((long)p + 0x4f2c);
            iStack_a4 = *(int *)((long)p + 0x4f30);
            uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
            iStack_a8 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_80._4_4_ = *(uint *)((long)p + 0x4f44);
            uVar40 = *(undefined4 *)((long)p + 0x4f48);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar14 = *(uint *)((long)p + 0x510);
            uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
            uVar22 = *(ulong *)((long)p + 0x4c8);
            uVar21 = *(uint *)((long)p + 0x4d0);
            prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar28 = prVar35->m_pDecode_tables;
            goto LAB_00114706;
          }
LAB_001148f9:
          *plVar19 = (long)puStack_40 - (long)puVar27;
          *puVar16 = 0;
          *(undefined4 *)p = 0x2a5;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        goto switchD_0010f80a_caseD_338;
      }
      if (iVar48 == 0x2c2) {
LAB_00114962:
        *(undefined4 *)p = 0x2c2;
        return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
      }
      if (iVar48 != 0x2df) goto switchD_0010f80a_caseD_338;
      uStack_78 = *(uint **)((long)p + 0x550);
      lVar23 = **(long **)((long)p + 0x558);
      *(uint **)((long)p + 0x490) = uStack_78;
      *(uint **)((long)p + 0x498) = uStack_78;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_78);
      *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
      pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
      *(void **)((long)p + 0x4f50) = pvVar33;
      uVar22 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
      *(ulong *)((long)p + 0x4f58) = uVar22;
      if (uVar22 != 0) {
        uVar32 = *puVar16;
        if (uVar22 < *puVar16) {
          uVar32 = uVar22;
        }
        *(ulong *)((long)p + 0x4f60) = uVar32;
        if (*(int *)((long)p + 0x594) == 0) {
          memcpy(pbVar5,pvVar33,uVar32);
        }
        else if (uVar32 != 0) {
          uVar22 = 0;
          do {
            sVar47 = uVar32 - uVar22;
            if (0x1fff < sVar47) {
              sVar47 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x560) + uVar22),
                   (void *)(*(long *)((long)p + 0x4f50) + uVar22),sVar47);
            uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar22),sVar47,
                             *(uint *)((long)p + 0x548));
            *(uint *)((long)p + 0x548) = uVar13;
            uVar22 = uVar22 + sVar47;
            uVar32 = *(ulong *)((long)p + 0x4f60);
          } while (uVar22 < uVar32);
        }
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
        *(undefined4 *)p = 0x2df;
        return LZHAM_DECOMP_STATUS_NOT_FINISHED;
      }
      iVar46 = *(int *)((long)p + 0x4f70);
      iVar48 = *(int *)((long)p + 0x4f2c);
      iStack_a4 = *(int *)((long)p + 0x4f30);
      uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
      iStack_a8 = *(int *)((long)p + 0x4f38);
      uStack_8c = *(uint *)((long)p + 0x4f3c);
      uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
      uVar14 = *(uint *)((long)p + 0x510);
      uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
      uVar22 = *(ulong *)((long)p + 0x4c8);
      uVar30 = *(uint *)((long)p + 0x4d0);
      if (iVar46 != 1) {
        pbVar41 = *(byte **)((long)p + 0x4f88);
        uStack_68 = 0;
        do {
          uVar45 = uVar38;
          uVar38 = (ulong)*pbVar41;
          pbVar44 = pbVar41 + 1;
          pbVar5[uStack_68] = *pbVar41;
          pbVar41 = pbVar44;
          if (pbVar44 == pbVar5 + uVar32) {
            pbVar41 = pbVar5;
          }
          uStack_68 = uStack_68 + 1;
        } while (iVar46 + -1 != (int)uStack_68);
        goto LAB_00112880;
      }
      uVar11 = *(uint *)((long)p + 0x4f48);
LAB_0010f7e1:
      uVar45 = (ulong)uVar11;
      uStack_68 = 0;
LAB_00112880:
      do {
        while( true ) {
          while( true ) {
            puVar17 = (ushort *)
                      ((long)p + (ulong)(uStack_8c * 0x40 + (int)(uVar38 >> 2)) * 2 + 0x48a0);
            while( true ) {
              uVar39 = (uint)uVar38;
              uVar40 = (undefined4)uVar45;
              if (0xffffff < uStack_a0._4_4_) break;
              *(ushort **)((long)p + 0x528) = puVar17;
              uVar31 = uVar22;
              for (; (int)uVar30 < 8; uVar30 = uVar30 + 8) {
                uVar11 = (uint)uVar38;
                if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(uint *)((long)p + 0x510) = uVar14;
                    *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                    *(ulong *)((long)p + 0x4c8) = uVar31;
                    *(uint *)((long)p + 0x4d0) = uVar30;
                    *(uint **)((long)p + 0x498) = uStack_78;
                    *(int *)((long)p + 0x4f2c) = iVar48;
                    *(int *)((long)p + 0x4f30) = iStack_a4;
                    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                    *(int *)((long)p + 0x4f38) = iStack_a8;
                    *(uint *)((long)p + 0x4f3c) = uStack_8c;
                    *(uint *)((long)p + 0x4f44) = uVar11;
                    *(int *)((long)p + 0x4f48) = (int)uVar45;
                    *(int *)((long)p + 0x4f18) = (int)uStack_68;
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    puVar26 = *(uint **)((long)p + 0x490);
                    goto LAB_00111945;
                  }
LAB_0011278e:
                  uVar22 = 0;
                }
                else {
LAB_00110b58:
                  uVar22 = (ulong)(byte)*uStack_78;
                  uStack_78 = (uint *)((long)uStack_78 + 1);
                }
                uVar38 = (ulong)uVar11;
                uVar31 = uVar31 | uVar22 << (0x38U - (char)uVar30 & 0x3f);
              }
              uVar22 = uVar31 << 8;
              uVar30 = uVar30 - 8;
              puVar17 = *(ushort **)((long)p + 0x528);
              uVar14 = uVar14 << 8 | (uint)(byte)(uVar31 >> 0x38);
              uStack_a0._4_4_ = uStack_a0._4_4_ << 8;
            }
            uVar3 = *puVar17;
            uVar11 = (uStack_a0._4_4_ >> 0xb) * (uint)uVar3;
            uVar42 = uVar14 - uVar11;
            if (uVar11 <= uVar14) break;
            *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
            if (uVar32 <= (uStack_68 & 0xffffffff)) {
              *(uint *)((long)p + 0x510) = uVar14;
              *(uint *)((long)p + 0x514) = uVar11;
              *(ulong *)((long)p + 0x4c8) = uVar22;
              *(uint *)((long)p + 0x4d0) = uVar30;
              *(uint **)((long)p + 0x498) = uStack_78;
              **(long **)((long)p + 0x558) = (long)uStack_78 - *(long *)((long)p + 0x490);
              **(undefined8 **)((long)p + 0x568) = 0;
              goto LAB_0010fea3;
            }
            uStack_a0._4_4_ = uVar11;
            if (uStack_8c < 7) {
              uVar21 = (uint)(uVar45 >> 2) & 0x3ffffff8 | (uint)(uVar38 >> 5);
              prVar35 = (raw_quasi_adaptive_huffman_data_model *)
                        ((long)p + (ulong)uVar21 * 0x80 + 0x5a0);
              pdVar28 = *(decoder_tables **)((long)p + (ulong)uVar21 * 0x80 + 0x5d0);
              if ((int)uVar30 < 0x18) {
                puVar26 = *(uint **)((long)p + 0x4a0);
                if (uStack_78 + 1 < puVar26) {
                  uVar11 = *uStack_78;
                  uVar30 = uVar30 + 0x20;
                  uVar22 = uVar22 | (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 |
                                            (uVar11 & 0xff00) << 8 | uVar11 << 0x18) <<
                                    (-(char)uVar30 & 0x3fU);
                  uStack_78 = uStack_78 + 1;
                }
                else {
                  for (; uStack_a0._4_4_ = uVar11, (int)uVar30 < 0x18; uVar30 = uVar30 + 8) {
                    if (*(char *)((long)p + 0x4b0) == '\0') {
                      *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
                      *(uint *)((long)p + 0x510) = uVar14;
                      *(uint *)((long)p + 0x514) = uVar11;
                      *(ulong *)((long)p + 0x4c8) = uVar22;
                      *(uint *)((long)p + 0x4d0) = uVar30;
                      *(uint **)((long)p + 0x498) = uStack_78;
                      *(int *)((long)p + 0x4f2c) = iVar48;
                      *(int *)((long)p + 0x4f30) = iStack_a4;
                      *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                      *(int *)((long)p + 0x4f38) = iStack_a8;
                      *(uint *)((long)p + 0x4f3c) = uStack_8c;
                      *(uint *)((long)p + 0x4f44) = uVar39;
                      *(undefined4 *)((long)p + 0x4f48) = uVar40;
                      *(int *)((long)p + 0x4f18) = (int)uStack_68;
                      puVar27 = *(uint **)((long)p + 0x490);
                      plVar19 = *(long **)((long)p + 0x558);
                      puVar16 = *(ulong **)((long)p + 0x568);
                      goto LAB_0011387e;
                    }
LAB_001137ad:
                    uVar38 = 0;
                    if (uStack_78 < puVar26) {
                      uVar38 = (ulong)(byte)*uStack_78;
                      uStack_78 = (uint *)((long)uStack_78 + 1);
                    }
                    uVar22 = uVar22 | uVar38 << (0x38U - (char)uVar30 & 0x3f);
                  }
                }
              }
              uVar11 = (uint)(ushort)(uVar22 >> 0x30);
              if (uVar11 < pdVar28->m_table_max_code) {
                uVar42 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] &
                         0xffff;
                uVar11 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10
                ;
              }
              else {
                iVar46 = pdVar28->m_decode_start_code_size - 0x41;
                do {
                  iVar12 = iVar46;
                  iVar46 = iVar12 + 1;
                } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar11);
                uVar21 = (int)(uVar22 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                         pdVar28->m_val_ptrs[iVar12 + 0x40U];
                uVar11 = 0;
                if (uVar21 < prVar35->m_total_syms) {
                  uVar11 = uVar21;
                }
                uVar42 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar11];
                uVar11 = iVar12 + 0x41;
              }
              uVar22 = uVar22 << ((byte)uVar11 & 0x3f);
              puVar2 = (prVar35->m_sym_freq).m_p + uVar42;
              *puVar2 = *puVar2 + 1;
              uVar30 = uVar30 - uVar11;
              puVar1 = &prVar35->m_symbols_until_update;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                raw_quasi_adaptive_huffman_data_model::update(prVar35);
              }
            }
            else {
              uVar42 = (int)uStack_68 - iVar48;
              uVar21 = (uint)pbVar5[uVar42];
              uVar42 = (pbVar5[uVar42 - 1] >> 2 & 0x38 | (uint)(pbVar5[uVar42] >> 5)) << 7;
              prVar35 = (raw_quasi_adaptive_huffman_data_model *)((long)p + (ulong)uVar42 + 0x25a0);
              pdVar28 = *(decoder_tables **)((long)p + (ulong)uVar42 + 0x25d0);
              if ((int)uVar30 < 0x18) {
                puVar26 = *(uint **)((long)p + 0x4a0);
                if (uStack_78 + 1 < puVar26) {
                  uVar11 = *uStack_78;
                  uVar30 = uVar30 + 0x20;
                  uVar22 = uVar22 | (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 |
                                            (uVar11 & 0xff00) << 8 | uVar11 << 0x18) <<
                                    (-(char)uVar30 & 0x3fU);
                  uStack_78 = uStack_78 + 1;
                }
                else {
                  for (; uStack_a0._4_4_ = uVar11, (int)uVar30 < 0x18; uVar30 = uVar30 + 8) {
                    if (*(char *)((long)p + 0x4b0) == '\0') {
                      *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
                      *(uint *)((long)p + 0x510) = uVar14;
                      *(uint *)((long)p + 0x514) = uVar11;
                      *(ulong *)((long)p + 0x4c8) = uVar22;
                      *(uint *)((long)p + 0x4d0) = uVar30;
                      *(uint **)((long)p + 0x498) = uStack_78;
                      *(uint *)((long)p + 0x4f6c) = uVar21;
                      *(int *)((long)p + 0x4f2c) = iVar48;
                      *(int *)((long)p + 0x4f30) = iStack_a4;
                      *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                      *(int *)((long)p + 0x4f38) = iStack_a8;
                      *(uint *)((long)p + 0x4f3c) = uStack_8c;
                      *(uint *)((long)p + 0x4f44) = uVar39;
                      *(undefined4 *)((long)p + 0x4f48) = uVar40;
                      *(int *)((long)p + 0x4f18) = (int)uStack_68;
                      plVar19 = *(long **)((long)p + 0x558);
                      puVar16 = *(ulong **)((long)p + 0x568);
                      puVar27 = *(uint **)((long)p + 0x490);
                      goto LAB_00113a18;
                    }
LAB_001138b5:
                    uVar38 = 0;
                    if (uStack_78 < puVar26) {
                      uVar38 = (ulong)(byte)*uStack_78;
                      uStack_78 = (uint *)((long)uStack_78 + 1);
                    }
                    uVar22 = uVar22 | uVar38 << (0x38U - (char)uVar30 & 0x3f);
                  }
                }
              }
              uVar11 = (uint)(ushort)(uVar22 >> 0x30);
              if (uVar11 < pdVar28->m_table_max_code) {
                uVar42 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] &
                         0xffff;
                uVar11 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10
                ;
              }
              else {
                iVar46 = pdVar28->m_decode_start_code_size - 0x41;
                do {
                  iVar12 = iVar46;
                  iVar46 = iVar12 + 1;
                } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar11);
                uVar42 = (int)(uVar22 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                         pdVar28->m_val_ptrs[iVar12 + 0x40U];
                uVar11 = 0;
                if (uVar42 < prVar35->m_total_syms) {
                  uVar11 = uVar42;
                }
                uVar42 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar11];
                uVar11 = iVar12 + 0x41;
              }
              uVar22 = uVar22 << ((byte)uVar11 & 0x3f);
              puVar2 = (prVar35->m_sym_freq).m_p + uVar42;
              *puVar2 = *puVar2 + 1;
              uVar30 = uVar30 - uVar11;
              puVar1 = &prVar35->m_symbols_until_update;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                raw_quasi_adaptive_huffman_data_model::update(prVar35);
              }
              uVar42 = uVar42 ^ uVar21;
            }
            pbVar5[uStack_68 & 0xffffffff] = (byte)uVar42;
            uStack_8c = (uint)(byte)(&s_literal_next_state)[uStack_8c];
            uStack_68 = (ulong)((int)uStack_68 + 1);
            uVar45 = (ulong)uVar39;
            uVar38 = (ulong)uVar42;
          }
          *puVar17 = uVar3 - (uVar3 >> 5);
          puVar17 = (ushort *)((long)p + (ulong)uStack_8c * 2 + 0x4ea0);
          uVar39 = 1;
          iVar46 = iVar48;
          for (uVar11 = uStack_a0._4_4_ - uVar11; uVar43 = (uint)uVar38, uVar11 < 0x1000000;
              uVar11 = uVar11 << 8) {
            *(ushort **)((long)p + 0x528) = puVar17;
            uVar38 = uVar22;
            for (; (int)uVar30 < 8; uVar30 = uVar30 + 8) {
              if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(uint *)((long)p + 0x510) = uVar42;
                  *(uint *)((long)p + 0x514) = uVar11;
                  *(ulong *)((long)p + 0x4c8) = uVar38;
                  *(uint *)((long)p + 0x4d0) = uVar30;
                  *(uint **)((long)p + 0x498) = uStack_78;
                  *(uint *)((long)p + 0x4f70) = uVar39;
                  *(int *)((long)p + 0x4f2c) = iVar46;
                  *(int *)((long)p + 0x4f30) = iStack_a4;
                  *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                  *(int *)((long)p + 0x4f38) = iStack_a8;
                  *(uint *)((long)p + 0x4f3c) = uStack_8c;
                  *(uint *)((long)p + 0x4f44) = uVar43;
                  *(int *)((long)p + 0x4f48) = (int)uVar45;
                  *(int *)((long)p + 0x4f18) = (int)uStack_68;
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar16 = *(ulong **)((long)p + 0x568);
                  puVar26 = *(uint **)((long)p + 0x490);
                  goto LAB_0011190d;
                }
LAB_00112816:
                uVar22 = 0;
              }
              else {
LAB_00110921:
                uVar22 = (ulong)(byte)*uStack_78;
                uStack_78 = (uint *)((long)uStack_78 + 1);
              }
              uVar38 = uVar38 | uVar22 << (0x38U - (char)uVar30 & 0x3f);
            }
            uVar22 = uVar38 << 8;
            uVar30 = uVar30 - 8;
            puVar17 = *(ushort **)((long)p + 0x528);
            uVar42 = uVar42 << 8 | (uint)(byte)(uVar38 >> 0x38);
            uVar38 = (ulong)uVar43;
          }
          uVar3 = *puVar17;
          uStack_a0._4_4_ = (uVar11 >> 0xb) * (uint)uVar3;
          uVar21 = uVar42 - uStack_a0._4_4_;
          if (uVar42 < uStack_a0._4_4_) break;
          uStack_80 = uVar38 << 0x20;
          *puVar17 = uVar3 - (uVar3 >> 5);
          puVar17 = (ushort *)((long)p + (ulong)uStack_8c * 2 + 0x4eb8);
          for (uVar11 = uVar11 - uStack_a0._4_4_; uVar11 < 0x1000000; uVar11 = uVar11 << 8) {
            *(ushort **)((long)p + 0x528) = puVar17;
            uVar38 = uVar22;
            for (; (int)uVar30 < 8; uVar30 = uVar30 + 8) {
              if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(uint *)((long)p + 0x510) = uVar21;
                  *(uint *)((long)p + 0x514) = uVar11;
                  *(ulong *)((long)p + 0x4c8) = uVar38;
                  *(uint *)((long)p + 0x4d0) = uVar30;
                  *(uint **)((long)p + 0x498) = uStack_78;
                  *(uint *)((long)p + 0x4f70) = uVar39;
                  *(int *)((long)p + 0x4f2c) = iVar46;
                  *(int *)((long)p + 0x4f30) = iStack_a4;
                  *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                  *(int *)((long)p + 0x4f38) = iStack_a8;
                  *(uint *)((long)p + 0x4f3c) = uStack_8c;
                  *(uint *)((long)p + 0x4f44) = uStack_80._4_4_;
                  *(int *)((long)p + 0x4f48) = (int)uVar45;
                  *(int *)((long)p + 0x4f18) = (int)uStack_68;
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar16 = *(ulong **)((long)p + 0x568);
                  puVar26 = *(uint **)((long)p + 0x490);
                  goto LAB_0011165d;
                }
LAB_0011276a:
                uVar22 = 0;
              }
              else {
LAB_0010fc07:
                uVar22 = (ulong)(byte)*uStack_78;
                uStack_78 = (uint *)((long)uStack_78 + 1);
              }
              uVar38 = uVar38 | uVar22 << (0x38U - (char)uVar30 & 0x3f);
            }
            uVar22 = uVar38 << 8;
            uVar30 = uVar30 - 8;
            puVar17 = *(ushort **)((long)p + 0x528);
            uVar21 = uVar21 << 8 | (uint)(byte)(uVar38 >> 0x38);
          }
          uVar3 = *puVar17;
          uStack_a0._4_4_ = (uVar11 >> 0xb) * (uint)uVar3;
          uVar42 = uVar21 - uStack_a0._4_4_;
          if (uVar21 < uStack_a0._4_4_) {
            *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
            prVar35 = (raw_quasi_adaptive_huffman_data_model *)
                      ((long)p + (ulong)(6 < uStack_8c) * 0x80 + 0x4620);
            pdVar28 = *(decoder_tables **)((long)p + (ulong)(6 < uStack_8c) * 0x80 + 18000);
            puVar26 = uStack_78;
            if ((int)uVar30 < 0x18) {
              puVar26 = uStack_78 + 1;
              puVar27 = *(uint **)((long)p + 0x4a0);
              if (puVar26 < puVar27) {
                uVar14 = *uStack_78;
                uVar30 = uVar30 + 0x20;
                uVar22 = uVar22 | (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                          (uVar14 & 0xff00) << 8 | uVar14 << 0x18) <<
                                  (-(char)uVar30 & 0x3fU);
              }
              else {
                uVar14 = (uint)uVar45;
                puVar26 = uStack_78;
                for (; (int)uVar30 < 0x18; uVar30 = uVar30 + 8) {
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
                    *(uint *)((long)p + 0x510) = uVar21;
                    *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                    *(ulong *)((long)p + 0x4c8) = uVar22;
                    *(uint *)((long)p + 0x4d0) = uVar30;
                    *(uint **)((long)p + 0x498) = puVar26;
                    *(uint *)((long)p + 0x4f70) = uVar39;
                    *(int *)((long)p + 0x4f2c) = iVar46;
                    *(int *)((long)p + 0x4f30) = iStack_a4;
                    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                    *(int *)((long)p + 0x4f38) = iStack_a8;
                    *(uint *)((long)p + 0x4f3c) = uStack_8c;
                    *(uint *)((long)p + 0x4f44) = uStack_80._4_4_;
                    *(uint *)((long)p + 0x4f48) = uVar14;
                    *(int *)((long)p + 0x4f18) = (int)uStack_68;
                    puVar36 = *(uint **)((long)p + 0x490);
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    goto LAB_00113f1d;
                  }
LAB_00113cd6:
                  uVar38 = 0;
                  if (puVar26 < puVar27) {
                    uVar38 = (ulong)(byte)*puVar26;
                    puVar26 = (uint *)((long)puVar26 + 1);
                  }
                  uVar22 = uVar22 | uVar38 << (0x38U - (char)uVar30 & 0x3f);
                }
                uVar45 = (ulong)uVar14;
              }
            }
            uVar14 = (uint)(ushort)(uVar22 >> 0x30);
            if (uVar14 < pdVar28->m_table_max_code) {
              uVar39 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] & 0xffff;
              uVar14 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10;
            }
            else {
              iVar48 = pdVar28->m_decode_start_code_size - 0x41;
              do {
                iVar12 = iVar48;
                iVar48 = iVar12 + 1;
              } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar14);
              uVar11 = (int)(uVar22 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                       pdVar28->m_val_ptrs[iVar12 + 0x40U];
              uVar14 = 0;
              if (uVar11 < prVar35->m_total_syms) {
                uVar14 = uVar11;
              }
              uVar39 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar14];
              uVar14 = iVar12 + 0x41;
            }
            uVar22 = uVar22 << ((byte)uVar14 & 0x3f);
            puVar2 = (prVar35->m_sym_freq).m_p + uVar39;
            *puVar2 = *puVar2 + 1;
            uVar30 = uVar30 - uVar14;
            puVar1 = &prVar35->m_symbols_until_update;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              raw_quasi_adaptive_huffman_data_model::update(prVar35);
            }
            uVar39 = uVar39 + 2;
            puVar17 = (ushort *)((long)p + (ulong)uStack_8c * 2 + 0x4ee8);
            while( true ) {
              uVar43 = (uint)uStack_68;
              if (0xffffff < uStack_a0._4_4_) break;
              *(ushort **)((long)p + 0x528) = puVar17;
              uVar38 = uVar22;
              for (; (int)uVar30 < 8; uVar30 = uVar30 + 8) {
                if (puVar26 == *(uint **)((long)p + 0x4a0)) {
                  uVar22 = 0;
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(uint *)((long)p + 0x510) = uVar21;
                    *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                    *(ulong *)((long)p + 0x4c8) = uVar38;
                    *(uint *)((long)p + 0x4d0) = uVar30;
                    *(uint **)((long)p + 0x498) = puVar26;
                    *(uint *)((long)p + 0x4f70) = uVar39;
                    *(int *)((long)p + 0x4f2c) = iVar46;
                    *(int *)((long)p + 0x4f30) = iStack_a4;
                    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                    *(int *)((long)p + 0x4f38) = iStack_a8;
                    *(uint *)((long)p + 0x4f3c) = uStack_8c;
                    *(uint *)((long)p + 0x4f44) = uStack_80._4_4_;
                    *(int *)((long)p + 0x4f48) = (int)uVar45;
                    *(int *)((long)p + 0x4f18) = (int)uStack_68;
                    puVar27 = *(uint **)((long)p + 0x490);
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    goto LAB_00111929;
                  }
                }
                else {
LAB_00110a45:
                  uVar22 = (ulong)(byte)*puVar26;
                  puVar26 = (uint *)((long)puVar26 + 1);
                }
LAB_00110a4b:
                uVar38 = uVar38 | uVar22 << (0x38U - (char)uVar30 & 0x3f);
              }
              uVar22 = uVar38 << 8;
              uVar30 = uVar30 - 8;
              puVar17 = *(ushort **)((long)p + 0x528);
              uVar21 = uVar21 << 8 | (uint)(byte)(uVar38 >> 0x38);
              uStack_a0._4_4_ = uStack_a0._4_4_ << 8;
            }
            uVar3 = *puVar17;
            uVar11 = (uStack_a0._4_4_ >> 0xb) * (uint)uVar3;
            uVar14 = uVar21 - uVar11;
            if (uVar21 < uVar11) {
              uStack_58 = uVar45 << 0x20;
              *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
              puVar17 = (ushort *)((long)p + (ulong)uStack_8c * 2 + 0x4f00);
              while( true ) {
                uVar43 = (uint)uStack_68;
                if (0xffffff < uVar11) break;
                *(ushort **)((long)p + 0x528) = puVar17;
                uVar38 = uVar22;
                for (; (int)uVar30 < 8; uVar30 = uVar30 + 8) {
                  if (puVar26 == *(uint **)((long)p + 0x4a0)) {
                    uVar22 = 0;
                    if (*(char *)((long)p + 0x4b0) == '\0') {
                      *(uint *)((long)p + 0x510) = uVar21;
                      *(uint *)((long)p + 0x514) = uVar11;
                      *(ulong *)((long)p + 0x4c8) = uVar38;
                      *(uint *)((long)p + 0x4d0) = uVar30;
                      *(uint **)((long)p + 0x498) = puVar26;
                      *(uint *)((long)p + 0x4f70) = uVar39;
                      *(int *)((long)p + 0x4f2c) = iVar46;
                      *(int *)((long)p + 0x4f30) = iStack_a4;
                      *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                      *(int *)((long)p + 0x4f38) = iStack_a8;
                      *(uint *)((long)p + 0x4f3c) = uStack_8c;
                      *(uint *)((long)p + 0x4f44) = uStack_80._4_4_;
                      *(uint *)((long)p + 0x4f48) = uStack_58._4_4_;
                      *(int *)((long)p + 0x4f18) = (int)uStack_68;
                      puVar27 = *(uint **)((long)p + 0x490);
                      plVar19 = *(long **)((long)p + 0x558);
                      puVar16 = *(ulong **)((long)p + 0x568);
                      goto LAB_00111715;
                    }
                  }
                  else {
LAB_0010fe2e:
                    uVar22 = (ulong)(byte)*puVar26;
                    puVar26 = (uint *)((long)puVar26 + 1);
                  }
LAB_0010fe38:
                  uVar38 = uVar38 | uVar22 << (0x38U - (char)uVar30 & 0x3f);
                }
                uVar22 = uVar38 << 8;
                uVar30 = uVar30 - 8;
                puVar17 = *(ushort **)((long)p + 0x528);
                uVar21 = uVar21 << 8 | (uint)(byte)(uVar38 >> 0x38);
                uVar11 = uVar11 << 8;
              }
              uVar3 = *puVar17;
              uStack_a0._4_4_ = (uVar11 >> 0xb) * (uint)uVar3;
              uVar14 = uVar21 - uStack_a0._4_4_;
              if (uVar21 < uStack_a0._4_4_) {
                *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
                iVar48 = iStack_a8;
                iStack_a8 = (int)uStack_a0;
                uVar14 = uVar21;
              }
              else {
                *puVar17 = uVar3 - (uVar3 >> 5);
                uStack_a0._4_4_ = uVar11 - uStack_a0._4_4_;
                iVar48 = (int)uStack_a0;
              }
              uStack_a0._0_4_ = iStack_a4;
              uStack_78 = puVar26;
              iStack_a4 = iVar48;
            }
            else {
              *puVar17 = uVar3 - (uVar3 >> 5);
              uStack_a0._4_4_ = uStack_a0._4_4_ - uVar11;
              uStack_78 = puVar26;
            }
            uStack_8c = (uint)(6 < uStack_8c) * 3 + 8;
            iVar48 = iStack_a4;
            iStack_a4 = iVar46;
          }
          else {
            *puVar17 = uVar3 - (uVar3 >> 5);
            uVar11 = uVar11 - uStack_a0._4_4_;
            puVar17 = (ushort *)((long)p + (ulong)uStack_8c * 2 + 0x4ed0);
            iVar48 = iVar46;
            while( true ) {
              if (0xffffff < uVar11) break;
              *(ushort **)((long)p + 0x528) = puVar17;
              uVar38 = uVar22;
              for (; (int)uVar30 < 8; uVar30 = uVar30 + 8) {
                if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(uint *)((long)p + 0x510) = uVar42;
                    *(uint *)((long)p + 0x514) = uVar11;
                    *(ulong *)((long)p + 0x4c8) = uVar38;
                    *(uint *)((long)p + 0x4d0) = uVar30;
                    *(uint **)((long)p + 0x498) = uStack_78;
                    *(uint *)((long)p + 0x4f70) = uVar39;
                    *(int *)((long)p + 0x4f2c) = iVar48;
                    *(int *)((long)p + 0x4f30) = iStack_a4;
                    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                    *(int *)((long)p + 0x4f38) = iStack_a8;
                    *(uint *)((long)p + 0x4f3c) = uStack_8c;
                    *(uint *)((long)p + 0x4f44) = uStack_80._4_4_;
                    *(int *)((long)p + 0x4f48) = (int)uVar45;
                    *(int *)((long)p + 0x4f18) = (int)uStack_68;
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    puVar26 = *(uint **)((long)p + 0x490);
                    goto LAB_0011174d;
                  }
LAB_0011273e:
                  uVar22 = 0;
                }
                else {
LAB_0011035e:
                  uVar22 = (ulong)(byte)*uStack_78;
                  uStack_78 = (uint *)((long)uStack_78 + 1);
                }
                uVar38 = uVar38 | uVar22 << (0x38U - (char)uVar30 & 0x3f);
              }
              uVar22 = uVar38 << 8;
              uVar30 = uVar30 - 8;
              puVar17 = *(ushort **)((long)p + 0x528);
              uVar42 = uVar42 << 8 | (uint)(byte)(uVar38 >> 0x38);
              uVar11 = uVar11 << 8;
            }
            uVar3 = *puVar17;
            uStack_a0._4_4_ = (uVar11 >> 0xb) * (uint)uVar3;
            uVar14 = uVar42 - uStack_a0._4_4_;
            if (uVar42 < uStack_a0._4_4_) {
              *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
              prVar35 = (raw_quasi_adaptive_huffman_data_model *)
                        ((long)p + (ulong)(6 < uStack_8c) * 0x80 + 0x4620);
              pdVar28 = *(decoder_tables **)((long)p + (ulong)(6 < uStack_8c) * 0x80 + 18000);
              if ((int)uVar30 < 0x18) {
                puVar26 = *(uint **)((long)p + 0x4a0);
                if (uStack_78 + 1 < puVar26) {
                  uVar14 = *uStack_78;
                  uVar30 = uVar30 + 0x20;
                  uVar22 = uVar22 | (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                            (uVar14 & 0xff00) << 8 | uVar14 << 0x18) <<
                                    (-(char)uVar30 & 0x3fU);
                  uStack_78 = uStack_78 + 1;
                }
                else {
                  while( true ) {
                    if (0x17 < (int)uVar30) break;
                    uVar14 = (uint)uVar45;
                    if (*(char *)((long)p + 0x4b0) == '\0') {
                      *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
                      *(uint *)((long)p + 0x510) = uVar42;
                      *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                      *(ulong *)((long)p + 0x4c8) = uVar22;
                      *(uint *)((long)p + 0x4d0) = uVar30;
                      *(uint **)((long)p + 0x498) = uStack_78;
                      *(uint *)((long)p + 0x4f70) = uVar39;
                      *(int *)((long)p + 0x4f2c) = iVar48;
                      *(int *)((long)p + 0x4f30) = iStack_a4;
                      *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                      *(int *)((long)p + 0x4f38) = iStack_a8;
                      *(uint *)((long)p + 0x4f3c) = uStack_8c;
                      *(uint *)((long)p + 0x4f44) = uStack_80._4_4_;
                      *(uint *)((long)p + 0x4f48) = uVar14;
                      *(uint *)((long)p + 0x4f18) = (uint)uStack_68;
                      puVar27 = *(uint **)((long)p + 0x490);
                      plVar19 = *(long **)((long)p + 0x558);
                      puVar16 = *(ulong **)((long)p + 0x568);
                      goto LAB_00113c20;
                    }
LAB_00113adc:
                    uVar38 = 0;
                    if (uStack_78 < puVar26) {
                      uVar38 = (ulong)(byte)*uStack_78;
                      uStack_78 = (uint *)((long)uStack_78 + 1);
                    }
                    cVar8 = (char)uVar30;
                    uVar30 = uVar30 + 8;
                    uVar22 = uVar22 | uVar38 << (0x38U - cVar8 & 0x3f);
                    uVar45 = (ulong)uVar14;
                  }
                }
              }
              uVar14 = (uint)(ushort)(uVar22 >> 0x30);
              if (uVar14 < pdVar28->m_table_max_code) {
                uVar39 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] &
                         0xffff;
                uVar14 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10
                ;
              }
              else {
                iVar46 = pdVar28->m_decode_start_code_size - 0x41;
                do {
                  iVar12 = iVar46;
                  iVar46 = iVar12 + 1;
                } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar14);
                uVar11 = (int)(uVar22 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                         pdVar28->m_val_ptrs[iVar12 + 0x40U];
                uVar14 = 0;
                if (uVar11 < prVar35->m_total_syms) {
                  uVar14 = uVar11;
                }
                uVar39 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar14];
                uVar14 = iVar12 + 0x41;
              }
              uVar22 = uVar22 << ((byte)uVar14 & 0x3f);
              puVar2 = (prVar35->m_sym_freq).m_p + uVar39;
              *puVar2 = *puVar2 + 1;
              uVar30 = uVar30 - uVar14;
              puVar1 = &prVar35->m_symbols_until_update;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                raw_quasi_adaptive_huffman_data_model::update(prVar35);
              }
              uVar39 = uVar39 + 2;
              uStack_8c = (uint)(6 < uStack_8c) * 3 + 8;
              uVar43 = (uint)uStack_68;
              uVar14 = uVar42;
            }
            else {
              *puVar17 = uVar3 - (uVar3 >> 5);
              uStack_a0._4_4_ = uVar11 - uStack_a0._4_4_;
              uStack_8c = (6 < uStack_8c) + 9 + (uint)(6 < uStack_8c);
              uVar43 = (uint)uStack_68;
            }
          }
LAB_001147dc:
          if (((ulong)uVar43 < (ulong)(long)iVar48) ||
             (uStack_68 = (ulong)(uVar43 + uVar39), uVar32 < uStack_68)) {
            *(uint *)((long)p + 0x510) = uVar14;
            *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
            *(ulong *)((long)p + 0x4c8) = uVar22;
            *(uint *)((long)p + 0x4d0) = uVar30;
            *(uint **)((long)p + 0x498) = uStack_78;
            **(long **)((long)p + 0x558) = (long)uStack_78 - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            goto LAB_00114962;
          }
          pbVar44 = pbVar5 + (uVar43 - iVar48);
          pbVar41 = pbVar5 + uVar43;
          if (iVar48 == 1) {
            bVar20 = *pbVar44;
            uVar45 = (ulong)bVar20;
            if (uVar39 < 8) {
              if (uVar39 != 0) {
                memset(pbVar41,(uint)bVar20,(ulong)uVar39);
                uStack_58._4_4_ = uStack_80._4_4_;
                if (uVar39 != 1) {
                  uStack_58._4_4_ = (uint)bVar20;
                }
                uVar45 = (ulong)uStack_58._4_4_;
              }
            }
            else {
              memset(pbVar41,(uint)bVar20,(ulong)uVar39);
            }
          }
          else if (uVar39 == 1) {
            bVar20 = *pbVar44;
            *pbVar41 = bVar20;
            uVar45 = (ulong)uStack_80._4_4_;
          }
          else {
            uVar11 = uVar39 - 2;
            if ((uVar11 < 8) || (iVar48 < (int)uVar11)) {
              if (0 < (int)uVar11) {
                uVar39 = uVar39 - 1;
                do {
                  bVar20 = *pbVar44;
                  pbVar44 = pbVar44 + 1;
                  *pbVar41 = bVar20;
                  pbVar41 = pbVar41 + 1;
                  uVar39 = uVar39 - 1;
                } while (1 < uVar39);
              }
            }
            else {
              uVar38 = (ulong)uVar11;
              memcpy(pbVar41,pbVar44,uVar38);
              pbVar41 = pbVar41 + uVar38;
              pbVar44 = pbVar44 + uVar38;
            }
            uVar45 = (ulong)*pbVar44;
            *pbVar41 = *pbVar44;
            bVar20 = pbVar44[1];
            pbVar41[1] = bVar20;
          }
          uVar38 = (ulong)bVar20;
        }
        *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
        prVar35 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0);
        pdVar28 = *(decoder_tables **)((long)p + 0x45d0);
        uVar14 = uVar42;
        if ((int)uVar30 < 0x18) {
          uStack_58 = uVar45 << 0x20;
          puVar26 = *(uint **)((long)p + 0x4a0);
          if (uStack_78 + 1 < puVar26) {
            uVar11 = *uStack_78;
            uVar30 = uVar30 + 0x20;
            uVar22 = uVar22 | (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 |
                                      (uVar11 & 0xff00) << 8 | uVar11 << 0x18) <<
                              (-(char)uVar30 & 0x3fU);
            uStack_78 = uStack_78 + 1;
          }
          else {
            for (; (int)uVar30 < 0x18; uVar30 = uVar30 + 8) {
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
                *(uint *)((long)p + 0x510) = uVar42;
                *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                *(ulong *)((long)p + 0x4c8) = uVar22;
                *(uint *)((long)p + 0x4d0) = uVar30;
                *(uint **)((long)p + 0x498) = uStack_78;
                *(uint *)((long)p + 0x4f70) = uVar39;
                *(int *)((long)p + 0x4f2c) = iVar46;
                *(int *)((long)p + 0x4f30) = iStack_a4;
                *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                *(int *)((long)p + 0x4f38) = iStack_a8;
                *(uint *)((long)p + 0x4f3c) = uStack_8c;
                *(uint *)((long)p + 0x4f44) = uVar43;
                *(uint *)((long)p + 0x4f48) = uStack_58._4_4_;
                *(int *)((long)p + 0x4f18) = (int)uStack_68;
                puVar27 = *(uint **)((long)p + 0x490);
                plVar19 = *(long **)((long)p + 0x558);
                puVar16 = *(ulong **)((long)p + 0x568);
                goto LAB_00114172;
              }
LAB_00114011:
              uVar38 = 0;
              if (uStack_78 < puVar26) {
                uVar38 = (ulong)(byte)*uStack_78;
                uStack_78 = (uint *)((long)uStack_78 + 1);
              }
              uVar22 = uVar22 | uVar38 << (0x38U - (char)uVar30 & 0x3f);
            }
            uVar38 = (ulong)uVar43;
            uVar45 = (ulong)uStack_58._4_4_;
            uVar14 = uVar42;
          }
        }
        uVar21 = (uint)uVar38;
        uVar42 = (uint)uVar45;
        uVar11 = (uint)(ushort)(uVar22 >> 0x30);
        if (uVar11 < pdVar28->m_table_max_code) {
          uVar43 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] & 0xffff;
          uVar11 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10;
        }
        else {
          iVar48 = pdVar28->m_decode_start_code_size - 0x41;
          do {
            iVar12 = iVar48;
            iVar48 = iVar12 + 1;
          } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar11);
          uVar39 = (int)(uVar22 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                   pdVar28->m_val_ptrs[iVar12 + 0x40U];
          uVar11 = 0;
          if (uVar39 < prVar35->m_total_syms) {
            uVar11 = uVar39;
          }
          uVar43 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar11];
          uVar11 = iVar12 + 0x41;
        }
        uVar22 = uVar22 << ((byte)uVar11 & 0x3f);
        puVar2 = (prVar35->m_sym_freq).m_p + uVar43;
        *puVar2 = *puVar2 + 1;
        uVar30 = uVar30 - uVar11;
        puVar1 = &prVar35->m_symbols_until_update;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          raw_quasi_adaptive_huffman_data_model::update(prVar35);
        }
        if (1 < uVar43) {
          uVar39 = (uVar43 - 2 & 7) + 2;
          uVar11 = (uVar43 - 2 >> 3) + 1;
          puStack_40 = uStack_78;
          if (uVar39 == 9) {
            prVar35 = (raw_quasi_adaptive_huffman_data_model *)
                      ((long)p + (ulong)(6 < uStack_8c) * 0x80 + 0x4720);
            pdVar28 = *(decoder_tables **)((long)p + (ulong)(6 < uStack_8c) * 0x80 + 0x4750);
            uStack_80._4_4_ = 9;
            if ((int)uVar30 < 0x18) {
              puStack_40 = uStack_78 + 1;
              puVar26 = *(uint **)((long)p + 0x4a0);
              if (puStack_40 < puVar26) {
                uVar39 = *uStack_78;
                uVar30 = uVar30 + 0x20;
                uVar22 = uVar22 | (ulong)(uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 |
                                          (uVar39 & 0xff00) << 8 | uVar39 << 0x18) <<
                                  (-(char)uVar30 & 0x3fU);
                uStack_80._4_4_ = 9;
              }
              else {
                uStack_80._4_4_ = 9;
                for (; puStack_40 = uStack_78, (int)uVar30 < 0x18; uVar30 = uVar30 + 8) {
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
                    *(uint *)((long)p + 0x510) = uVar14;
                    *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                    *(ulong *)((long)p + 0x4c8) = uVar22;
                    *(uint *)((long)p + 0x4d0) = uVar30;
                    *(uint **)((long)p + 0x498) = uStack_78;
                    *(uint *)((long)p + 0x4f70) = uStack_80._4_4_;
                    *(uint *)((long)p + 0x4f74) = uVar11;
                    *(int *)((long)p + 0x4f2c) = iVar46;
                    *(int *)((long)p + 0x4f30) = iStack_a4;
                    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                    *(int *)((long)p + 0x4f38) = iStack_a8;
                    *(uint *)((long)p + 0x4f3c) = uStack_8c;
                    *(uint *)((long)p + 0x4f44) = uVar21;
                    *(uint *)((long)p + 0x4f48) = uVar42;
                    *(int *)((long)p + 0x4f18) = (int)uStack_68;
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    puVar27 = *(uint **)((long)p + 0x490);
                    goto LAB_001144d6;
                  }
LAB_0011430e:
                  uVar38 = 0;
                  if (uStack_78 < puVar26) {
                    uVar38 = (ulong)(byte)*uStack_78;
                    uStack_78 = (uint *)((long)uStack_78 + 1);
                  }
                  uVar22 = uVar22 | uVar38 << (0x38U - (char)uVar30 & 0x3f);
                }
              }
            }
            uVar39 = (uint)(ushort)(uVar22 >> 0x30);
            if (uVar39 < pdVar28->m_table_max_code) {
              uVar39 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] & 0xffff;
              uVar43 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10;
            }
            else {
              iVar48 = pdVar28->m_decode_start_code_size - 0x41;
              do {
                iVar12 = iVar48;
                iVar48 = iVar12 + 1;
              } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar39);
              uVar43 = (int)(uVar22 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                       pdVar28->m_val_ptrs[iVar12 + 0x40U];
              uVar39 = 0;
              if (uVar43 < prVar35->m_total_syms) {
                uVar39 = uVar43;
              }
              uVar39 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar39];
              uVar43 = iVar12 + 0x41;
            }
            uVar22 = uVar22 << ((byte)uVar43 & 0x3f);
            puVar2 = (prVar35->m_sym_freq).m_p + uVar39;
            *puVar2 = *puVar2 + 1;
            uVar30 = uVar30 - uVar43;
            puVar1 = &prVar35->m_symbols_until_update;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              raw_quasi_adaptive_huffman_data_model::update(prVar35);
            }
            uVar45 = (ulong)uVar42;
            uVar39 = uVar39 + uStack_80._4_4_;
          }
          uVar40 = (undefined4)uVar45;
          bVar20 = *(byte *)((long)p + (ulong)uVar11 + 0x410);
          uVar42 = (uint)bVar20;
          uStack_80._4_4_ = uVar21;
          if (uVar42 < 3) {
            while( true ) {
              uVar21 = uVar30 - uVar42;
              if ((int)uVar42 <= (int)uVar30) break;
              if (puStack_40 == *(uint **)((long)p + 0x4a0)) {
                uVar38 = 0;
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(uint *)((long)p + 0x510) = uVar14;
                  *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                  *(ulong *)((long)p + 0x4c8) = uVar22;
                  *(uint *)((long)p + 0x4d0) = uVar30;
                  *(uint **)((long)p + 0x498) = puStack_40;
                  *(uint *)((long)p + 0x4f70) = uVar39;
                  *(uint *)((long)p + 0x4f74) = uVar11;
                  *(uint *)((long)p + 0x4f7c) = uVar42;
                  *(int *)((long)p + 0x4f2c) = iVar46;
                  *(int *)((long)p + 0x4f30) = iStack_a4;
                  *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                  *(int *)((long)p + 0x4f38) = iStack_a8;
                  *(uint *)((long)p + 0x4f3c) = uStack_8c;
                  *(uint *)((long)p + 0x4f44) = uStack_80._4_4_;
                  *(int *)((long)p + 0x4f48) = (int)uVar45;
                  *(uint *)((long)p + 0x4f18) = (uint)uStack_68;
                  puVar26 = *(uint **)((long)p + 0x490);
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar16 = *(ulong **)((long)p + 0x568);
                  goto LAB_0011179d;
                }
              }
              else {
LAB_0010f68f:
                uVar38 = (ulong)(byte)*puStack_40;
                puStack_40 = (uint *)((long)puStack_40 + 1);
              }
LAB_0010f699:
              cVar8 = (char)uVar30;
              uVar30 = uVar30 + 8;
              uVar22 = uVar22 | uVar38 << (0x38U - cVar8 & 0x3f);
            }
            iVar48 = (int)(uVar22 >> (-(byte)uVar42 & 0x3f));
            if (uVar42 == 0) {
              iVar48 = 0;
            }
            uVar22 = uVar22 << ((byte)uVar42 & 0x3f);
          }
          else {
            iVar48 = 0;
            uVar21 = uVar30;
            if (4 < bVar20) {
              while( true ) {
                uVar40 = (undefined4)uVar45;
                iVar12 = uVar42 - 4;
                uVar21 = uVar30 - iVar12;
                if (iVar12 <= (int)uVar30) break;
                if (puStack_40 == *(uint **)((long)p + 0x4a0)) {
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(uint *)((long)p + 0x510) = uVar14;
                    *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                    *(ulong *)((long)p + 0x4c8) = uVar22;
                    *(uint *)((long)p + 0x4d0) = uVar30;
                    *(uint **)((long)p + 0x498) = puStack_40;
                    *(uint *)((long)p + 0x4f70) = uVar39;
                    *(uint *)((long)p + 0x4f74) = uVar11;
                    *(uint *)((long)p + 0x4f7c) = uVar42;
                    *(int *)((long)p + 0x4f2c) = iVar46;
                    *(int *)((long)p + 0x4f30) = iStack_a4;
                    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                    *(int *)((long)p + 0x4f38) = iStack_a8;
                    *(uint *)((long)p + 0x4f3c) = uStack_8c;
                    *(uint *)((long)p + 0x4f44) = uStack_80._4_4_;
                    *(undefined4 *)((long)p + 0x4f48) = uVar40;
                    *(int *)((long)p + 0x4f18) = (int)uStack_68;
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    puVar26 = *(uint **)((long)p + 0x490);
                    goto LAB_00111609;
                  }
LAB_001146df:
                  uVar38 = 0;
                }
                else {
LAB_0010ffaf:
                  uVar38 = (ulong)(byte)*puStack_40;
                  puStack_40 = (uint *)((long)puStack_40 + 1);
                }
                cVar8 = (char)uVar30;
                uVar30 = uVar30 + 8;
                uVar22 = uVar22 | uVar38 << (0x38U - cVar8 & 0x3f);
              }
              iVar48 = (int)(uVar22 >> (0x44U - (char)uVar42 & 0x3f)) << 4;
              if (iVar12 == 0) {
                iVar48 = 0;
              }
              uVar22 = uVar22 << ((byte)iVar12 & 0x3f);
            }
            prVar35 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820);
            pdVar28 = *(decoder_tables **)((long)p + 0x4850);
            if ((int)uVar21 < 0x18) {
              puVar26 = *(uint **)((long)p + 0x4a0);
              if (puStack_40 + 1 < puVar26) {
                uVar30 = *puStack_40;
                uVar21 = uVar21 + 0x20;
                uVar22 = uVar22 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                          (uVar30 & 0xff00) << 8 | uVar30 << 0x18) <<
                                  (-(char)uVar21 & 0x3fU);
                puStack_40 = puStack_40 + 1;
              }
              else {
                for (; (int)uVar21 < 0x18; uVar21 = uVar21 + 8) {
                  if (*(char *)((long)p + 0x4b0) == '\0') {
                    *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
                    *(uint *)((long)p + 0x510) = uVar14;
                    *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
                    *(ulong *)((long)p + 0x4c8) = uVar22;
                    *(uint *)((long)p + 0x4d0) = uVar21;
                    *(uint **)((long)p + 0x498) = puStack_40;
                    *(uint *)((long)p + 0x4f70) = uVar39;
                    *(uint *)((long)p + 0x4f74) = uVar11;
                    *(int *)((long)p + 0x4f78) = iVar48;
                    *(int *)((long)p + 0x4f2c) = iVar46;
                    *(int *)((long)p + 0x4f30) = iStack_a4;
                    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
                    *(int *)((long)p + 0x4f38) = iStack_a8;
                    *(uint *)((long)p + 0x4f3c) = uStack_8c;
                    *(uint *)((long)p + 0x4f44) = uStack_80._4_4_;
                    *(undefined4 *)((long)p + 0x4f48) = uVar40;
                    *(uint *)((long)p + 0x4f18) = (uint)uStack_68;
                    plVar19 = *(long **)((long)p + 0x558);
                    puVar16 = *(ulong **)((long)p + 0x568);
                    puVar27 = *(uint **)((long)p + 0x490);
                    goto LAB_001148f9;
                  }
LAB_00114706:
                  uVar38 = 0;
                  if (puStack_40 < puVar26) {
                    uVar38 = (ulong)(byte)*puStack_40;
                    puStack_40 = (uint *)((long)puStack_40 + 1);
                  }
                  uVar22 = uVar22 | uVar38 << (0x38U - (char)uVar21 & 0x3f);
                }
              }
            }
            uVar30 = (uint)(ushort)(uVar22 >> 0x30);
            if (uVar30 < pdVar28->m_table_max_code) {
              uVar42 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] & 0xffff;
              uVar30 = pdVar28->m_lookup[uVar22 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10;
            }
            else {
              iVar12 = pdVar28->m_decode_start_code_size - 0x41;
              do {
                iVar15 = iVar12;
                iVar12 = iVar15 + 1;
              } while (pdVar28->m_max_codes[iVar15 + 0x40U] <= uVar30);
              uVar42 = (int)(uVar22 >> (-(char)(iVar15 + 1) & 0x3fU)) +
                       pdVar28->m_val_ptrs[iVar15 + 0x40U];
              uVar30 = 0;
              if (uVar42 < prVar35->m_total_syms) {
                uVar30 = uVar42;
              }
              uVar42 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar30];
              uVar30 = iVar15 + 0x41;
            }
            uVar22 = uVar22 << ((byte)uVar30 & 0x3f);
            puVar2 = (prVar35->m_sym_freq).m_p + uVar42;
            *puVar2 = *puVar2 + 1;
            uVar21 = uVar21 - uVar30;
            puVar1 = &prVar35->m_symbols_until_update;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              raw_quasi_adaptive_huffman_data_model::update(prVar35);
            }
            iVar48 = uVar42 + iVar48;
          }
          uStack_8c = (uint)(6 < uStack_8c) * 3 + 7;
          iStack_a8 = (int)uStack_a0;
          uStack_a0._0_4_ = iStack_a4;
          uStack_78 = puStack_40;
          iVar48 = iVar48 + *(int *)((long)p + (ulong)uVar11 * 4 + 0x10);
          uVar43 = (uint)uStack_68;
          iStack_a4 = iVar46;
          uVar30 = uVar21;
          goto LAB_001147dc;
        }
        if (uVar43 == 0) goto LAB_00114285;
LAB_0011367f:
        iStack_a8 = 1;
        uStack_8c = 0;
        uStack_a0._0_4_ = 1;
        iStack_a4 = 1;
        iVar48 = 1;
      } while( true );
    }
    switch(iVar48) {
    case 0x337:
      uStack_78 = *(uint **)((long)p + 0x550);
      lVar23 = **(long **)((long)p + 0x558);
      *(uint **)((long)p + 0x490) = uStack_78;
      *(uint **)((long)p + 0x498) = uStack_78;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_78);
      *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
      pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
      *(void **)((long)p + 0x4f50) = pvVar33;
      uVar32 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
      *(ulong *)((long)p + 0x4f58) = uVar32;
      if (uVar32 != 0) {
        uVar22 = *puVar16;
        if (uVar32 < *puVar16) {
          uVar22 = uVar32;
        }
        *(ulong *)((long)p + 0x4f60) = uVar22;
        if (*(int *)((long)p + 0x594) == 0) {
          memcpy(pbVar5,pvVar33,uVar22);
        }
        else if (uVar22 != 0) {
          uVar32 = 0;
          do {
            sVar47 = uVar22 - uVar32;
            if (0x1fff < sVar47) {
              sVar47 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x560) + uVar32),
                   (void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47);
            uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47,
                             *(uint *)((long)p + 0x548));
            *(uint *)((long)p + 0x548) = uVar13;
            uVar32 = uVar32 + sVar47;
            uVar22 = *(ulong *)((long)p + 0x4f60);
          } while (uVar32 < uVar22);
        }
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
        *(undefined4 *)p = 0x337;
        return LZHAM_DECOMP_STATUS_NOT_FINISHED;
      }
      iVar46 = *(int *)((long)p + 0x4f2c);
      iStack_a4 = *(int *)((long)p + 0x4f30);
      uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
      iStack_a8 = *(int *)((long)p + 0x4f38);
      uStack_8c = *(uint *)((long)p + 0x4f3c);
      uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
      uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
      uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
      uVar14 = *(uint *)((long)p + 0x510);
      uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
      uVar22 = *(ulong *)((long)p + 0x4c8);
      uVar30 = *(uint *)((long)p + 0x4d0);
      iVar48 = *(int *)((long)p + 0x598);
      goto LAB_00113190;
    case 0x338:
    case 0x339:
    case 0x33a:
    case 0x33b:
    case 0x33c:
    case 0x33e:
      goto switchD_0010f80a_caseD_338;
    case 0x33d:
      puVar26 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar26;
      *(uint **)((long)p + 0x498) = puVar26;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      uStack_78 = puVar26;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        iVar46 = *(int *)((long)p + 0x4f2c);
        iStack_a4 = *(int *)((long)p + 0x4f30);
        uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
        iStack_a8 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar11 = *(uint *)((long)p + 0x4f44);
        uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
        uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar14 = *(uint *)((long)p + 0x510);
        uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
        uVar22 = *(ulong *)((long)p + 0x4c8);
        uVar30 = *(uint *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_00111335;
        uVar32 = 0;
        goto LAB_0011133e;
      }
LAB_001119e9:
      *plVar19 = (long)uStack_78 - (long)puVar26;
      *puVar16 = 0;
      *(undefined4 *)p = 0x33d;
      break;
    case 0x33f:
      puVar26 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar26;
      *(uint **)((long)p + 0x498) = puVar26;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      uStack_78 = puVar26;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        iVar46 = *(int *)((long)p + 0x4f2c);
        iStack_a4 = *(int *)((long)p + 0x4f30);
        uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
        iStack_a8 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar11 = *(uint *)((long)p + 0x4f44);
        uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
        uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar14 = *(uint *)((long)p + 0x510);
        uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
        uVar22 = *(ulong *)((long)p + 0x4c8);
        uVar30 = *(uint *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_0011142b;
        uVar32 = 0;
        goto LAB_00111434;
      }
LAB_00111aa1:
      *plVar19 = (long)uStack_78 - (long)puVar26;
      *puVar16 = 0;
      *(undefined4 *)p = 0x33f;
      break;
    case 0x340:
      puVar26 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar26;
      *(uint **)((long)p + 0x498) = puVar26;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      uStack_78 = puVar26;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        iVar46 = *(int *)((long)p + 0x4f2c);
        iStack_a4 = *(int *)((long)p + 0x4f30);
        uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
        iStack_a8 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar11 = *(uint *)((long)p + 0x4f44);
        uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
        uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar14 = *(uint *)((long)p + 0x510);
        uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
        uVar32 = *(ulong *)((long)p + 0x4c8);
        iVar48 = *(int *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_0011123f;
        uVar22 = 0;
        goto LAB_00111248;
      }
LAB_001119cd:
      *plVar19 = (long)uStack_78 - (long)puVar26;
      *puVar16 = 0;
      *(undefined4 *)p = 0x340;
      break;
    default:
      if (iVar48 == 0x325) {
        puVar26 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar23 = *plVar19;
        *(uint **)((long)p + 0x490) = puVar26;
        *(uint **)((long)p + 0x498) = puVar26;
        *(long *)((long)p + 0x4a8) = lVar23;
        *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        uStack_78 = puVar26;
        if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          iVar46 = *(int *)((long)p + 0x4f2c);
          iStack_a4 = *(int *)((long)p + 0x4f30);
          uStack_a0._0_4_ = *(int *)((long)p + 0x4f34);
          iStack_a8 = *(int *)((long)p + 0x4f38);
          uStack_8c = *(uint *)((long)p + 0x4f3c);
          uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
          uStack_68 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar14 = *(uint *)((long)p + 0x510);
          uStack_a0._4_4_ = *(uint *)((long)p + 0x514);
          uVar22 = *(ulong *)((long)p + 0x4c8);
          uVar30 = *(uint *)((long)p + 0x4d0);
          if (0 < lVar23) {
            uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
            goto LAB_00111526;
          }
          uVar32 = 0;
          uVar38 = (ulong)*(uint *)((long)p + 0x4f44);
          do {
            while( true ) {
              cVar8 = (char)uVar30;
              uVar30 = uVar30 + 8;
              uVar22 = uVar22 | uVar32 << (0x38U - cVar8 & 0x3f);
LAB_00111544:
              if (-1 < (int)uVar30) {
                uVar22 = uVar22 << ((byte)uVar30 & 7);
                uVar30 = uVar30 & 0x7ffffff8;
                goto LAB_00113178;
              }
              if (uStack_78 == *(uint **)((long)p + 0x4a0)) break;
LAB_00111526:
              uVar32 = (ulong)(byte)*uStack_78;
              uStack_78 = (uint *)((long)uStack_78 + 1);
            }
            uVar32 = 0;
          } while (*(char *)((long)p + 0x4b0) != '\0');
          *(uint *)((long)p + 0x510) = uVar14;
          *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
          *(ulong *)((long)p + 0x4c8) = uVar22;
          *(uint *)((long)p + 0x4d0) = uVar30;
          *(uint **)((long)p + 0x498) = uStack_78;
          *(int *)((long)p + 0x4f2c) = iVar46;
          *(int *)((long)p + 0x4f30) = iStack_a4;
          *(int *)((long)p + 0x4f34) = (int)uStack_a0;
          *(int *)((long)p + 0x4f38) = iStack_a8;
          *(uint *)((long)p + 0x4f3c) = uStack_8c;
          *(int *)((long)p + 0x4f44) = (int)uVar38;
          *(int *)((long)p + 0x4f48) = (int)uVar45;
          *(int *)((long)p + 0x4f18) = (int)uStack_68;
          puVar26 = *(uint **)((long)p + 0x490);
          plVar19 = *(long **)((long)p + 0x558);
          puVar16 = *(ulong **)((long)p + 0x568);
        }
        *plVar19 = (long)uStack_78 - (long)puVar26;
        *puVar16 = 0;
        *(undefined4 *)p = 0x325;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar48 != 0x35c) goto switchD_0010f80a_caseD_338;
      goto LAB_001132c4;
    }
    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
  }
  uVar32 = 1L << (*(byte *)((long)p + 0x58c) & 0x3f);
  uVar14 = (int)uVar32 - 1;
  pbVar5 = *(byte **)((long)p + 0x540);
  iVar48 = *p;
  if (iVar48 < 0x22b) {
    if (iVar48 < 0x17c) {
      if (iVar48 < 0x137) {
        if (iVar48 < 0x11a) {
          if (iVar48 == 0) {
            uStack_70 = 0;
            bVar9 = symbol_codec::start_decoding
                              ((symbol_codec *)((long)p + 0x490),*(uint8 **)((long)p + 0x550),
                               **(size_t **)((long)p + 0x558),*(bool *)((long)p + 0x570),
                               (need_bytes_func_ptr)0x0,(void *)0x0);
            if (bVar9) {
              uVar11 = *(uint *)((long)p + 0x510);
              uVar39 = *(uint *)((long)p + 0x514);
              uStack_a0 = *(uint **)((long)p + 0x498);
              uVar38 = *(ulong *)((long)p + 0x4c8);
              iVar46 = *(int *)((long)p + 0x4d0);
              uVar30 = 0;
              uStack_68 = 0;
              uVar14 = 0;
              iVar48 = 0;
              iStack_a4 = 0;
              iStack_a8 = 0;
              uStack_78._4_4_ = 0;
              goto LAB_00116179;
            }
            return LZHAM_DECOMP_STATUS_FAILED;
          }
          if (iVar48 == 0xff) {
            uStack_a0 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = uStack_a0;
            *(uint **)((long)p + 0x498) = uStack_a0;
            *(long *)((long)p + 0x4a8) = lVar23;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_a0 + lVar23);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puVar26 = uStack_a0;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_00117045:
              *plVar19 = (long)uStack_a0 - (long)puVar26;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0xff;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uVar14 = *(uint *)((long)p + 0x4f3c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
            uVar30 = *(uint *)((long)p + 0x4f48);
            uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar11 = *(uint *)((long)p + 0x510);
            uVar39 = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            iVar46 = *(int *)((long)p + 0x4d0);
            if (lVar23 < 1) {
              uVar32 = 0;
              goto LAB_001155d2;
            }
LAB_001155c2:
            uVar32 = (ulong)(byte)*uStack_a0;
            uStack_a0 = (uint *)((long)uStack_a0 + 1);
LAB_001155d2:
            cVar8 = (char)iVar46;
            iVar46 = iVar46 + 8;
            uVar38 = uVar38 | uVar32 << (0x38U - cVar8 & 0x3f);
LAB_00116179:
            if (1 < iVar46) {
              uVar38 = uVar38 * 4;
              lVar23 = 0;
              do {
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar23 + 0x5a0),
                           (EVP_PKEY_CTX *)0x0);
                lVar23 = lVar23 + 0x80;
              } while (lVar23 != 0x2000);
              lVar23 = 0;
              do {
                raw_quasi_adaptive_huffman_data_model::init
                          ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar23 + 0x25a0),
                           (EVP_PKEY_CTX *)0x0);
                lVar23 = lVar23 + 0x80;
              } while (lVar23 != 0x2000);
              raw_quasi_adaptive_huffman_data_model::init
                        ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0),
                         (EVP_PKEY_CTX *)0x0);
              raw_quasi_adaptive_huffman_data_model::init
                        ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4620),
                         (EVP_PKEY_CTX *)0x0);
              raw_quasi_adaptive_huffman_data_model::init
                        ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4720),
                         (EVP_PKEY_CTX *)0x0);
              raw_quasi_adaptive_huffman_data_model::init
                        ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x46a0),
                         (EVP_PKEY_CTX *)0x0);
              raw_quasi_adaptive_huffman_data_model::init
                        ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x47a0),
                         (EVP_PKEY_CTX *)0x0);
              uVar21 = iVar46 - 2;
              raw_quasi_adaptive_huffman_data_model::init
                        ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820),
                         (EVP_PKEY_CTX *)0x0);
              uVar22 = (ulong)uVar14;
              uVar31 = (ulong)uVar30;
              goto LAB_0011863f;
            }
            if (uStack_a0 == *(uint **)((long)p + 0x4a0)) goto LAB_00117e9e;
            goto LAB_001155c2;
          }
        }
        else {
          if (iVar48 == 0x11a) {
            puVar26 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = puVar26;
            *(uint **)((long)p + 0x498) = puVar26;
            *(long *)((long)p + 0x4a8) = lVar23;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            uStack_a0 = puVar26;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
              uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
              iStack_a8 = *(int *)((long)p + 0x4f30);
              iStack_a4 = *(int *)((long)p + 0x4f34);
              iVar48 = *(int *)((long)p + 0x4f38);
              uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
              uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
              uVar14 = *(uint *)((long)p + 0x4f48);
              uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar11 = *(uint *)((long)p + 0x510);
              uVar39 = *(uint *)((long)p + 0x514);
              uVar38 = *(ulong *)((long)p + 0x4c8);
              uVar21 = *(uint *)((long)p + 0x4d0);
              if (0 < lVar23) goto LAB_00115d27;
              uVar32 = 0;
              goto LAB_00115d2d;
            }
LAB_001170ae:
            *plVar19 = (long)uStack_a0 - (long)puVar26;
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x11a;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar48 == 0x126) {
            uStack_a0 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = uStack_a0;
            *(uint **)((long)p + 0x498) = uStack_a0;
            *(long *)((long)p + 0x4a8) = lVar23;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_a0 + lVar23);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puVar26 = uStack_a0;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_001171de:
              *plVar19 = (long)uStack_a0 - (long)puVar26;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x126;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
            uVar45 = (ulong)*(uint *)((long)p + 0x4f44);
            uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar40 = *(undefined4 *)((long)p + 0x510);
            uVar29 = *(undefined4 *)((long)p + 0x514);
            uVar24 = *(ulong *)((long)p + 0x4c8);
            uVar39 = *(uint *)((long)p + 0x4d0);
            if (lVar23 < 1) {
              uVar38 = 0;
              uVar11 = uVar39;
              goto LAB_0011673e;
            }
            do {
              uVar38 = (ulong)(byte)*uStack_a0;
              uStack_a0 = (uint *)((long)uStack_a0 + 1);
              uVar11 = uVar39;
LAB_0011673e:
              while( true ) {
                uVar39 = uVar11 + 8;
                uVar24 = uVar24 | uVar38 << (0x38U - (char)uVar11 & 0x3f);
                uVar31 = (ulong)*(uint *)((long)p + 0x4f48);
                if (0x17 < (int)uVar39) {
                  uVar38 = uVar24 << 0x18;
                  uVar11 = uVar11 - 0x10;
                  uVar30 = (uint)(uVar24 >> 0x28) + 1;
                  if ((uVar39 & 7) != 0) goto LAB_00116785;
                  goto LAB_00118175;
                }
                if (uStack_a0 != *(uint **)((long)p + 0x4a0)) break;
                uVar38 = 0;
                uVar11 = uVar39;
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(undefined4 *)((long)p + 0x510) = uVar40;
                  *(undefined4 *)((long)p + 0x514) = uVar29;
                  *(ulong *)((long)p + 0x4c8) = uVar24;
                  *(uint *)((long)p + 0x4d0) = uVar39;
                  *(uint **)((long)p + 0x498) = uStack_a0;
                  *(undefined4 *)((long)p + 0x4f90) = *(undefined4 *)((long)p + 0x4f90);
                  *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                  *(int *)((long)p + 0x4f30) = iStack_a8;
                  *(int *)((long)p + 0x4f34) = iStack_a4;
                  *(int *)((long)p + 0x4f38) = iVar48;
                  *(uint *)((long)p + 0x4f3c) = *(uint *)((long)p + 0x4f3c);
                  *(uint *)((long)p + 0x4f44) = *(uint *)((long)p + 0x4f44);
                  *(uint *)((long)p + 0x4f48) = *(uint *)((long)p + 0x4f48);
                  *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar26 = *(uint **)((long)p + 0x490);
                  goto LAB_001171de;
                }
              }
            } while( true );
          }
          if (iVar48 == 0x129) {
            uStack_a0 = *(uint **)((long)p + 0x550);
            plVar19 = *(long **)((long)p + 0x558);
            lVar23 = *plVar19;
            *(uint **)((long)p + 0x490) = uStack_a0;
            *(uint **)((long)p + 0x498) = uStack_a0;
            *(long *)((long)p + 0x4a8) = lVar23;
            *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_a0 + lVar23);
            *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
            puVar26 = uStack_a0;
            if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) != 1) {
LAB_00117104:
              *plVar19 = (long)uStack_a0 - (long)puVar26;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x129;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            uVar30 = *(uint *)((long)p + 0x4f90);
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
            uVar45 = (ulong)*(uint *)((long)p + 0x4f44);
            uVar39 = *(uint *)((long)p + 0x4f48);
            uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar40 = *(undefined4 *)((long)p + 0x510);
            uVar29 = *(undefined4 *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            uVar11 = *(uint *)((long)p + 0x4d0);
            if (lVar23 < 1) {
              uVar31 = 0;
              goto LAB_00114c7b;
            }
            do {
              uVar31 = (ulong)(byte)*uStack_a0;
              uStack_a0 = (uint *)((long)uStack_a0 + 1);
LAB_00114c7b:
              while( true ) {
                cVar8 = (char)uVar11;
                uVar11 = uVar11 + 8;
                uVar38 = uVar38 | uVar31 << (0x38U - cVar8 & 0x3f);
                uVar31 = (ulong)uVar39;
LAB_00116785:
                if (-1 < (int)uVar11) {
                  uVar38 = uVar38 << ((byte)uVar11 & 7);
                  uVar11 = uVar11 & 0x7ffffff8;
                  goto LAB_00118175;
                }
                uVar39 = (uint)uVar31;
                if (uStack_a0 != *(uint **)((long)p + 0x4a0)) break;
                uVar31 = 0;
                if (*(char *)((long)p + 0x4b0) == '\0') {
                  *(undefined4 *)((long)p + 0x510) = uVar40;
                  *(undefined4 *)((long)p + 0x514) = uVar29;
                  *(ulong *)((long)p + 0x4c8) = uVar38;
                  *(uint *)((long)p + 0x4d0) = uVar11;
                  *(uint **)((long)p + 0x498) = uStack_a0;
                  *(uint *)((long)p + 0x4f90) = uVar30;
                  *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                  *(int *)((long)p + 0x4f30) = iStack_a8;
                  *(int *)((long)p + 0x4f34) = iStack_a4;
                  *(int *)((long)p + 0x4f38) = iVar48;
                  *(int *)((long)p + 0x4f3c) = (int)uVar22;
                  *(int *)((long)p + 0x4f44) = (int)uVar45;
                  *(uint *)((long)p + 0x4f48) = uVar39;
                  *(int *)((long)p + 0x4f18) = (int)uStack_70;
                  plVar19 = *(long **)((long)p + 0x558);
                  puVar26 = *(uint **)((long)p + 0x490);
                  goto LAB_00117104;
                }
              }
            } while( true );
          }
        }
      }
      else if (iVar48 < 0x156) {
        if (iVar48 == 0x137) {
          *(undefined4 *)p = 0x137;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
        if (iVar48 == 0x13f) {
          uStack_a0 = *(uint **)((long)p + 0x550);
          lVar23 = **(long **)((long)p + 0x558);
          *(uint **)((long)p + 0x490) = uStack_a0;
          *(uint **)((long)p + 0x498) = uStack_a0;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_a0);
          *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
          pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
          *(void **)((long)p + 0x4f50) = pvVar33;
          uVar22 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
          *(ulong *)((long)p + 0x4f58) = uVar22;
          if (uVar22 == 0) {
            uVar30 = *(uint *)((long)p + 0x4f90);
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
            uVar45 = (ulong)*(uint *)((long)p + 0x4f44);
            uVar31 = (ulong)*(uint *)((long)p + 0x4f48);
            uVar40 = *(undefined4 *)((long)p + 0x510);
            uVar29 = *(undefined4 *)((long)p + 0x514);
            uVar11 = *(uint *)((long)p + 0x4d0);
            uStack_70 = 0;
            uVar38 = *(ulong *)((long)p + 0x4c8);
            goto LAB_00118171;
          }
LAB_0011827f:
          uVar32 = **(ulong **)((long)p + 0x568);
          if (uVar32 <= uVar22) {
            uVar22 = uVar32;
          }
          *(ulong *)((long)p + 0x4f60) = uVar22;
          if (*(int *)((long)p + 0x594) == 0) {
            memcpy(*(void **)((long)p + 0x560),pvVar33,uVar22);
          }
          else if (uVar32 != 0) {
            uVar32 = 0;
            do {
              sVar47 = uVar22 - uVar32;
              if (0x1fff < sVar47) {
                sVar47 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x560) + uVar32),
                     (void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47);
              uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47,
                               *(uint *)((long)p + 0x548));
              *(uint *)((long)p + 0x548) = uVar13;
              uVar32 = uVar32 + sVar47;
              uVar22 = *(ulong *)((long)p + 0x4f60);
            } while (uVar32 < uVar22);
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
          *(undefined4 *)p = 0x13f;
          goto LAB_001188d7;
        }
      }
      else {
        if (iVar48 == 0x156) {
LAB_0011847d:
          *(undefined4 *)p = 0x156;
          return LZHAM_DECOMP_STATUS_FAILED;
        }
        if (iVar48 == 0x15a) {
          uVar30 = *(uint *)((long)p + 0x4f90);
          uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
          iStack_a8 = *(int *)((long)p + 0x4f30);
          iStack_a4 = *(int *)((long)p + 0x4f34);
          iVar48 = *(int *)((long)p + 0x4f38);
          uVar11 = *(uint *)((long)p + 0x4f3c);
          uVar39 = *(uint *)((long)p + 0x4f44);
          uStack_8c = *(uint *)((long)p + 0x4f48);
          uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
          lVar23 = *(long *)((long)p + 0x550);
          puVar16 = *(ulong **)((long)p + 0x558);
          uVar22 = *puVar16;
          *(long *)((long)p + 0x490) = lVar23;
          *(long *)((long)p + 0x498) = lVar23;
          *(ulong *)((long)p + 0x4a8) = uVar22;
          *(ulong *)((long)p + 0x4a0) = lVar23 + uVar22;
          *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
          uVar38 = 0;
          goto LAB_00118380;
        }
        if (iVar48 == 0x16c) {
          *(undefined4 *)p = 0x16c;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
      }
      goto switchD_001152f2_caseD_338;
    }
    if (0x1c8 < iVar48) {
      if (iVar48 < 0x1e6) {
        if (iVar48 == 0x1c9) {
          puVar26 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar26;
          *(uint **)((long)p + 0x498) = puVar26;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          uStack_a0 = puVar26;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
            uVar45 = (ulong)*(uint *)((long)p + 0x4f44);
            uStack_8c = *(uint *)((long)p + 0x4f48);
            uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar11 = *(uint *)((long)p + 0x510);
            uVar30 = *(uint *)((long)p + 0x514);
            uVar31 = *(ulong *)((long)p + 0x4c8);
            uVar21 = *(uint *)((long)p + 0x4d0);
            if (0 < lVar23) goto LAB_0011660d;
            uVar38 = 0;
            goto LAB_00116619;
          }
LAB_001171bb:
          *plVar19 = (long)uStack_a0 - (long)puVar26;
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x1c9;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar48 == 0x1dd) {
          *(undefined4 *)p = 0x1dd;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
      }
      else {
        if (iVar48 == 0x1e6) {
          uStack_a0 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = uStack_a0;
          *(uint **)((long)p + 0x498) = uStack_a0;
          *(long *)((long)p + 0x4a8) = lVar23;
          puVar26 = (uint *)((long)uStack_a0 + lVar23);
          *(uint **)((long)p + 0x4a0) = puVar26;
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar27 = uStack_a0;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
            uStack_8c = *(uint *)((long)p + 0x4f48);
            uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar11 = *(uint *)((long)p + 0x510);
            uVar39 = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            uVar21 = *(uint *)((long)p + 0x4d0);
            prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar28 = prVar35->m_pDecode_tables;
            goto LAB_001192f0;
          }
LAB_001193af:
          *plVar19 = (long)uStack_a0 - (long)puVar27;
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x1e6;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar48 == 0x206) {
          uStack_a0 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = uStack_a0;
          *(uint **)((long)p + 0x498) = uStack_a0;
          *(long *)((long)p + 0x4a8) = lVar23;
          puVar26 = (uint *)((long)uStack_a0 + lVar23);
          *(uint **)((long)p + 0x4a0) = puVar26;
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          puVar27 = uStack_a0;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar30 = *(uint *)((long)p + 0x4f6c);
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uStack_88 = (ulong)*(uint *)((long)p + 0x4f3c) << 0x20;
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
            uStack_8c = *(uint *)((long)p + 0x4f48);
            uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar11 = *(uint *)((long)p + 0x510);
            uVar39 = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            uVar21 = *(uint *)((long)p + 0x4d0);
            prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar28 = prVar35->m_pDecode_tables;
            goto LAB_0011958e;
          }
LAB_00119658:
          *plVar19 = (long)uStack_a0 - (long)puVar27;
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x206;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar48 == 0x21c) {
          uStack_a0 = *(uint **)((long)p + 0x550);
          lVar23 = **(long **)((long)p + 0x558);
          *(uint **)((long)p + 0x490) = uStack_a0;
          *(uint **)((long)p + 0x498) = uStack_a0;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_a0);
          *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
          pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
          *(void **)((long)p + 0x4f50) = pvVar33;
          uVar22 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
          *(ulong *)((long)p + 0x4f58) = uVar22;
          if (uVar22 == 0) {
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
            uVar45 = (ulong)*(uint *)((long)p + 0x4f44);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f48);
            uVar11 = *(uint *)((long)p + 0x510);
            uVar39 = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            uVar21 = *(uint *)((long)p + 0x4d0);
            uStack_70 = 0;
            goto LAB_00118dae;
          }
LAB_00115236:
          uVar32 = **(ulong **)((long)p + 0x568);
          if (uVar32 <= uVar22) {
            uVar22 = uVar32;
          }
          *(ulong *)((long)p + 0x4f60) = uVar22;
          if (*(int *)((long)p + 0x594) == 0) {
            memcpy(*(void **)((long)p + 0x560),pvVar33,uVar22);
          }
          else if (uVar32 != 0) {
            uVar32 = 0;
            do {
              sVar47 = uVar22 - uVar32;
              if (0x1fff < sVar47) {
                sVar47 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x560) + uVar32),
                     (void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47);
              uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47,
                               *(uint *)((long)p + 0x548));
              *(uint *)((long)p + 0x548) = uVar13;
              uVar32 = uVar32 + sVar47;
              uVar22 = *(ulong *)((long)p + 0x4f60);
            } while (uVar32 < uVar22);
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
          *(undefined4 *)p = 0x21c;
          goto LAB_001188d7;
        }
      }
      goto switchD_001152f2_caseD_338;
    }
    switch(iVar48) {
    case 0x18d:
      uStack_a0 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = uStack_a0;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_a0 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar26 = uStack_a0;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar40 = *(undefined4 *)((long)p + 0x4f2c);
        iStack_a8 = *(undefined4 *)((long)p + 0x4f30);
        iStack_a4 = *(undefined4 *)((long)p + 0x4f34);
        uStack_ac = *(undefined4 *)((long)p + 0x4f38);
        uVar29 = *(undefined4 *)((long)p + 0x4f3c);
        uVar34 = *(undefined4 *)((long)p + 0x4f44);
        uVar37 = *(undefined4 *)((long)p + 0x4f48);
        uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar38 = *(ulong *)((long)p + 0x4c8);
        iVar46 = *(int *)((long)p + 0x4d0);
        if (lVar23 < 1) {
          uVar22 = 0;
          iVar48 = iVar46;
          goto LAB_00114eaa;
        }
        do {
          uVar22 = (ulong)(byte)*uStack_a0;
          uStack_a0 = (uint *)((long)uStack_a0 + 1);
          iVar48 = iVar46;
LAB_00114eaa:
          while( true ) {
            iVar46 = iVar48 + 8;
            uVar38 = uVar38 | uVar22 << (0x38U - (char)iVar48 & 0x3f);
            if (7 < iVar46) {
              uVar22 = uVar38 << 8;
              uVar11 = (uint)(uVar38 >> 0x20) & 0xff000000;
              goto LAB_00116bc1;
            }
            if (uStack_a0 != *(uint **)((long)p + 0x4a0)) break;
            uVar22 = 0;
            iVar48 = iVar46;
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(undefined4 *)((long)p + 0x510) = *(undefined4 *)((long)p + 0x510);
              *(uint *)((long)p + 0x514) = uVar39;
              *(ulong *)((long)p + 0x4c8) = uVar38;
              *(int *)((long)p + 0x4d0) = iVar46;
              *(uint **)((long)p + 0x498) = uStack_a0;
              *(undefined4 *)((long)p + 0x4f2c) = uVar40;
              *(int *)((long)p + 0x4f30) = iStack_a8;
              *(int *)((long)p + 0x4f34) = iStack_a4;
              *(undefined4 *)((long)p + 0x4f38) = uStack_ac;
              *(undefined4 *)((long)p + 0x4f3c) = uVar29;
              *(undefined4 *)((long)p + 0x4f44) = uVar34;
              *(undefined4 *)((long)p + 0x4f48) = uVar37;
              *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
              plVar19 = *(long **)((long)p + 0x558);
              puVar26 = *(uint **)((long)p + 0x490);
              goto LAB_00117219;
            }
          }
        } while( true );
      }
LAB_00117219:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x18d;
      break;
    case 0x18e:
      uStack_a0 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = uStack_a0;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_a0 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar26 = uStack_a0;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar40 = *(undefined4 *)((long)p + 0x4f2c);
        iStack_a8 = *(undefined4 *)((long)p + 0x4f30);
        iStack_a4 = *(undefined4 *)((long)p + 0x4f34);
        uStack_ac = *(undefined4 *)((long)p + 0x4f38);
        uVar29 = *(undefined4 *)((long)p + 0x4f3c);
        uVar34 = *(undefined4 *)((long)p + 0x4f44);
        uVar37 = *(undefined4 *)((long)p + 0x4f48);
        uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar22 = *(ulong *)((long)p + 0x4c8);
        iVar48 = *(int *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_00116b92;
        uVar38 = 0;
        goto LAB_00116ba1;
      }
LAB_0011723c:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x18e;
      break;
    case 399:
      uStack_a0 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = uStack_a0;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_a0 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar26 = uStack_a0;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar40 = *(undefined4 *)((long)p + 0x4f2c);
        iStack_a8 = *(undefined4 *)((long)p + 0x4f30);
        iStack_a4 = *(undefined4 *)((long)p + 0x4f34);
        uStack_ac = *(undefined4 *)((long)p + 0x4f38);
        uVar29 = *(undefined4 *)((long)p + 0x4f3c);
        uVar34 = *(undefined4 *)((long)p + 0x4f44);
        uVar37 = *(undefined4 *)((long)p + 0x4f48);
        uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar38 = *(ulong *)((long)p + 0x4c8);
        iVar48 = *(int *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_00115c34;
        uVar22 = 0;
        goto LAB_00115c43;
      }
LAB_00117022:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 399;
      break;
    case 400:
      uStack_a0 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = uStack_a0;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_a0 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar26 = uStack_a0;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar40 = *(undefined4 *)((long)p + 0x4f2c);
        iStack_a8 = *(undefined4 *)((long)p + 0x4f30);
        iStack_a4 = *(undefined4 *)((long)p + 0x4f34);
        uStack_ac = *(undefined4 *)((long)p + 0x4f38);
        uVar29 = *(undefined4 *)((long)p + 0x4f3c);
        uVar34 = *(undefined4 *)((long)p + 0x4f44);
        uVar37 = *(undefined4 *)((long)p + 0x4f48);
        uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar22 = *(ulong *)((long)p + 0x4c8);
        iVar48 = *(int *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_001160c8;
        uVar38 = 0;
        goto LAB_001160ce;
      }
LAB_00117152:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 400;
      break;
    default:
      if (iVar48 != 0x17c) goto switchD_001152f2_caseD_338;
      uStack_a0 = *(uint **)((long)p + 0x550);
      lVar23 = **(long **)((long)p + 0x558);
      *(uint **)((long)p + 0x490) = uStack_a0;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_a0);
      *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
      pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
      *(void **)((long)p + 0x4f50) = pvVar33;
      uVar22 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
      *(ulong *)((long)p + 0x4f58) = uVar22;
      if (uVar22 == 0) {
        uVar30 = *(uint *)((long)p + 0x4f90);
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
        uVar45 = (ulong)*(uint *)((long)p + 0x4f44);
        uVar31 = (ulong)*(uint *)((long)p + 0x4f48);
        uStack_70 = 0;
        goto LAB_00118360;
      }
LAB_001184fb:
      uVar32 = **(ulong **)((long)p + 0x568);
      if (uVar32 <= uVar22) {
        uVar22 = uVar32;
      }
      *(ulong *)((long)p + 0x4f60) = uVar22;
      if (*(int *)((long)p + 0x594) == 0) {
        memcpy(*(void **)((long)p + 0x560),pvVar33,uVar22);
      }
      else if (uVar32 != 0) {
        uVar32 = 0;
        do {
          sVar47 = uVar22 - uVar32;
          if (0x1fff < sVar47) {
            sVar47 = 0x2000;
          }
          memcpy((void *)(*(long *)((long)p + 0x560) + uVar32),
                 (void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47);
          uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47,
                           *(uint *)((long)p + 0x548));
          *(uint *)((long)p + 0x548) = uVar13;
          uVar32 = uVar32 + sVar47;
          uVar22 = *(ulong *)((long)p + 0x4f60);
        } while (uVar32 < uVar22);
      }
      **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
      **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
      *(undefined4 *)p = 0x17c;
      goto LAB_001188d7;
    }
    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
  }
  if (0x29b < iVar48) {
    if (iVar48 < 0x325) {
      if (iVar48 < 0x2c2) {
        if (iVar48 == 0x29c) {
          puVar26 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar26;
          *(uint **)((long)p + 0x498) = puVar26;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          uStack_a0 = puVar26;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar42 = *(uint *)((long)p + 0x4f70);
            uStack_50 = *(uint *)((long)p + 0x4f74);
            uVar30 = *(uint *)((long)p + 0x4f7c);
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uStack_88._4_4_ = *(uint *)((long)p + 0x4f3c);
            uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
            uStack_8c = *(uint *)((long)p + 0x4f48);
            uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar11 = *(uint *)((long)p + 0x510);
            uVar39 = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            uVar21 = *(uint *)((long)p + 0x4d0);
            if (0 < lVar23) goto LAB_00115a74;
            uVar22 = 0;
            goto LAB_00115a87;
          }
LAB_00116fff:
          *plVar19 = (long)uStack_a0 - (long)puVar26;
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x29c;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar48 == 0x2a5) {
          puVar27 = *(uint **)((long)p + 0x550);
          plVar19 = *(long **)((long)p + 0x558);
          lVar23 = *plVar19;
          *(uint **)((long)p + 0x490) = puVar27;
          *(uint **)((long)p + 0x498) = puVar27;
          *(long *)((long)p + 0x4a8) = lVar23;
          puVar26 = (uint *)((long)puVar27 + lVar23);
          *(uint **)((long)p + 0x4a0) = puVar26;
          *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
          uStack_a0 = puVar27;
          if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
            uVar42 = *(uint *)((long)p + 0x4f70);
            uStack_50 = *(uint *)((long)p + 0x4f74);
            iVar46 = *(int *)((long)p + 0x4f78);
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uStack_88 = (ulong)*(uint *)((long)p + 0x4f3c) << 0x20;
            uVar25 = *(uint *)((long)p + 0x4f44);
            uStack_8c = *(uint *)((long)p + 0x4f48);
            uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar11 = *(uint *)((long)p + 0x510);
            uVar39 = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            uVar43 = *(uint *)((long)p + 0x4d0);
            prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar28 = prVar35->m_pDecode_tables;
            goto LAB_0011a249;
          }
LAB_0011a408:
          *plVar19 = (long)uStack_a0 - (long)puVar27;
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x2a5;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      else {
        if (iVar48 == 0x2c2) {
          *(undefined4 *)p = 0x2c2;
          return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
        }
        if (iVar48 == 0x2df) {
          uStack_a0 = *(uint **)((long)p + 0x550);
          lVar23 = **(long **)((long)p + 0x558);
          *(uint **)((long)p + 0x490) = uStack_a0;
          *(uint **)((long)p + 0x498) = uStack_a0;
          *(long *)((long)p + 0x4a8) = lVar23;
          *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_a0);
          *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
          pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
          *(void **)((long)p + 0x4f50) = pvVar33;
          uVar22 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
          *(ulong *)((long)p + 0x4f58) = uVar22;
          if (uVar22 == 0) {
            uVar42 = *(uint *)((long)p + 0x4f70);
            uVar31 = (ulong)*(uint *)((long)p + 0x4f80);
            pbVar41 = *(byte **)((long)p + 0x4f88);
            uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_a8 = *(int *)((long)p + 0x4f30);
            iStack_a4 = *(int *)((long)p + 0x4f34);
            iVar48 = *(int *)((long)p + 0x4f38);
            uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
            uVar30 = *(uint *)((long)p + 0x4f44);
            uVar45 = (ulong)*(uint *)((long)p + 0x4f48);
            uVar11 = *(uint *)((long)p + 0x510);
            uVar39 = *(uint *)((long)p + 0x514);
            uVar38 = *(ulong *)((long)p + 0x4c8);
            uVar21 = *(uint *)((long)p + 0x4d0);
            uVar24 = 0;
            goto LAB_00118cd0;
          }
LAB_0011544c:
          uVar32 = **(ulong **)((long)p + 0x568);
          if (uVar32 <= uVar22) {
            uVar22 = uVar32;
          }
          *(ulong *)((long)p + 0x4f60) = uVar22;
          if (*(int *)((long)p + 0x594) == 0) {
            memcpy(*(void **)((long)p + 0x560),pvVar33,uVar22);
          }
          else if (uVar32 != 0) {
            uVar32 = 0;
            do {
              sVar47 = uVar22 - uVar32;
              if (0x1fff < sVar47) {
                sVar47 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x560) + uVar32),
                     (void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47);
              uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47,
                               *(uint *)((long)p + 0x548));
              *(uint *)((long)p + 0x548) = uVar13;
              uVar32 = uVar32 + sVar47;
              uVar22 = *(ulong *)((long)p + 0x4f60);
            } while (uVar32 < uVar22);
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
          *(undefined4 *)p = 0x2df;
          goto LAB_001188d7;
        }
      }
      goto switchD_001152f2_caseD_338;
    }
    switch(iVar48) {
    case 0x337:
      uStack_a0 = *(uint **)((long)p + 0x550);
      lVar23 = **(long **)((long)p + 0x558);
      *(uint **)((long)p + 0x490) = uStack_a0;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)(lVar23 + (long)uStack_a0);
      *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
      pvVar33 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
      *(void **)((long)p + 0x4f50) = pvVar33;
      uStack_70 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
      *(ulong *)((long)p + 0x4f58) = uStack_70;
      if (uStack_70 == 0) {
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
        uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
        uVar31 = (ulong)*(uint *)((long)p + 0x4f48);
        uVar40 = *(undefined4 *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar38 = *(ulong *)((long)p + 0x4c8);
        uVar21 = *(uint *)((long)p + 0x4d0);
        iVar46 = *(int *)((long)p + 0x598);
        goto LAB_001187ff;
      }
      break;
    case 0x338:
    case 0x339:
    case 0x33a:
    case 0x33b:
    case 0x33c:
    case 0x33e:
      goto switchD_001152f2_caseD_338;
    case 0x33d:
      puVar26 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar26;
      *(uint **)((long)p + 0x498) = puVar26;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      uStack_a0 = puVar26;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
        uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
        uVar14 = *(uint *)((long)p + 0x4f48);
        uVar40 = *(undefined4 *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar38 = *(ulong *)((long)p + 0x4c8);
        uVar21 = *(uint *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_00116de5;
        uVar32 = 0;
        goto LAB_00116def;
      }
LAB_00117301:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x33d;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    case 0x33f:
      puVar26 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar26;
      *(uint **)((long)p + 0x498) = puVar26;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      uStack_a0 = puVar26;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
        uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
        uVar14 = *(uint *)((long)p + 0x4f48);
        uVar40 = *(undefined4 *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar38 = *(ulong *)((long)p + 0x4c8);
        uVar21 = *(uint *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_00116ec5;
        uVar32 = 0;
        goto LAB_00116ecf;
      }
LAB_00117324:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x33f;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    case 0x340:
      puVar26 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar26;
      *(uint **)((long)p + 0x498) = puVar26;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      uStack_a0 = puVar26;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
        uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
        uVar14 = *(uint *)((long)p + 0x4f48);
        uVar40 = *(undefined4 *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar32 = *(ulong *)((long)p + 0x4c8);
        iVar46 = *(int *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_00116d05;
        uVar38 = 0;
        goto LAB_00116d0f;
      }
LAB_001172de:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x340;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    default:
      if (iVar48 == 0x325) {
        puVar26 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar23 = *plVar19;
        *(uint **)((long)p + 0x490) = puVar26;
        *(uint **)((long)p + 0x498) = puVar26;
        *(long *)((long)p + 0x4a8) = lVar23;
        *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        uStack_a0 = puVar26;
        if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
          iStack_a8 = *(int *)((long)p + 0x4f30);
          iStack_a4 = *(int *)((long)p + 0x4f34);
          iVar48 = *(int *)((long)p + 0x4f38);
          uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
          uVar45 = (ulong)*(uint *)((long)p + 0x4f44);
          uVar14 = *(uint *)((long)p + 0x4f48);
          uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar11 = *(uint *)((long)p + 0x510);
          uVar39 = *(uint *)((long)p + 0x514);
          uVar38 = *(ulong *)((long)p + 0x4c8);
          uVar21 = *(uint *)((long)p + 0x4d0);
          if (0 < lVar23) goto LAB_00116fb0;
          uVar32 = 0;
          goto LAB_00116fb6;
        }
LAB_00117347:
        *plVar19 = (long)uStack_a0 - (long)puVar26;
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x325;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar48 != 0x35c) goto switchD_001152f2_caseD_338;
      goto LAB_0011892f;
    }
    goto LAB_0011874f;
  }
  if (iVar48 < 0x243) {
    if (iVar48 < 0x231) {
      if (iVar48 == 0x22b) {
        puVar26 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar23 = *plVar19;
        *(uint **)((long)p + 0x490) = puVar26;
        *(uint **)((long)p + 0x498) = puVar26;
        *(long *)((long)p + 0x4a8) = lVar23;
        *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        uStack_a0 = puVar26;
        if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          uVar42 = *(uint *)((long)p + 0x4f70);
          uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
          iStack_a8 = *(int *)((long)p + 0x4f30);
          iStack_a4 = *(int *)((long)p + 0x4f34);
          iVar48 = *(int *)((long)p + 0x4f38);
          uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
          uVar45 = (ulong)*(uint *)((long)p + 0x4f44);
          uStack_8c = *(uint *)((long)p + 0x4f48);
          uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar49 = *(uint *)((long)p + 0x510);
          uVar30 = *(uint *)((long)p + 0x514);
          uVar31 = *(ulong *)((long)p + 0x4c8);
          uVar21 = *(uint *)((long)p + 0x4d0);
          if (0 < lVar23) goto LAB_001163cd;
          uVar38 = 0;
          goto LAB_001163d6;
        }
LAB_00117175:
        *plVar19 = (long)uStack_a0 - (long)puVar26;
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x22b;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar48 == 0x22e) {
        puVar26 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar23 = *plVar19;
        *(uint **)((long)p + 0x490) = puVar26;
        *(uint **)((long)p + 0x498) = puVar26;
        *(long *)((long)p + 0x4a8) = lVar23;
        *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        uStack_a0 = puVar26;
        if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          uVar42 = *(uint *)((long)p + 0x4f70);
          uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
          iStack_a8 = *(int *)((long)p + 0x4f30);
          iStack_a4 = *(int *)((long)p + 0x4f34);
          iVar48 = *(int *)((long)p + 0x4f38);
          uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
          uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
          uStack_8c = *(uint *)((long)p + 0x4f48);
          uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar43 = *(uint *)((long)p + 0x510);
          uVar30 = *(uint *)((long)p + 0x514);
          uVar45 = *(ulong *)((long)p + 0x4c8);
          uVar21 = *(uint *)((long)p + 0x4d0);
          if (0 < lVar23) goto LAB_001156d1;
          uVar38 = 0;
          goto LAB_001156da;
        }
LAB_00117068:
        *plVar19 = (long)uStack_a0 - (long)puVar26;
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x22e;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
    else {
      if (iVar48 == 0x231) {
        uStack_a0 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar23 = *plVar19;
        *(uint **)((long)p + 0x490) = uStack_a0;
        *(uint **)((long)p + 0x498) = uStack_a0;
        *(long *)((long)p + 0x4a8) = lVar23;
        *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_a0 + lVar23);
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        puVar26 = uStack_a0;
        if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          uVar42 = *(uint *)((long)p + 0x4f70);
          uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
          iStack_a8 = *(int *)((long)p + 0x4f30);
          iStack_a4 = *(int *)((long)p + 0x4f34);
          iVar48 = *(int *)((long)p + 0x4f38);
          uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
          uVar11 = *(uint *)((long)p + 0x4f44);
          uStack_8c = *(uint *)((long)p + 0x4f48);
          uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar25 = *(uint *)((long)p + 0x510);
          uVar30 = *(uint *)((long)p + 0x514);
          uVar45 = *(ulong *)((long)p + 0x4c8);
          uVar21 = *(uint *)((long)p + 0x4d0);
          if (0 < lVar23) goto LAB_00115e21;
          uStack_68 = (ulong)uVar11;
          uVar38 = 0;
          goto LAB_00115e2e;
        }
LAB_001170d1:
        *plVar19 = (long)uStack_a0 - (long)puVar26;
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x231;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar48 == 0x238) {
        uStack_a0 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar23 = *plVar19;
        *(uint **)((long)p + 0x490) = uStack_a0;
        *(uint **)((long)p + 0x498) = uStack_a0;
        *(long *)((long)p + 0x4a8) = lVar23;
        puVar26 = (uint *)((long)uStack_a0 + lVar23);
        *(uint **)((long)p + 0x4a0) = puVar26;
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        puVar27 = uStack_a0;
        if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          uVar42 = *(uint *)((long)p + 0x4f70);
          uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
          iStack_a8 = *(int *)((long)p + 0x4f30);
          iStack_a4 = *(int *)((long)p + 0x4f34);
          iVar48 = *(int *)((long)p + 0x4f38);
          uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
          uVar43 = *(uint *)((long)p + 0x4f44);
          uStack_8c = *(uint *)((long)p + 0x4f48);
          uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar25 = *(uint *)((long)p + 0x510);
          uVar39 = *(uint *)((long)p + 0x514);
          uVar38 = *(ulong *)((long)p + 0x4c8);
          uVar21 = *(uint *)((long)p + 0x4d0);
          prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
          pdVar28 = prVar35->m_pDecode_tables;
          goto LAB_00119762;
        }
LAB_00119835:
        *plVar19 = (long)uStack_a0 - (long)puVar27;
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x238;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar48 == 0x240) {
        uStack_a0 = *(uint **)((long)p + 0x550);
        plVar19 = *(long **)((long)p + 0x558);
        lVar23 = *plVar19;
        *(uint **)((long)p + 0x490) = uStack_a0;
        *(uint **)((long)p + 0x498) = uStack_a0;
        *(long *)((long)p + 0x4a8) = lVar23;
        puVar26 = (uint *)((long)uStack_a0 + lVar23);
        *(uint **)((long)p + 0x4a0) = puVar26;
        *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
        puVar27 = uStack_a0;
        if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
          uVar42 = *(uint *)((long)p + 0x4f70);
          uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
          iStack_a8 = *(int *)((long)p + 0x4f30);
          iStack_a4 = *(int *)((long)p + 0x4f34);
          iVar48 = *(int *)((long)p + 0x4f38);
          uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
          uVar11 = *(uint *)((long)p + 0x4f44);
          uStack_8c = *(uint *)((long)p + 0x4f48);
          uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar43 = *(uint *)((long)p + 0x510);
          uVar30 = *(uint *)((long)p + 0x514);
          uVar38 = *(ulong *)((long)p + 0x4c8);
          uVar21 = *(uint *)((long)p + 0x4d0);
          prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
          pdVar28 = prVar35->m_pDecode_tables;
          do {
            uVar45 = 0;
            if (uStack_a0 < puVar26) {
              uVar45 = (ulong)(byte)*uStack_a0;
              uStack_a0 = (uint *)((long)uStack_a0 + 1);
            }
            cVar8 = (char)uVar21;
            uVar21 = uVar21 + 8;
            uVar38 = uVar38 | uVar45 << (0x38U - cVar8 & 0x3f);
            uVar31 = (ulong)uVar30;
            while (0x17 < (int)uVar21) {
LAB_001198b3:
              do {
                uVar30 = (uint)(ushort)(uVar38 >> 0x30);
                if (uVar30 < pdVar28->m_table_max_code) {
                  uVar42 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] &
                           0xffff;
                  uVar30 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >>
                           0x10;
                }
                else {
                  iVar46 = pdVar28->m_decode_start_code_size - 0x41;
                  do {
                    iVar12 = iVar46;
                    iVar46 = iVar12 + 1;
                  } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar30);
                  uVar39 = (int)(uVar38 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                           pdVar28->m_val_ptrs[iVar12 + 0x40U];
                  uVar30 = 0;
                  if (uVar39 < prVar35->m_total_syms) {
                    uVar30 = uVar39;
                  }
                  uVar42 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar30];
                  uVar30 = iVar12 + 0x41;
                }
                uVar38 = uVar38 << ((byte)uVar30 & 0x3f);
                puVar2 = (prVar35->m_sym_freq).m_p + uVar42;
                *puVar2 = *puVar2 + 1;
                uVar21 = uVar21 - uVar30;
                puVar1 = &prVar35->m_symbols_until_update;
                *puVar1 = *puVar1 - 1;
                if (*puVar1 == 0) {
                  raw_quasi_adaptive_huffman_data_model::update(prVar35);
                }
                uVar42 = uVar42 + 2;
                puVar17 = (ushort *)((long)p + uVar22 * 2 + 0x4ee8);
                uStack_68 = (ulong)uVar11;
                for (; (uint)uVar31 < 0x1000000; uVar31 = (ulong)(uint)((int)uVar31 << 8)) {
                  *(ushort **)((long)p + 0x528) = puVar17;
                  uVar45 = uVar38;
                  for (; (int)uVar21 < 8; uVar21 = uVar21 + 8) {
                    if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
                      uVar38 = 0;
                      if (*(char *)((long)p + 0x4b0) == '\0') {
                        *(uint *)((long)p + 0x510) = uVar43;
                        *(int *)((long)p + 0x514) = (int)uVar31;
                        *(ulong *)((long)p + 0x4c8) = uVar45;
                        *(uint *)((long)p + 0x4d0) = uVar21;
                        *(uint **)((long)p + 0x498) = uStack_a0;
                        *(uint *)((long)p + 0x4f70) = uVar42;
                        *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                        *(int *)((long)p + 0x4f30) = iStack_a8;
                        *(int *)((long)p + 0x4f34) = iStack_a4;
                        *(int *)((long)p + 0x4f38) = iVar48;
                        *(int *)((long)p + 0x4f3c) = (int)uVar22;
                        *(int *)((long)p + 0x4f44) = (int)uStack_68;
                        *(uint *)((long)p + 0x4f48) = uStack_8c;
                        *(int *)((long)p + 0x4f18) = (int)uStack_70;
                        puVar26 = *(uint **)((long)p + 0x490);
                        plVar19 = *(long **)((long)p + 0x558);
                        goto LAB_00117198;
                      }
                    }
                    else {
LAB_001164ff:
                      uVar38 = (ulong)(byte)*uStack_a0;
                      uStack_a0 = (uint *)((long)uStack_a0 + 1);
                    }
LAB_00116505:
                    uVar45 = uVar45 | uVar38 << (0x38U - (char)uVar21 & 0x3f);
                  }
                  uVar38 = uVar45 << 8;
                  uVar21 = uVar21 - 8;
                  puVar17 = *(ushort **)((long)p + 0x528);
                  uVar43 = uVar43 << 8 | (uint)(byte)(uVar45 >> 0x38);
                }
                uVar3 = *puVar17;
                uVar25 = (int)(uVar31 >> 0xb) * (uint)uVar3;
                uVar11 = uVar43 - uVar25;
                uVar30 = (uint)uVar22;
                if (uVar43 < uVar25) {
                  *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
                  puVar17 = (ushort *)((long)p + uVar22 * 2 + 0x4f00);
                  for (; uVar11 = (uint)uStack_68, uVar25 < 0x1000000; uVar25 = uVar25 << 8) {
                    *(ushort **)((long)p + 0x528) = puVar17;
                    uVar22 = uVar38;
                    for (; (int)uVar21 < 8; uVar21 = uVar21 + 8) {
                      if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
                        uVar38 = 0;
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(uint *)((long)p + 0x510) = uVar43;
                          *(uint *)((long)p + 0x514) = uVar25;
                          *(ulong *)((long)p + 0x4c8) = uVar22;
                          *(uint *)((long)p + 0x4d0) = uVar21;
                          *(uint **)((long)p + 0x498) = uStack_a0;
                          *(uint *)((long)p + 0x4f70) = uVar42;
                          *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                          *(int *)((long)p + 0x4f30) = iStack_a8;
                          *(int *)((long)p + 0x4f34) = iStack_a4;
                          *(int *)((long)p + 0x4f38) = iVar48;
                          *(uint *)((long)p + 0x4f3c) = uVar30;
                          *(uint *)((long)p + 0x4f44) = uVar11;
                          *(uint *)((long)p + 0x4f48) = uStack_8c;
                          *(int *)((long)p + 0x4f18) = (int)uStack_70;
                          plVar19 = *(long **)((long)p + 0x558);
                          puVar26 = *(uint **)((long)p + 0x490);
                          goto LAB_0011708b;
                        }
                      }
                      else {
LAB_001158f9:
                        uVar38 = (ulong)(byte)*uStack_a0;
                        uStack_a0 = (uint *)((long)uStack_a0 + 1);
                      }
LAB_00115905:
                      uVar22 = uVar22 | uVar38 << (0x38U - (char)uVar21 & 0x3f);
                    }
                    uVar38 = uVar22 << 8;
                    uVar21 = uVar21 - 8;
                    puVar17 = *(ushort **)((long)p + 0x528);
                    uVar43 = uVar43 << 8 | (uint)(byte)(uVar22 >> 0x38);
                    uStack_68 = (ulong)uVar11;
                  }
                  uVar3 = *puVar17;
                  uVar39 = (uVar25 >> 0xb) * (uint)uVar3;
                  uVar11 = uVar43 - uVar39;
                  if (uVar43 < uVar39) {
                    *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
                    iVar46 = iVar48;
                    iVar48 = iStack_a4;
                    uVar11 = uVar43;
                  }
                  else {
                    *puVar17 = uVar3 - (uVar3 >> 5);
                    uVar39 = uVar25 - uVar39;
                    iVar46 = iStack_a4;
                  }
                  iStack_a4 = iStack_a8;
                  iStack_a8 = iVar46;
                }
                else {
                  *puVar17 = uVar3 - (uVar3 >> 5);
                  uVar39 = (uint)uVar31 - uVar25;
                }
                uVar22 = (ulong)(6 < uVar30) * 3 + 8;
                iVar12 = uStack_78._4_4_;
                uStack_78._4_4_ = iStack_a8;
LAB_0011a30f:
                while( true ) {
                  iStack_a8 = iVar12;
                  uVar25 = (uint)uStack_70;
                  uVar43 = uVar25 - uStack_78._4_4_ & uVar14;
                  uVar31 = (ulong)uVar43;
                  uVar30 = uVar25;
                  if (uVar25 < uVar43) {
                    uVar30 = uVar43;
                  }
                  pbVar41 = pbVar5 + uVar31;
                  if (uVar14 < uVar30 + uVar42) {
                    uVar7 = (ulong)uStack_8c;
                    uVar45 = uStack_68;
                    for (; uStack_68 = uVar7, uVar42 != 0; uVar42 = uVar42 - 1) {
                      uVar30 = (uint)*pbVar41;
                      pbVar44 = pbVar41 + 1;
                      uVar43 = (int)uStack_70 + 1;
                      uVar24 = (ulong)uVar43;
                      pbVar5[uStack_70] = *pbVar41;
                      pbVar41 = pbVar44;
                      if (pbVar44 == pbVar5 + uVar32) {
                        pbVar41 = pbVar5;
                      }
                      if (uVar14 < uVar43) {
                        *(uint *)((long)p + 0x510) = uVar11;
                        *(uint *)((long)p + 0x514) = uVar39;
                        *(ulong *)((long)p + 0x4c8) = uVar38;
                        *(uint *)((long)p + 0x4d0) = uVar21;
                        *(uint **)((long)p + 0x498) = uStack_a0;
                        *(uint *)((long)p + 0x4f70) = uVar42;
                        *(int *)((long)p + 0x4f80) = (int)uVar31;
                        *(byte **)((long)p + 0x4f88) = pbVar41;
                        *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                        *(int *)((long)p + 0x4f30) = iStack_a8;
                        *(int *)((long)p + 0x4f34) = iStack_a4;
                        *(int *)((long)p + 0x4f38) = iVar48;
                        *(int *)((long)p + 0x4f3c) = (int)uVar22;
                        *(uint *)((long)p + 0x4f44) = uVar30;
                        *(int *)((long)p + 0x4f48) = (int)uVar45;
                        *(uint *)((long)p + 0x4f18) = uVar43;
                        pvVar33 = *(void **)((long)p + 0x540);
                        *(void **)((long)p + 0x4f50) = pvVar33;
                        *(ulong *)((long)p + 0x4f58) = uVar32;
                        uVar22 = uVar32;
                        goto LAB_0011544c;
                      }
LAB_00118cd0:
                      uVar7 = uVar45;
                      uStack_70 = uVar24;
                      uVar45 = (ulong)uVar30;
                    }
                  }
                  else {
                    pbVar44 = pbVar5 + uStack_70;
                    uVar30 = (uint)uStack_68;
                    if (uStack_78._4_4_ == 1) {
                      bVar20 = *pbVar41;
                      uStack_68 = (ulong)bVar20;
                      uVar43 = (uint)bVar20;
                      if (uVar42 < 8) {
                        if (uVar42 != 0) {
                          memset(pbVar44,(uint)bVar20,(ulong)uVar42);
                          if (uVar42 == 1) {
                            uVar43 = uVar30;
                          }
                          uStack_68 = (ulong)uVar43;
                        }
                      }
                      else {
                        memset(pbVar44,(uint)bVar20,(ulong)uVar42);
                      }
                    }
                    else if (uVar42 == 1) {
                      bVar20 = *pbVar41;
                      *pbVar44 = bVar20;
                    }
                    else {
                      uVar30 = uVar42 - 2;
                      if ((uVar30 < 8) || (uStack_78._4_4_ < (int)uVar30)) {
                        if (0 < (int)uVar30) {
                          uVar30 = uVar42 - 1;
                          do {
                            bVar20 = *pbVar41;
                            pbVar41 = pbVar41 + 1;
                            *pbVar44 = bVar20;
                            pbVar44 = pbVar44 + 1;
                            uVar30 = uVar30 - 1;
                          } while (1 < uVar30);
                        }
                      }
                      else {
                        uVar45 = (ulong)uVar30;
                        memcpy(pbVar44,pbVar41,uVar45);
                        pbVar44 = pbVar44 + uVar45;
                        pbVar41 = pbVar41 + uVar45;
                      }
                      uStack_68 = (ulong)*pbVar41;
                      *pbVar44 = *pbVar41;
                      bVar20 = pbVar41[1];
                      pbVar44[1] = bVar20;
                    }
                    uVar45 = (ulong)bVar20;
                    uStack_70 = (ulong)(uVar25 + uVar42);
                  }
LAB_00118dae:
                  while( true ) {
                    while( true ) {
                      puVar17 = (ushort *)
                                ((long)p +
                                (ulong)(uint)((int)uVar22 * 0x40 + (int)(uVar45 >> 2)) * 2 + 0x48a0)
                      ;
                      for (uVar30 = uVar39; uStack_8c = (uint)uStack_68, uVar30 < 0x1000000;
                          uVar30 = uVar30 << 8) {
                        *(ushort **)((long)p + 0x528) = puVar17;
                        uVar31 = uVar38;
                        for (; (int)uVar21 < 8; uVar21 = uVar21 + 8) {
                          if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
                            uVar38 = 0;
                            if (*(char *)((long)p + 0x4b0) == '\0') {
                              *(uint *)((long)p + 0x510) = uVar11;
                              *(uint *)((long)p + 0x514) = uVar30;
                              *(ulong *)((long)p + 0x4c8) = uVar31;
                              *(uint *)((long)p + 0x4d0) = uVar21;
                              *(uint **)((long)p + 0x498) = uStack_a0;
                              *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                              *(int *)((long)p + 0x4f30) = iStack_a8;
                              *(int *)((long)p + 0x4f34) = iStack_a4;
                              *(int *)((long)p + 0x4f38) = iVar48;
                              *(int *)((long)p + 0x4f3c) = (int)uVar22;
                              *(int *)((long)p + 0x4f44) = (int)uVar45;
                              *(uint *)((long)p + 0x4f48) = uStack_8c;
                              *(int *)((long)p + 0x4f18) = (int)uStack_70;
                              puVar26 = *(uint **)((long)p + 0x490);
                              plVar19 = *(long **)((long)p + 0x558);
                              goto LAB_001171bb;
                            }
                          }
                          else {
LAB_0011660d:
                            uVar38 = (ulong)(byte)*uStack_a0;
                            uStack_a0 = (uint *)((long)uStack_a0 + 1);
                          }
LAB_00116619:
                          uVar31 = uVar31 | uVar38 << (0x38U - (char)uVar21 & 0x3f);
                        }
                        uVar38 = uVar31 << 8;
                        uVar21 = uVar21 - 8;
                        puVar17 = *(ushort **)((long)p + 0x528);
                        uVar11 = uVar11 << 8 | (uint)(byte)(uVar31 >> 0x38);
                        uStack_68 = (ulong)uStack_8c;
                      }
                      uVar3 = *puVar17;
                      uVar39 = (uVar30 >> 0xb) * (uint)uVar3;
                      uVar49 = uVar11 - uVar39;
                      if (uVar39 <= uVar11) break;
                      *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
                      uStack_68 = uVar45;
                      if ((uint)uVar22 < 7) {
                        uVar30 = uStack_8c >> 2 & 0xfffffff8 | (uint)(uVar45 >> 5);
                        prVar35 = (raw_quasi_adaptive_huffman_data_model *)
                                  ((long)p + (ulong)uVar30 * 0x80 + 0x5a0);
                        pdVar28 = *(decoder_tables **)((long)p + (ulong)uVar30 * 0x80 + 0x5d0);
                        if ((int)uVar21 < 0x18) {
                          puVar26 = *(uint **)((long)p + 0x4a0);
                          if (uStack_a0 + 1 < puVar26) {
                            uVar30 = *uStack_a0;
                            uVar21 = uVar21 + 0x20;
                            uVar38 = uVar38 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                                      (uVar30 & 0xff00) << 8 | uVar30 << 0x18) <<
                                              (-(char)uVar21 & 0x3fU);
                            uStack_a0 = uStack_a0 + 1;
                          }
                          else {
                            for (; (int)uVar21 < 0x18; uVar21 = uVar21 + 8) {
                              if (*(char *)((long)p + 0x4b0) == '\0') {
                                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) =
                                     prVar35;
                                *(uint *)((long)p + 0x510) = uVar11;
                                *(uint *)((long)p + 0x514) = uVar39;
                                *(ulong *)((long)p + 0x4c8) = uVar38;
                                *(uint *)((long)p + 0x4d0) = uVar21;
                                *(uint **)((long)p + 0x498) = uStack_a0;
                                *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                                *(int *)((long)p + 0x4f30) = iStack_a8;
                                *(int *)((long)p + 0x4f34) = iStack_a4;
                                *(int *)((long)p + 0x4f38) = iVar48;
                                *(int *)((long)p + 0x4f3c) = (int)uVar22;
                                *(uint *)((long)p + 0x4f44) = (uint)uStack_68;
                                *(uint *)((long)p + 0x4f48) = uStack_8c;
                                *(int *)((long)p + 0x4f18) = (int)uStack_70;
                                plVar19 = *(long **)((long)p + 0x558);
                                puVar27 = *(uint **)((long)p + 0x490);
                                goto LAB_001193af;
                              }
LAB_001192f0:
                              uVar45 = 0;
                              if (uStack_a0 < puVar26) {
                                uVar45 = (ulong)(byte)*uStack_a0;
                                uStack_a0 = (uint *)((long)uStack_a0 + 1);
                              }
                              uVar38 = uVar38 | uVar45 << (0x38U - (char)uVar21 & 0x3f);
                            }
                          }
                        }
                        uVar30 = (uint)(ushort)(uVar38 >> 0x30);
                        if (uVar30 < pdVar28->m_table_max_code) {
                          uVar43 = pdVar28->m_lookup
                                   [uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] & 0xffff;
                          uVar30 = pdVar28->m_lookup
                                   [uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10;
                        }
                        else {
                          iVar46 = pdVar28->m_decode_start_code_size - 0x41;
                          do {
                            iVar12 = iVar46;
                            iVar46 = iVar12 + 1;
                          } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar30);
                          uVar42 = (int)(uVar38 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                                   pdVar28->m_val_ptrs[iVar12 + 0x40U];
                          uVar30 = 0;
                          if (uVar42 < prVar35->m_total_syms) {
                            uVar30 = uVar42;
                          }
                          uVar43 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar30];
                          uVar30 = iVar12 + 0x41;
                        }
                        uVar38 = uVar38 << ((byte)uVar30 & 0x3f);
                        puVar2 = (prVar35->m_sym_freq).m_p + uVar43;
                        *puVar2 = *puVar2 + 1;
                        uVar21 = uVar21 - uVar30;
                        puVar1 = &prVar35->m_symbols_until_update;
                        *puVar1 = *puVar1 - 1;
                        if (*puVar1 == 0) {
                          raw_quasi_adaptive_huffman_data_model::update(prVar35);
                        }
                      }
                      else {
                        uStack_88 = uVar22 << 0x20;
                        uVar42 = (int)uStack_70 - uStack_78._4_4_;
                        uVar30 = (uint)pbVar5[uVar42 & uVar14];
                        uVar42 = (pbVar5[uVar42 - 1 & uVar14] >> 2 & 0x38 |
                                 (uint)(pbVar5[uVar42 & uVar14] >> 5)) << 7;
                        prVar35 = (raw_quasi_adaptive_huffman_data_model *)
                                  ((long)p + (ulong)uVar42 + 0x25a0);
                        pdVar28 = *(decoder_tables **)((long)p + (ulong)uVar42 + 0x25d0);
                        if ((int)uVar21 < 0x18) {
                          puVar26 = *(uint **)((long)p + 0x4a0);
                          if (uStack_a0 + 1 < puVar26) {
                            uVar42 = *uStack_a0;
                            uVar21 = uVar21 + 0x20;
                            uVar38 = uVar38 | (ulong)(uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 |
                                                      (uVar42 & 0xff00) << 8 | uVar42 << 0x18) <<
                                              (-(char)uVar21 & 0x3fU);
                            uStack_a0 = uStack_a0 + 1;
                          }
                          else {
                            for (; (int)uVar21 < 0x18; uVar21 = uVar21 + 8) {
                              if (*(char *)((long)p + 0x4b0) == '\0') {
                                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) =
                                     prVar35;
                                *(uint *)((long)p + 0x510) = uVar11;
                                *(uint *)((long)p + 0x514) = uVar39;
                                *(ulong *)((long)p + 0x4c8) = uVar38;
                                *(uint *)((long)p + 0x4d0) = uVar21;
                                *(uint **)((long)p + 0x498) = uStack_a0;
                                *(uint *)((long)p + 0x4f6c) = uVar30;
                                *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                                *(int *)((long)p + 0x4f30) = iStack_a8;
                                *(int *)((long)p + 0x4f34) = iStack_a4;
                                *(int *)((long)p + 0x4f38) = iVar48;
                                *(uint *)((long)p + 0x4f3c) = uStack_88._4_4_;
                                *(uint *)((long)p + 0x4f44) = (uint)uStack_68;
                                *(uint *)((long)p + 0x4f48) = uStack_8c;
                                *(int *)((long)p + 0x4f18) = (int)uStack_70;
                                plVar19 = *(long **)((long)p + 0x558);
                                puVar27 = *(uint **)((long)p + 0x490);
                                goto LAB_00119658;
                              }
LAB_0011958e:
                              uVar22 = 0;
                              if (uStack_a0 < puVar26) {
                                uVar22 = (ulong)(byte)*uStack_a0;
                                uStack_a0 = (uint *)((long)uStack_a0 + 1);
                              }
                              uVar38 = uVar38 | uVar22 << (0x38U - (char)uVar21 & 0x3f);
                            }
                          }
                        }
                        uVar42 = (uint)(ushort)(uVar38 >> 0x30);
                        if (uVar42 < pdVar28->m_table_max_code) {
                          uVar43 = pdVar28->m_lookup
                                   [uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] & 0xffff;
                          uVar42 = pdVar28->m_lookup
                                   [uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10;
                        }
                        else {
                          uStack_88 = CONCAT44(uStack_88._4_4_,uVar39);
                          iVar46 = pdVar28->m_decode_start_code_size - 0x41;
                          do {
                            iVar12 = iVar46;
                            iVar46 = iVar12 + 1;
                          } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar42);
                          uVar43 = (int)(uVar38 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                                   pdVar28->m_val_ptrs[iVar12 + 0x40U];
                          uVar42 = 0;
                          if (uVar43 < prVar35->m_total_syms) {
                            uVar42 = uVar43;
                          }
                          uVar43 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar42];
                          uVar42 = iVar12 + 0x41;
                        }
                        uVar38 = uVar38 << ((byte)uVar42 & 0x3f);
                        puVar2 = (prVar35->m_sym_freq).m_p + uVar43;
                        *puVar2 = *puVar2 + 1;
                        uVar21 = uVar21 - uVar42;
                        puVar1 = &prVar35->m_symbols_until_update;
                        *puVar1 = *puVar1 - 1;
                        if (*puVar1 == 0) {
                          uStack_88 = CONCAT44(uStack_88._4_4_,uVar39);
                          raw_quasi_adaptive_huffman_data_model::update(prVar35);
                        }
                        uVar43 = uVar43 ^ uVar30;
                        uVar22 = uStack_88 >> 0x20;
                      }
                      pbVar5[uStack_70] = (byte)uVar43;
                      bVar20 = (&s_literal_next_state)[uVar22];
                      uVar22 = (ulong)bVar20;
                      uVar30 = (int)uStack_70 + 1;
                      uStack_70 = (ulong)uVar30;
                      if (uVar14 < uVar30) {
                        *(uint *)((long)p + 0x510) = uVar11;
                        *(uint *)((long)p + 0x514) = uVar39;
                        *(ulong *)((long)p + 0x4c8) = uVar38;
                        *(uint *)((long)p + 0x4d0) = uVar21;
                        *(uint **)((long)p + 0x498) = uStack_a0;
                        *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                        *(int *)((long)p + 0x4f30) = iStack_a8;
                        *(int *)((long)p + 0x4f34) = iStack_a4;
                        *(int *)((long)p + 0x4f38) = iVar48;
                        *(uint *)((long)p + 0x4f3c) = (uint)bVar20;
                        *(uint *)((long)p + 0x4f44) = uVar43;
                        *(uint *)((long)p + 0x4f48) = (uint)uStack_68;
                        *(uint *)((long)p + 0x4f18) = uVar30;
                        pvVar33 = *(void **)((long)p + 0x540);
                        *(void **)((long)p + 0x4f50) = pvVar33;
                        *(ulong *)((long)p + 0x4f58) = uVar32;
                        uVar22 = uVar32;
                        goto LAB_00115236;
                      }
                      uVar45 = (ulong)uVar43;
                    }
                    *puVar17 = uVar3 - (uVar3 >> 5);
                    puVar17 = (ushort *)((long)p + uVar22 * 2 + 0x4ea0);
                    uVar42 = 1;
                    for (uVar30 = uVar30 - uVar39; uVar30 < 0x1000000; uVar30 = uVar30 << 8) {
                      *(ushort **)((long)p + 0x528) = puVar17;
                      uVar31 = uVar38;
                      for (; (int)uVar21 < 8; uVar21 = uVar21 + 8) {
                        if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
                          uVar38 = 0;
                          if (*(char *)((long)p + 0x4b0) == '\0') {
                            *(uint *)((long)p + 0x510) = uVar49;
                            *(uint *)((long)p + 0x514) = uVar30;
                            *(ulong *)((long)p + 0x4c8) = uVar31;
                            *(uint *)((long)p + 0x4d0) = uVar21;
                            *(uint **)((long)p + 0x498) = uStack_a0;
                            *(uint *)((long)p + 0x4f70) = uVar42;
                            *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                            *(int *)((long)p + 0x4f30) = iStack_a8;
                            *(int *)((long)p + 0x4f34) = iStack_a4;
                            *(int *)((long)p + 0x4f38) = iVar48;
                            *(int *)((long)p + 0x4f3c) = (int)uVar22;
                            *(int *)((long)p + 0x4f44) = (int)uVar45;
                            *(uint *)((long)p + 0x4f48) = uStack_8c;
                            *(int *)((long)p + 0x4f18) = (int)uStack_70;
                            puVar26 = *(uint **)((long)p + 0x490);
                            plVar19 = *(long **)((long)p + 0x558);
                            goto LAB_00117175;
                          }
                        }
                        else {
LAB_001163cd:
                          uVar38 = (ulong)(byte)*uStack_a0;
                          uStack_a0 = (uint *)((long)uStack_a0 + 1);
                        }
LAB_001163d6:
                        uVar31 = uVar31 | uVar38 << (0x38U - (char)uVar21 & 0x3f);
                      }
                      uVar38 = uVar31 << 8;
                      uVar21 = uVar21 - 8;
                      puVar17 = *(ushort **)((long)p + 0x528);
                      uVar49 = uVar49 << 8 | (uint)(byte)(uVar31 >> 0x38);
                    }
                    uVar3 = *puVar17;
                    uVar39 = (uVar30 >> 0xb) * (uint)uVar3;
                    uVar43 = uVar49 - uVar39;
                    if (uVar39 <= uVar49) break;
                    uVar25 = (uint)uVar45;
                    *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
                    prVar35 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0);
                    pdVar28 = *(decoder_tables **)((long)p + 0x45d0);
                    uVar11 = uVar49;
                    if ((int)uVar21 < 0x18) {
                      puVar26 = *(uint **)((long)p + 0x4a0);
                      if (uStack_a0 + 1 < puVar26) {
                        uVar30 = *uStack_a0;
                        uVar21 = uVar21 + 0x20;
                        uVar38 = uVar38 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                                  (uVar30 & 0xff00) << 8 | uVar30 << 0x18) <<
                                          (-(char)uVar21 & 0x3fU);
                        uStack_a0 = uStack_a0 + 1;
                      }
                      else {
                        for (; uVar11 = uVar49, (int)uVar21 < 0x18; uVar21 = uVar21 + 8) {
                          if (*(char *)((long)p + 0x4b0) == '\0') {
                            *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
                            *(uint *)((long)p + 0x510) = uVar49;
                            *(uint *)((long)p + 0x514) = uVar39;
                            *(ulong *)((long)p + 0x4c8) = uVar38;
                            *(uint *)((long)p + 0x4d0) = uVar21;
                            *(uint **)((long)p + 0x498) = uStack_a0;
                            *(uint *)((long)p + 0x4f70) = uVar42;
                            *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                            *(int *)((long)p + 0x4f30) = iStack_a8;
                            *(int *)((long)p + 0x4f34) = iStack_a4;
                            *(int *)((long)p + 0x4f38) = iVar48;
                            *(int *)((long)p + 0x4f3c) = (int)uVar22;
                            *(uint *)((long)p + 0x4f44) = uVar25;
                            *(uint *)((long)p + 0x4f48) = uStack_8c;
                            *(int *)((long)p + 0x4f18) = (int)uStack_70;
                            plVar19 = *(long **)((long)p + 0x558);
                            puVar27 = *(uint **)((long)p + 0x490);
                            goto LAB_00119d11;
                          }
LAB_00119bc0:
                          uVar45 = 0;
                          if (uStack_a0 < puVar26) {
                            uVar45 = (ulong)(byte)*uStack_a0;
                            uStack_a0 = (uint *)((long)uStack_a0 + 1);
                          }
                          uVar38 = uVar38 | uVar45 << (0x38U - (char)uVar21 & 0x3f);
                        }
                      }
                    }
                    uVar30 = (uint)(ushort)(uVar38 >> 0x30);
                    if (uVar30 < pdVar28->m_table_max_code) {
                      uVar43 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar30 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar46 = pdVar28->m_decode_start_code_size - 0x41;
                      do {
                        iVar12 = iVar46;
                        iVar46 = iVar12 + 1;
                      } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar30);
                      uVar42 = (int)(uVar38 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                               pdVar28->m_val_ptrs[iVar12 + 0x40U];
                      uVar30 = 0;
                      if (uVar42 < prVar35->m_total_syms) {
                        uVar30 = uVar42;
                      }
                      uVar43 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar30];
                      uVar30 = iVar12 + 0x41;
                    }
                    uVar38 = uVar38 << ((byte)uVar30 & 0x3f);
                    puVar2 = (prVar35->m_sym_freq).m_p + uVar43;
                    *puVar2 = *puVar2 + 1;
                    uVar21 = uVar21 - uVar30;
                    puVar1 = &prVar35->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    uStack_88._4_4_ = (uint)uVar22;
                    uVar30 = uStack_88._4_4_;
                    if (*puVar1 == 0) {
                      raw_quasi_adaptive_huffman_data_model::update(prVar35);
                    }
                    if (1 < uVar43) goto code_r0x00119c50;
                    uVar45 = (ulong)uVar25;
                    uStack_68 = (ulong)uStack_8c;
                    if (uVar43 == 0) {
                      uVar31 = uStack_68;
                      if ((uVar21 & 7) != 0) goto LAB_00116fd6;
                      goto LAB_001186a3;
                    }
LAB_00116c36:
                    iVar48 = 1;
                    uVar22 = 0;
                    iStack_a4 = 1;
                    iStack_a8 = 1;
                    uStack_78._4_4_ = 1;
                  }
                  *puVar17 = uVar3 - (uVar3 >> 5);
                  puVar17 = (ushort *)((long)p + uVar22 * 2 + 0x4eb8);
                  uStack_68 = uVar45;
                  for (uVar30 = uVar30 - uVar39; uVar30 < 0x1000000; uVar30 = uVar30 << 8) {
                    *(ushort **)((long)p + 0x528) = puVar17;
                    uVar45 = uVar38;
                    for (; (int)uVar21 < 8; uVar21 = uVar21 + 8) {
                      if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
                        uVar38 = 0;
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(uint *)((long)p + 0x510) = uVar43;
                          *(uint *)((long)p + 0x514) = uVar30;
                          *(ulong *)((long)p + 0x4c8) = uVar45;
                          *(uint *)((long)p + 0x4d0) = uVar21;
                          *(uint **)((long)p + 0x498) = uStack_a0;
                          *(uint *)((long)p + 0x4f70) = uVar42;
                          *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                          *(int *)((long)p + 0x4f30) = iStack_a8;
                          *(int *)((long)p + 0x4f34) = iStack_a4;
                          *(int *)((long)p + 0x4f38) = iVar48;
                          *(int *)((long)p + 0x4f3c) = (int)uVar22;
                          *(int *)((long)p + 0x4f44) = (int)uStack_68;
                          *(uint *)((long)p + 0x4f48) = uStack_8c;
                          *(int *)((long)p + 0x4f18) = (int)uStack_70;
                          puVar26 = *(uint **)((long)p + 0x490);
                          plVar19 = *(long **)((long)p + 0x558);
                          goto LAB_00117068;
                        }
                      }
                      else {
LAB_001156d1:
                        uVar38 = (ulong)(byte)*uStack_a0;
                        uStack_a0 = (uint *)((long)uStack_a0 + 1);
                      }
LAB_001156da:
                      uVar45 = uVar45 | uVar38 << (0x38U - (char)uVar21 & 0x3f);
                    }
                    uVar38 = uVar45 << 8;
                    uVar21 = uVar21 - 8;
                    puVar17 = *(ushort **)((long)p + 0x528);
                    uVar43 = uVar43 << 8 | (uint)(byte)(uVar45 >> 0x38);
                  }
                  uVar11 = (uint)uStack_68;
                  uVar3 = *puVar17;
                  uVar39 = (uVar30 >> 0xb) * (uint)uVar3;
                  uVar31 = (ulong)uVar39;
                  uVar25 = uVar43 - uVar39;
                  if (uVar43 < uVar39) break;
                  *puVar17 = uVar3 - (uVar3 >> 5);
                  uVar30 = uVar30 - uVar39;
                  puVar17 = (ushort *)((long)p + uVar22 * 2 + 0x4ed0);
                  while( true ) {
                    uVar49 = (uint)uVar22;
                    uVar43 = (uint)uStack_68;
                    if (0xffffff < uVar30) break;
                    *(ushort **)((long)p + 0x528) = puVar17;
                    uVar45 = uVar38;
                    for (; uVar11 = (uint)uStack_68, (int)uVar21 < 8; uVar21 = uVar21 + 8) {
                      if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
                        uVar38 = 0;
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(uint *)((long)p + 0x510) = uVar25;
                          *(uint *)((long)p + 0x514) = uVar30;
                          *(ulong *)((long)p + 0x4c8) = uVar45;
                          *(uint *)((long)p + 0x4d0) = uVar21;
                          *(uint **)((long)p + 0x498) = uStack_a0;
                          *(uint *)((long)p + 0x4f70) = uVar42;
                          *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                          *(int *)((long)p + 0x4f30) = iStack_a8;
                          *(int *)((long)p + 0x4f34) = iStack_a4;
                          *(int *)((long)p + 0x4f38) = iVar48;
                          *(int *)((long)p + 0x4f3c) = (int)uVar22;
                          *(uint *)((long)p + 0x4f44) = uVar11;
                          *(uint *)((long)p + 0x4f48) = uStack_8c;
                          *(int *)((long)p + 0x4f18) = (int)uStack_70;
                          plVar19 = *(long **)((long)p + 0x558);
                          puVar26 = *(uint **)((long)p + 0x490);
                          goto LAB_001170d1;
                        }
                      }
                      else {
LAB_00115e21:
                        uStack_68 = (ulong)uVar11;
                        uVar38 = (ulong)(byte)*uStack_a0;
                        uStack_a0 = (uint *)((long)uStack_a0 + 1);
                      }
LAB_00115e2e:
                      uVar45 = uVar45 | uVar38 << (0x38U - (char)uVar21 & 0x3f);
                    }
                    uVar38 = uVar45 << 8;
                    uVar21 = uVar21 - 8;
                    puVar17 = *(ushort **)((long)p + 0x528);
                    uVar25 = uVar25 << 8 | (uint)(byte)(uVar45 >> 0x38);
                    uVar30 = uVar30 << 8;
                  }
                  uVar3 = *puVar17;
                  uVar39 = (uVar30 >> 0xb) * (uint)uVar3;
                  uVar11 = uVar25 - uVar39;
                  if (uVar25 < uVar39) {
                    *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
                    prVar35 = (raw_quasi_adaptive_huffman_data_model *)
                              ((long)p + (ulong)(6 < uVar49) * 0x80 + 0x4620);
                    pdVar28 = *(decoder_tables **)((long)p + (ulong)(6 < uVar49) * 0x80 + 18000);
                    if ((int)uVar21 < 0x18) {
                      puVar26 = *(uint **)((long)p + 0x4a0);
                      if (uStack_a0 + 1 < puVar26) {
                        uVar11 = *uStack_a0;
                        uVar21 = uVar21 + 0x20;
                        uVar38 = uVar38 | (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 |
                                                  (uVar11 & 0xff00) << 8 | uVar11 << 0x18) <<
                                          (-(char)uVar21 & 0x3fU);
                        uStack_a0 = uStack_a0 + 1;
                      }
                      else {
                        for (; uVar49 = (uint)uVar22, (int)uVar21 < 0x18; uVar21 = uVar21 + 8) {
                          if (*(char *)((long)p + 0x4b0) == '\0') {
                            *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
                            *(uint *)((long)p + 0x510) = uVar25;
                            *(uint *)((long)p + 0x514) = uVar39;
                            *(ulong *)((long)p + 0x4c8) = uVar38;
                            *(uint *)((long)p + 0x4d0) = uVar21;
                            *(uint **)((long)p + 0x498) = uStack_a0;
                            *(uint *)((long)p + 0x4f70) = uVar42;
                            *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
                            *(int *)((long)p + 0x4f30) = iStack_a8;
                            *(int *)((long)p + 0x4f34) = iStack_a4;
                            *(int *)((long)p + 0x4f38) = iVar48;
                            *(uint *)((long)p + 0x4f3c) = uVar49;
                            *(uint *)((long)p + 0x4f44) = uVar43;
                            *(uint *)((long)p + 0x4f48) = uStack_8c;
                            *(int *)((long)p + 0x4f18) = (int)uStack_70;
                            plVar19 = *(long **)((long)p + 0x558);
                            puVar27 = *(uint **)((long)p + 0x490);
                            goto LAB_00119835;
                          }
LAB_00119762:
                          uVar45 = 0;
                          if (uStack_a0 < puVar26) {
                            uVar45 = (ulong)(byte)*uStack_a0;
                            uStack_a0 = (uint *)((long)uStack_a0 + 1);
                          }
                          uVar38 = uVar38 | uVar45 << (0x38U - (char)uVar21 & 0x3f);
                        }
                      }
                    }
                    uVar11 = (uint)(ushort)(uVar38 >> 0x30);
                    if (uVar11 < pdVar28->m_table_max_code) {
                      uVar42 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] &
                               0xffff;
                      uVar11 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)]
                               >> 0x10;
                    }
                    else {
                      iVar46 = pdVar28->m_decode_start_code_size - 0x41;
                      do {
                        iVar12 = iVar46;
                        iVar46 = iVar12 + 1;
                      } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar11);
                      uVar30 = (int)(uVar38 >> (-(char)(iVar12 + 1) & 0x3fU)) +
                               pdVar28->m_val_ptrs[iVar12 + 0x40U];
                      uVar11 = 0;
                      if (uVar30 < prVar35->m_total_syms) {
                        uVar11 = uVar30;
                      }
                      uVar42 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar11];
                      uVar11 = iVar12 + 0x41;
                    }
                    uVar38 = uVar38 << ((byte)uVar11 & 0x3f);
                    puVar2 = (prVar35->m_sym_freq).m_p + uVar42;
                    *puVar2 = *puVar2 + 1;
                    uVar21 = uVar21 - uVar11;
                    puVar1 = &prVar35->m_symbols_until_update;
                    *puVar1 = *puVar1 - 1;
                    if (*puVar1 == 0) {
                      raw_quasi_adaptive_huffman_data_model::update(prVar35);
                    }
                    uVar42 = uVar42 + 2;
                    uVar22 = (ulong)((uint)(6 < uVar49) * 3 + 8);
                    uStack_68 = (ulong)uVar43;
                    iVar12 = iStack_a8;
                    uVar11 = uVar25;
                  }
                  else {
                    *puVar17 = uVar3 - (uVar3 >> 5);
                    uVar39 = uVar30 - uVar39;
                    uVar22 = (ulong)((6 < uVar49) + 9 + (uint)(6 < uVar49));
                    iVar12 = iStack_a8;
                  }
                }
                *puVar17 = (short)(0x800 - uVar3 >> 5) + uVar3;
                bVar9 = 6 < (uint)uVar22;
                prVar35 = (raw_quasi_adaptive_huffman_data_model *)
                          ((long)p + (ulong)bVar9 * 0x80 + 0x4620);
                pdVar28 = *(decoder_tables **)((long)p + (ulong)bVar9 * 0x80 + 18000);
              } while (0x17 < (int)uVar21);
              puVar26 = *(uint **)((long)p + 0x4a0);
              if (uStack_a0 + 1 < puVar26) {
                uVar30 = *uStack_a0;
                uVar21 = uVar21 + 0x20;
                uVar38 = uVar38 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                          (uVar30 & 0xff00) << 8 | uVar30 << 0x18) <<
                                  (-(char)uVar21 & 0x3fU);
                uStack_a0 = uStack_a0 + 1;
                goto LAB_001198b3;
              }
            }
            uVar30 = (uint)uVar31;
          } while (*(char *)((long)p + 0x4b0) != '\0');
          *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
          *(uint *)((long)p + 0x510) = uVar43;
          *(uint *)((long)p + 0x514) = uVar30;
          *(ulong *)((long)p + 0x4c8) = uVar38;
          *(uint *)((long)p + 0x4d0) = uVar21;
          *(uint **)((long)p + 0x498) = uStack_a0;
          *(uint *)((long)p + 0x4f70) = uVar42;
          *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
          *(int *)((long)p + 0x4f30) = iStack_a8;
          *(int *)((long)p + 0x4f34) = iStack_a4;
          *(int *)((long)p + 0x4f38) = iVar48;
          *(int *)((long)p + 0x4f3c) = (int)uVar22;
          *(uint *)((long)p + 0x4f44) = uVar11;
          *(uint *)((long)p + 0x4f48) = uStack_8c;
          *(int *)((long)p + 0x4f18) = (int)uStack_70;
          plVar19 = *(long **)((long)p + 0x558);
          puVar27 = *(uint **)((long)p + 0x490);
        }
        *plVar19 = (long)uStack_a0 - (long)puVar27;
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x240;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
  }
  else if (iVar48 < 0x266) {
    if (iVar48 == 0x243) {
      puVar26 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar26;
      *(uint **)((long)p + 0x498) = puVar26;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      uStack_a0 = puVar26;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar42 = *(uint *)((long)p + 0x4f70);
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
        uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
        uStack_8c = *(uint *)((long)p + 0x4f48);
        uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar43 = *(uint *)((long)p + 0x510);
        uVar31 = (ulong)*(uint *)((long)p + 0x514);
        uVar45 = *(ulong *)((long)p + 0x4c8);
        uVar21 = *(uint *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_001164ff;
        uVar38 = 0;
        goto LAB_00116505;
      }
LAB_00117198:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x243;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    }
    if (iVar48 == 0x24c) {
      uStack_a0 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = uStack_a0;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)uStack_a0 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar26 = uStack_a0;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar42 = *(uint *)((long)p + 0x4f70);
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uVar30 = *(uint *)((long)p + 0x4f3c);
        uVar11 = *(uint *)((long)p + 0x4f44);
        uStack_8c = *(uint *)((long)p + 0x4f48);
        uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar43 = *(uint *)((long)p + 0x510);
        uVar25 = *(uint *)((long)p + 0x514);
        uVar22 = *(ulong *)((long)p + 0x4c8);
        uVar21 = *(uint *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_001158f9;
        uVar38 = 0;
        goto LAB_00115905;
      }
LAB_0011708b:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x24c;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    }
  }
  else {
    if (iVar48 == 0x266) {
      uStack_a0 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = uStack_a0;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(long *)((long)p + 0x4a8) = lVar23;
      puVar26 = (uint *)((long)uStack_a0 + lVar23);
      *(uint **)((long)p + 0x4a0) = puVar26;
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      puVar27 = uStack_a0;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar42 = *(uint *)((long)p + 0x4f70);
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
        uVar25 = *(uint *)((long)p + 0x4f44);
        uStack_8c = *(uint *)((long)p + 0x4f48);
        uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar49 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar38 = *(ulong *)((long)p + 0x4c8);
        uVar21 = *(uint *)((long)p + 0x4d0);
        prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
        pdVar28 = prVar35->m_pDecode_tables;
        goto LAB_00119bc0;
      }
LAB_00119d11:
      *plVar19 = (long)uStack_a0 - (long)puVar27;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x266;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    }
    if (iVar48 == 0x285) {
      puVar27 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar27;
      *(uint **)((long)p + 0x498) = puVar27;
      *(long *)((long)p + 0x4a8) = lVar23;
      puVar26 = (uint *)((long)puVar27 + lVar23);
      *(uint **)((long)p + 0x4a0) = puVar26;
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      uStack_a0 = puVar27;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        iVar46 = *(int *)((long)p + 0x4f70);
        uStack_50 = *(uint *)((long)p + 0x4f74);
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uStack_88 = (ulong)*(uint *)((long)p + 0x4f3c) << 0x20;
        uVar25 = *(uint *)((long)p + 0x4f44);
        uStack_8c = *(uint *)((long)p + 0x4f48);
        uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar38 = *(ulong *)((long)p + 0x4c8);
        uVar21 = *(uint *)((long)p + 0x4d0);
        prVar35 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
        pdVar28 = prVar35->m_pDecode_tables;
        goto LAB_00119e7e;
      }
LAB_0011a03b:
      *plVar19 = (long)uStack_a0 - (long)puVar27;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x285;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    }
    if (iVar48 == 0x295) {
      puVar26 = *(uint **)((long)p + 0x550);
      plVar19 = *(long **)((long)p + 0x558);
      lVar23 = *plVar19;
      *(uint **)((long)p + 0x490) = puVar26;
      *(uint **)((long)p + 0x498) = puVar26;
      *(long *)((long)p + 0x4a8) = lVar23;
      *(byte **)((long)p + 0x4a0) = (byte *)((long)puVar26 + lVar23);
      *(byte *)((long)p + 0x4b0) = *(byte *)((long)p + 0x570);
      uStack_a0 = puVar26;
      if ((lVar23 != 0 | *(byte *)((long)p + 0x570)) == 1) {
        uVar42 = *(uint *)((long)p + 0x4f70);
        uStack_50 = *(uint *)((long)p + 0x4f74);
        uVar30 = *(uint *)((long)p + 0x4f7c);
        uStack_78._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_a8 = *(int *)((long)p + 0x4f30);
        iStack_a4 = *(int *)((long)p + 0x4f34);
        iVar48 = *(int *)((long)p + 0x4f38);
        uVar22 = (ulong)*(uint *)((long)p + 0x4f3c);
        uStack_68 = (ulong)*(uint *)((long)p + 0x4f44);
        uStack_8c = *(uint *)((long)p + 0x4f48);
        uStack_70 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar11 = *(uint *)((long)p + 0x510);
        uVar39 = *(uint *)((long)p + 0x514);
        uVar38 = *(ulong *)((long)p + 0x4c8);
        uVar21 = *(uint *)((long)p + 0x4d0);
        if (0 < lVar23) goto LAB_0011513f;
        uVar45 = 0;
        goto LAB_00115150;
      }
LAB_0011712f:
      *plVar19 = (long)uStack_a0 - (long)puVar26;
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x295;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    }
  }
  goto switchD_001152f2_caseD_338;
LAB_0011262e:
  uVar32 = 0;
  if (*(char *)((long)p + 0x4b0) == '\0') {
    *(uint *)((long)p + 0x510) = uVar14;
    *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
    *(ulong *)((long)p + 0x4c8) = uVar22;
    *(int *)((long)p + 0x4d0) = iVar48;
    *(uint **)((long)p + 0x498) = uStack_78;
    *(int *)((long)p + 0x4f2c) = iVar46;
    *(int *)((long)p + 0x4f30) = iStack_a4;
    *(int *)((long)p + 0x4f34) = (int)uStack_a0;
    *(int *)((long)p + 0x4f38) = iStack_a8;
    *(uint *)((long)p + 0x4f3c) = uStack_8c;
    *(uint *)((long)p + 0x4f44) = uVar11;
    *(uint *)((long)p + 0x4f48) = uStack_58._4_4_;
    *(int *)((long)p + 0x4f18) = (int)uStack_68;
    plVar19 = *(long **)((long)p + 0x558);
    puVar16 = *(ulong **)((long)p + 0x568);
    puVar26 = *(uint **)((long)p + 0x490);
    goto LAB_00111641;
  }
  goto LAB_0010fb07;
LAB_00111133:
  if (7 < iVar48) goto code_r0x0011113d;
  if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
    if (*(char *)((long)p + 0x4b0) == '\0') {
      *(uint *)((long)p + 0x510) = uVar14;
      *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
      *(ulong *)((long)p + 0x4c8) = uVar38;
      *(int *)((long)p + 0x4d0) = iVar48;
      *(uint **)((long)p + 0x498) = uStack_78;
      *(undefined4 *)((long)p + 0x4f2c) = uVar40;
      *(int *)((long)p + 0x4f30) = iStack_a4;
      *(int *)((long)p + 0x4f34) = (int)uStack_a0;
      *(int *)((long)p + 0x4f38) = iStack_a8;
      *(undefined4 *)((long)p + 0x4f3c) = uVar29;
      *(undefined4 *)((long)p + 0x4f44) = uVar34;
      *(undefined4 *)((long)p + 0x4f48) = uVar37;
      *(int *)((long)p + 0x4f18) = (int)uStack_68;
      puVar26 = *(uint **)((long)p + 0x490);
      plVar19 = *(long **)((long)p + 0x558);
      puVar16 = *(ulong **)((long)p + 0x568);
      goto LAB_001119b1;
    }
LAB_001126e2:
    uVar22 = 0;
  }
  else {
LAB_00111110:
    uVar22 = (ulong)(byte)*uStack_78;
    uStack_78 = (uint *)((long)uStack_78 + 1);
  }
  cVar8 = (char)iVar48;
  iVar48 = iVar48 + 8;
  uVar38 = uVar38 | uVar22 << (0x38U - cVar8 & 0x3f);
  goto LAB_00111133;
code_r0x0011113d:
  uVar22 = uVar38 << 8;
  uVar14 = (uint)(uVar38 >> 0x28) & 0xff0000 | uVar14;
  for (iVar48 = iVar48 + -8; iVar48 < 8; iVar48 = iVar48 + 8) {
    if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar14;
        *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
        *(ulong *)((long)p + 0x4c8) = uVar22;
        *(int *)((long)p + 0x4d0) = iVar48;
        *(uint **)((long)p + 0x498) = uStack_78;
        *(undefined4 *)((long)p + 0x4f2c) = uVar40;
        *(int *)((long)p + 0x4f30) = iStack_a4;
        *(int *)((long)p + 0x4f34) = (int)uStack_a0;
        *(int *)((long)p + 0x4f38) = iStack_a8;
        *(undefined4 *)((long)p + 0x4f3c) = uVar29;
        *(undefined4 *)((long)p + 0x4f44) = uVar34;
        *(undefined4 *)((long)p + 0x4f48) = uVar37;
        *(int *)((long)p + 0x4f18) = (int)uStack_68;
        puVar26 = *(uint **)((long)p + 0x490);
        plVar19 = *(long **)((long)p + 0x558);
        puVar16 = *(ulong **)((long)p + 0x568);
        goto LAB_00111625;
      }
LAB_001126d3:
      uVar38 = 0;
    }
    else {
LAB_00110175:
      uVar38 = (ulong)(byte)*uStack_78;
      uStack_78 = (uint *)((long)uStack_78 + 1);
    }
    uVar22 = uVar22 | uVar38 << (0x38U - (char)iVar48 & 0x3f);
  }
  uVar38 = uVar22 << 8;
  iVar48 = iVar48 + -8;
  uVar14 = (ushort)(uVar22 >> 0x30) & 0xff00 | uVar14;
  do {
    if (7 < iVar48) {
      uVar22 = uVar38 << 8;
      uVar30 = iVar48 - 8;
      uVar14 = uVar14 | (byte)(uVar38 >> 0x38);
      *(int *)((long)p + 0x4f40) = (int)uStack_68;
      uVar45 = 0;
      uVar38 = 0;
      goto LAB_0011367f;
    }
    if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
      uVar22 = 0;
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar14;
        *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
        *(ulong *)((long)p + 0x4c8) = uVar38;
        *(int *)((long)p + 0x4d0) = iVar48;
        *(uint **)((long)p + 0x498) = uStack_78;
        *(undefined4 *)((long)p + 0x4f2c) = uVar40;
        *(int *)((long)p + 0x4f30) = iStack_a4;
        *(int *)((long)p + 0x4f34) = (int)uStack_a0;
        *(int *)((long)p + 0x4f38) = iStack_a8;
        *(undefined4 *)((long)p + 0x4f3c) = uVar29;
        *(undefined4 *)((long)p + 0x4f44) = uVar34;
        *(undefined4 *)((long)p + 0x4f48) = uVar37;
        *(int *)((long)p + 0x4f18) = (int)uStack_68;
        plVar19 = *(long **)((long)p + 0x558);
        puVar16 = *(ulong **)((long)p + 0x568);
        puVar26 = *(uint **)((long)p + 0x490);
        goto LAB_001118f1;
      }
    }
    else {
LAB_001136ab:
      uVar22 = (ulong)(byte)*uStack_78;
      uStack_78 = (uint *)((long)uStack_78 + 1);
    }
LAB_001136b4:
    cVar8 = (char)iVar48;
    iVar48 = iVar48 + 8;
    uVar38 = uVar38 | uVar22 << (0x38U - cVar8 & 0x3f);
  } while( true );
LAB_00117e9e:
  uVar32 = 0;
  if (*(char *)((long)p + 0x4b0) == '\0') {
    *(uint *)((long)p + 0x510) = uVar11;
    *(uint *)((long)p + 0x514) = uVar39;
    *(ulong *)((long)p + 0x4c8) = uVar38;
    *(int *)((long)p + 0x4d0) = iVar46;
    *(uint **)((long)p + 0x498) = uStack_a0;
    *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
    *(int *)((long)p + 0x4f30) = iStack_a8;
    *(int *)((long)p + 0x4f34) = iStack_a4;
    *(int *)((long)p + 0x4f38) = iVar48;
    *(uint *)((long)p + 0x4f3c) = uVar14;
    *(uint *)((long)p + 0x4f44) = (uint)uStack_68;
    *(uint *)((long)p + 0x4f48) = uVar30;
    *(int *)((long)p + 0x4f18) = (int)uStack_70;
    plVar19 = *(long **)((long)p + 0x558);
    puVar26 = *(uint **)((long)p + 0x490);
    goto LAB_00117045;
  }
  goto LAB_001155d2;
LAB_00116bc1:
  if (7 < iVar48) goto code_r0x00116bcb;
  if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
    uVar38 = 0;
    if (*(char *)((long)p + 0x4b0) == '\0') {
      *(uint *)((long)p + 0x510) = uVar11;
      *(uint *)((long)p + 0x514) = uVar39;
      *(ulong *)((long)p + 0x4c8) = uVar22;
      *(int *)((long)p + 0x4d0) = iVar48;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(undefined4 *)((long)p + 0x4f2c) = uVar40;
      *(int *)((long)p + 0x4f30) = iStack_a8;
      *(int *)((long)p + 0x4f34) = iStack_a4;
      *(undefined4 *)((long)p + 0x4f38) = uStack_ac;
      *(undefined4 *)((long)p + 0x4f3c) = uVar29;
      *(undefined4 *)((long)p + 0x4f44) = uVar34;
      *(undefined4 *)((long)p + 0x4f48) = uVar37;
      *(int *)((long)p + 0x4f18) = (int)uStack_70;
      plVar19 = *(long **)((long)p + 0x558);
      puVar26 = *(uint **)((long)p + 0x490);
      goto LAB_0011723c;
    }
  }
  else {
LAB_00116b92:
    uVar38 = (ulong)(byte)*uStack_a0;
    uStack_a0 = (uint *)((long)uStack_a0 + 1);
  }
LAB_00116ba1:
  cVar8 = (char)iVar48;
  iVar48 = iVar48 + 8;
  uVar22 = uVar22 | uVar38 << (0x38U - cVar8 & 0x3f);
  goto LAB_00116bc1;
code_r0x00116bcb:
  uVar38 = uVar22 << 8;
  uVar11 = (uint)(uVar22 >> 0x28) & 0xff0000 | uVar11;
  for (iVar48 = iVar48 + -8; iVar48 < 8; iVar48 = iVar48 + 8) {
    if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
      uVar22 = 0;
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar11;
        *(uint *)((long)p + 0x514) = uVar39;
        *(ulong *)((long)p + 0x4c8) = uVar38;
        *(int *)((long)p + 0x4d0) = iVar48;
        *(uint **)((long)p + 0x498) = uStack_a0;
        *(undefined4 *)((long)p + 0x4f2c) = uVar40;
        *(int *)((long)p + 0x4f30) = iStack_a8;
        *(int *)((long)p + 0x4f34) = iStack_a4;
        *(undefined4 *)((long)p + 0x4f38) = uStack_ac;
        *(undefined4 *)((long)p + 0x4f3c) = uVar29;
        *(undefined4 *)((long)p + 0x4f44) = uVar34;
        *(undefined4 *)((long)p + 0x4f48) = uVar37;
        *(int *)((long)p + 0x4f18) = (int)uStack_70;
        plVar19 = *(long **)((long)p + 0x558);
        puVar26 = *(uint **)((long)p + 0x490);
        goto LAB_00117022;
      }
    }
    else {
LAB_00115c34:
      uVar22 = (ulong)(byte)*uStack_a0;
      uStack_a0 = (uint *)((long)uStack_a0 + 1);
    }
LAB_00115c43:
    uVar38 = uVar38 | uVar22 << (0x38U - (char)iVar48 & 0x3f);
  }
  uVar22 = uVar38 << 8;
  iVar48 = iVar48 + -8;
  uVar11 = (ushort)(uVar38 >> 0x30) & 0xff00 | uVar11;
  do {
    if (7 < iVar48) {
      uVar38 = uVar22 << 8;
      uVar21 = iVar48 - 8;
      uVar11 = uVar11 | (byte)(uVar22 >> 0x38);
      *(int *)((long)p + 0x4f40) = (int)uStack_70;
      uStack_68 = 0;
      uVar45 = 0;
      goto LAB_00116c36;
    }
    if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
      uVar38 = 0;
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar11;
        *(uint *)((long)p + 0x514) = uVar39;
        *(ulong *)((long)p + 0x4c8) = uVar22;
        *(int *)((long)p + 0x4d0) = iVar48;
        *(uint **)((long)p + 0x498) = uStack_a0;
        *(undefined4 *)((long)p + 0x4f2c) = uVar40;
        *(int *)((long)p + 0x4f30) = iStack_a8;
        *(int *)((long)p + 0x4f34) = iStack_a4;
        *(undefined4 *)((long)p + 0x4f38) = uStack_ac;
        *(undefined4 *)((long)p + 0x4f3c) = uVar29;
        *(undefined4 *)((long)p + 0x4f44) = uVar34;
        *(undefined4 *)((long)p + 0x4f48) = uVar37;
        *(int *)((long)p + 0x4f18) = (int)uStack_70;
        plVar19 = *(long **)((long)p + 0x558);
        puVar26 = *(uint **)((long)p + 0x490);
        goto LAB_00117152;
      }
    }
    else {
LAB_001160c8:
      uVar38 = (ulong)(byte)*uStack_a0;
      uStack_a0 = (uint *)((long)uStack_a0 + 1);
    }
LAB_001160ce:
    cVar8 = (char)iVar48;
    iVar48 = iVar48 + 8;
    uVar22 = uVar22 | uVar38 << (0x38U - cVar8 & 0x3f);
  } while( true );
code_r0x00119c50:
  uVar42 = (uVar43 - 2 & 7) + 2;
  uStack_50 = (uVar43 - 2 >> 3) + 1;
  if (uVar42 == 9) {
    uStack_88 = uVar22 << 0x20;
    prVar35 = (raw_quasi_adaptive_huffman_data_model *)
              ((long)p + (ulong)(6 < uVar30) * 0x80 + 0x4720);
    pdVar28 = *(decoder_tables **)((long)p + (ulong)(6 < uVar30) * 0x80 + 0x4750);
    iVar46 = 9;
    if ((int)uVar21 < 0x18) {
      puVar26 = *(uint **)((long)p + 0x4a0);
      if (uStack_a0 + 1 < puVar26) {
        uVar30 = *uStack_a0;
        uVar21 = uVar21 + 0x20;
        uVar38 = uVar38 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8
                                 | uVar30 << 0x18) << (-(char)uVar21 & 0x3fU);
        uStack_a0 = uStack_a0 + 1;
      }
      else {
        for (; (int)uVar21 < 0x18; uVar21 = uVar21 + 8) {
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
            *(uint *)((long)p + 0x510) = uVar11;
            *(uint *)((long)p + 0x514) = uVar39;
            *(ulong *)((long)p + 0x4c8) = uVar38;
            *(uint *)((long)p + 0x4d0) = uVar21;
            *(uint **)((long)p + 0x498) = uStack_a0;
            *(int *)((long)p + 0x4f70) = iVar46;
            *(uint *)((long)p + 0x4f74) = uStack_50;
            *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
            *(int *)((long)p + 0x4f30) = iStack_a8;
            *(int *)((long)p + 0x4f34) = iStack_a4;
            *(int *)((long)p + 0x4f38) = iVar48;
            *(uint *)((long)p + 0x4f3c) = uStack_88._4_4_;
            *(uint *)((long)p + 0x4f44) = uVar25;
            *(uint *)((long)p + 0x4f48) = uStack_8c;
            *(int *)((long)p + 0x4f18) = (int)uStack_70;
            puVar27 = *(uint **)((long)p + 0x490);
            plVar19 = *(long **)((long)p + 0x558);
            goto LAB_0011a03b;
          }
LAB_00119e7e:
          uVar22 = 0;
          if (uStack_a0 < puVar26) {
            uVar22 = (ulong)(byte)*uStack_a0;
            uStack_a0 = (uint *)((long)uStack_a0 + 1);
          }
          uVar38 = uVar38 | uVar22 << (0x38U - (char)uVar21 & 0x3f);
        }
      }
    }
    uVar30 = (uint)(ushort)(uVar38 >> 0x30);
    if (uVar30 < pdVar28->m_table_max_code) {
      uVar42 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] & 0xffff;
      uVar30 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10;
    }
    else {
      iVar12 = pdVar28->m_decode_start_code_size - 0x41;
      do {
        iVar15 = iVar12;
        iVar12 = iVar15 + 1;
      } while (pdVar28->m_max_codes[iVar15 + 0x40U] <= uVar30);
      uVar42 = (int)(uVar38 >> (-(char)(iVar15 + 1) & 0x3fU)) + pdVar28->m_val_ptrs[iVar15 + 0x40U];
      uVar30 = 0;
      if (uVar42 < prVar35->m_total_syms) {
        uVar30 = uVar42;
      }
      uVar42 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar30];
      uVar30 = iVar15 + 0x41;
    }
    uVar38 = uVar38 << ((byte)uVar30 & 0x3f);
    puVar2 = (prVar35->m_sym_freq).m_p + uVar42;
    *puVar2 = *puVar2 + 1;
    uVar21 = uVar21 - uVar30;
    puVar1 = &prVar35->m_symbols_until_update;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      uStack_88 = CONCAT44(uStack_88._4_4_,uVar39);
      raw_quasi_adaptive_huffman_data_model::update(prVar35);
    }
    uVar42 = uVar42 + iVar46;
    uVar22 = uStack_88 >> 0x20;
  }
  uStack_68 = (ulong)uVar25;
  bVar20 = *(byte *)((long)p + (ulong)uStack_50 + 0x410);
  uVar30 = (uint)bVar20;
  if (uVar30 < 3) {
    while( true ) {
      uStack_88._4_4_ = (uint)uVar22;
      if ((int)uVar30 <= (int)uVar21) break;
      if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
        uVar45 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar11;
          *(uint *)((long)p + 0x514) = uVar39;
          *(ulong *)((long)p + 0x4c8) = uVar38;
          *(uint *)((long)p + 0x4d0) = uVar21;
          *(uint **)((long)p + 0x498) = uStack_a0;
          *(uint *)((long)p + 0x4f70) = uVar42;
          *(uint *)((long)p + 0x4f74) = uStack_50;
          *(uint *)((long)p + 0x4f7c) = uVar30;
          *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
          *(int *)((long)p + 0x4f30) = iStack_a8;
          *(int *)((long)p + 0x4f34) = iStack_a4;
          *(int *)((long)p + 0x4f38) = iVar48;
          *(uint *)((long)p + 0x4f3c) = uStack_88._4_4_;
          *(int *)((long)p + 0x4f44) = (int)uStack_68;
          *(uint *)((long)p + 0x4f48) = uStack_8c;
          *(int *)((long)p + 0x4f18) = (int)uStack_70;
          puVar26 = *(uint **)((long)p + 0x490);
          plVar19 = *(long **)((long)p + 0x558);
          goto LAB_0011712f;
        }
      }
      else {
LAB_0011513f:
        uVar45 = (ulong)(byte)*uStack_a0;
        uStack_a0 = (uint *)((long)uStack_a0 + 1);
      }
LAB_00115150:
      cVar8 = (char)uVar21;
      uVar21 = uVar21 + 8;
      uVar38 = uVar38 | uVar45 << (0x38U - cVar8 & 0x3f);
    }
    iVar46 = (int)(uVar38 >> (-(byte)uVar30 & 0x3f));
    if (uVar30 == 0) {
      iVar46 = 0;
    }
    uVar38 = uVar38 << ((byte)uVar30 & 0x3f);
    uVar21 = uVar21 - uVar30;
  }
  else {
    uStack_88 = uVar22 << 0x20;
    iVar46 = 0;
    uVar43 = uVar21;
    if (4 < bVar20) {
      while( true ) {
        uVar25 = (uint)uStack_68;
        iVar12 = uVar30 - 4;
        uVar43 = uVar21 - iVar12;
        if (iVar12 <= (int)uVar21) break;
        if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
          uVar22 = 0;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar11;
            *(uint *)((long)p + 0x514) = uVar39;
            *(ulong *)((long)p + 0x4c8) = uVar38;
            *(uint *)((long)p + 0x4d0) = uVar21;
            *(uint **)((long)p + 0x498) = uStack_a0;
            *(uint *)((long)p + 0x4f70) = uVar42;
            *(uint *)((long)p + 0x4f74) = uStack_50;
            *(uint *)((long)p + 0x4f7c) = uVar30;
            *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
            *(int *)((long)p + 0x4f30) = iStack_a8;
            *(int *)((long)p + 0x4f34) = iStack_a4;
            *(int *)((long)p + 0x4f38) = iVar48;
            *(uint *)((long)p + 0x4f3c) = uStack_88._4_4_;
            *(uint *)((long)p + 0x4f44) = uVar25;
            *(uint *)((long)p + 0x4f48) = uStack_8c;
            *(int *)((long)p + 0x4f18) = (int)uStack_70;
            puVar26 = *(uint **)((long)p + 0x490);
            plVar19 = *(long **)((long)p + 0x558);
            goto LAB_00116fff;
          }
        }
        else {
LAB_00115a74:
          uVar22 = (ulong)(byte)*uStack_a0;
          puVar26 = (uint *)((long)uStack_a0 + 1);
LAB_00115a87:
          uStack_88 = (ulong)uStack_88._4_4_ << 0x20;
          uStack_a0 = puVar26;
        }
        cVar8 = (char)uVar21;
        uVar21 = uVar21 + 8;
        uVar38 = uVar38 | uVar22 << (0x38U - cVar8 & 0x3f);
      }
      iVar46 = (int)(uVar38 >> (0x44U - (char)uVar30 & 0x3f)) << 4;
      if (iVar12 == 0) {
        iVar46 = 0;
      }
      uVar38 = uVar38 << ((byte)iVar12 & 0x3f);
    }
    prVar35 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820);
    pdVar28 = *(decoder_tables **)((long)p + 0x4850);
    if ((int)uVar43 < 0x18) {
      puVar26 = *(uint **)((long)p + 0x4a0);
      if (uStack_a0 + 1 < puVar26) {
        uVar30 = *uStack_a0;
        uVar43 = uVar43 + 0x20;
        uVar38 = uVar38 | (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8
                                 | uVar30 << 0x18) << (-(char)uVar43 & 0x3fU);
        uStack_a0 = uStack_a0 + 1;
      }
      else {
        for (; (int)uVar43 < 0x18; uVar43 = uVar43 + 8) {
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar35;
            *(uint *)((long)p + 0x510) = uVar11;
            *(uint *)((long)p + 0x514) = uVar39;
            *(ulong *)((long)p + 0x4c8) = uVar38;
            *(uint *)((long)p + 0x4d0) = uVar43;
            *(uint **)((long)p + 0x498) = uStack_a0;
            *(uint *)((long)p + 0x4f70) = uVar42;
            *(uint *)((long)p + 0x4f74) = uStack_50;
            *(int *)((long)p + 0x4f78) = iVar46;
            *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
            *(int *)((long)p + 0x4f30) = iStack_a8;
            *(int *)((long)p + 0x4f34) = iStack_a4;
            *(int *)((long)p + 0x4f38) = iVar48;
            *(uint *)((long)p + 0x4f3c) = uStack_88._4_4_;
            *(uint *)((long)p + 0x4f44) = uVar25;
            *(uint *)((long)p + 0x4f48) = uStack_8c;
            *(int *)((long)p + 0x4f18) = (int)uStack_70;
            puVar27 = *(uint **)((long)p + 0x490);
            plVar19 = *(long **)((long)p + 0x558);
            goto LAB_0011a408;
          }
LAB_0011a249:
          uVar22 = 0;
          if (uStack_a0 < puVar26) {
            uVar22 = (ulong)(byte)*uStack_a0;
            uStack_a0 = (uint *)((long)uStack_a0 + 1);
          }
          uVar38 = uVar38 | uVar22 << (0x38U - (char)uVar43 & 0x3f);
        }
      }
    }
    uVar30 = (uint)(ushort)(uVar38 >> 0x30);
    if (uVar30 < pdVar28->m_table_max_code) {
      uVar21 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] & 0xffff;
      uVar30 = pdVar28->m_lookup[uVar38 >> (-(char)pdVar28->m_table_bits & 0x3fU)] >> 0x10;
    }
    else {
      iVar48 = pdVar28->m_decode_start_code_size - 0x41;
      do {
        iVar12 = iVar48;
        iVar48 = iVar12 + 1;
      } while (pdVar28->m_max_codes[iVar12 + 0x40U] <= uVar30);
      uVar21 = (int)(uVar38 >> (-(char)(iVar12 + 1) & 0x3fU)) + pdVar28->m_val_ptrs[iVar12 + 0x40U];
      uVar30 = 0;
      if (uVar21 < prVar35->m_total_syms) {
        uVar30 = uVar21;
      }
      uVar21 = (uint)pdVar28->m_sorted_symbol_order[(int)uVar30];
      uVar30 = iVar12 + 0x41;
    }
    uVar38 = uVar38 << ((byte)uVar30 & 0x3f);
    puVar2 = (prVar35->m_sym_freq).m_p + uVar21;
    *puVar2 = *puVar2 + 1;
    puVar1 = &prVar35->m_symbols_until_update;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      raw_quasi_adaptive_huffman_data_model::update(prVar35);
    }
    iVar46 = uVar21 + iVar46;
    uStack_68 = (ulong)uVar25;
    uVar21 = uVar43 - uVar30;
  }
  iVar48 = iStack_a4;
  uVar22 = (ulong)(6 < uStack_88._4_4_) * 3 + 7;
  iStack_a4 = iStack_a8;
  iVar12 = uStack_78._4_4_;
  uStack_78._4_4_ = iVar46 + *(int *)((long)p + (ulong)uStack_50 * 4 + 0x10);
  goto LAB_0011a30f;
LAB_00116fd6:
  if (-1 < (int)uVar21) goto code_r0x00116fdf;
  uVar14 = (uint)uStack_68;
  if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
    uVar32 = 0;
    if (*(char *)((long)p + 0x4b0) == '\0') {
      *(uint *)((long)p + 0x510) = uVar11;
      *(uint *)((long)p + 0x514) = uVar39;
      *(ulong *)((long)p + 0x4c8) = uVar38;
      *(uint *)((long)p + 0x4d0) = uVar21;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
      *(int *)((long)p + 0x4f30) = iStack_a8;
      *(int *)((long)p + 0x4f34) = iStack_a4;
      *(int *)((long)p + 0x4f38) = iVar48;
      *(int *)((long)p + 0x4f3c) = (int)uVar22;
      *(int *)((long)p + 0x4f44) = (int)uVar45;
      *(uint *)((long)p + 0x4f48) = uVar14;
      *(int *)((long)p + 0x4f18) = (int)uStack_70;
      puVar26 = *(uint **)((long)p + 0x490);
      plVar19 = *(long **)((long)p + 0x558);
      goto LAB_00117347;
    }
  }
  else {
LAB_00116fb0:
    uVar32 = (ulong)(byte)*uStack_a0;
    uStack_a0 = (uint *)((long)uStack_a0 + 1);
  }
LAB_00116fb6:
  cVar8 = (char)uVar21;
  uVar21 = uVar21 + 8;
  uVar38 = uVar38 | uVar32 << (0x38U - cVar8 & 0x3f);
  uStack_68 = (ulong)uVar14;
  goto LAB_00116fd6;
code_r0x00116fdf:
  uVar38 = uVar38 << ((byte)uVar21 & 7);
  uVar21 = uVar21 & 0x7ffffff8;
  uVar31 = uStack_68;
  goto LAB_001186a3;
LAB_00114285:
  if ((uVar30 & 7) != 0) goto LAB_00111544;
LAB_00113178:
  *(int *)((long)p + 0x4f28) = *(int *)((long)p + 0x4f28) + 1;
  iVar48 = *(int *)((long)p + 0x598);
  if (iVar48 == 0) {
LAB_00113128:
    do {
      if (1 < (int)uVar30) {
        *(uint *)((long)p + 0x4f4c) = (uint)(uVar22 >> 0x3e);
        lVar10 = (*(code *)(&DAT_0011fa04 + *(int *)(&DAT_0011fa04 + (uVar22 >> 0x3e) * 4)))();
        return lVar10;
      }
      if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
        uVar32 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar14;
          *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
          *(ulong *)((long)p + 0x4c8) = uVar22;
          *(uint *)((long)p + 0x4d0) = uVar30;
          *(uint **)((long)p + 0x498) = uStack_78;
          *(int *)((long)p + 0x4f2c) = iVar46;
          *(int *)((long)p + 0x4f30) = iStack_a4;
          *(int *)((long)p + 0x4f34) = (int)uStack_a0;
          *(int *)((long)p + 0x4f38) = iStack_a8;
          *(uint *)((long)p + 0x4f3c) = uStack_8c;
          *(int *)((long)p + 0x4f44) = (int)uVar38;
          *(int *)((long)p + 0x4f48) = (int)uVar45;
          *(int *)((long)p + 0x4f18) = (int)uStack_68;
          puVar26 = *(uint **)((long)p + 0x490);
          plVar19 = *(long **)((long)p + 0x558);
          puVar16 = *(ulong **)((long)p + 0x568);
          goto LAB_00111731;
        }
      }
      else {
LAB_00110266:
        uVar32 = (ulong)(byte)*uStack_78;
        uStack_78 = (uint *)((long)uStack_78 + 1);
      }
LAB_0011026f:
      cVar8 = (char)uVar30;
      uVar30 = uVar30 + 8;
      uVar22 = uVar22 | uVar32 << (0x38U - cVar8 & 0x3f);
    } while( true );
  }
LAB_00113190:
  if (iVar48 == 2) {
    if ((uVar30 & 7) != 0) {
      for (; (int)uVar30 < 0; uVar30 = uVar30 + 8) {
        uVar11 = (uint)uVar38;
        if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
          uVar32 = 0;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar14;
            *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
            *(ulong *)((long)p + 0x4c8) = uVar22;
            *(uint *)((long)p + 0x4d0) = uVar30;
            *(uint **)((long)p + 0x498) = uStack_78;
            *(int *)((long)p + 0x4f2c) = iVar46;
            *(int *)((long)p + 0x4f30) = iStack_a4;
            *(int *)((long)p + 0x4f34) = (int)uStack_a0;
            *(int *)((long)p + 0x4f38) = iStack_a8;
            *(uint *)((long)p + 0x4f3c) = uStack_8c;
            *(uint *)((long)p + 0x4f44) = uVar11;
            *(int *)((long)p + 0x4f48) = (int)uVar45;
            *(int *)((long)p + 0x4f18) = (int)uStack_68;
            puVar26 = *(uint **)((long)p + 0x490);
            plVar19 = *(long **)((long)p + 0x558);
            puVar16 = *(ulong **)((long)p + 0x568);
            goto LAB_001119e9;
          }
        }
        else {
LAB_00111335:
          uVar32 = (ulong)(byte)*uStack_78;
          puVar26 = (uint *)((long)uStack_78 + 1);
LAB_0011133e:
          uVar38 = (ulong)uVar11;
          uStack_78 = puVar26;
        }
        uVar22 = uVar22 | uVar32 << (0x38U - (char)uVar30 & 0x3f);
      }
      uVar22 = uVar22 << ((byte)uVar30 & 7);
      uVar30 = uVar30 & 0x7ffffff8;
    }
    for (; (int)uVar30 < 0x10; uVar30 = uVar30 + 8) {
      uVar11 = (uint)uVar38;
      if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
        uVar32 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar14;
          *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
          *(ulong *)((long)p + 0x4c8) = uVar22;
          *(uint *)((long)p + 0x4d0) = uVar30;
          *(uint **)((long)p + 0x498) = uStack_78;
          *(int *)((long)p + 0x4f2c) = iVar46;
          *(int *)((long)p + 0x4f30) = iStack_a4;
          *(int *)((long)p + 0x4f34) = (int)uStack_a0;
          *(int *)((long)p + 0x4f38) = iStack_a8;
          *(uint *)((long)p + 0x4f3c) = uStack_8c;
          *(uint *)((long)p + 0x4f44) = uVar11;
          *(int *)((long)p + 0x4f48) = (int)uVar45;
          *(int *)((long)p + 0x4f18) = (int)uStack_68;
          puVar26 = *(uint **)((long)p + 0x490);
          plVar19 = *(long **)((long)p + 0x558);
          puVar16 = *(ulong **)((long)p + 0x568);
          goto LAB_00111aa1;
        }
      }
      else {
LAB_0011142b:
        uVar32 = (ulong)(byte)*uStack_78;
        puVar26 = (uint *)((long)uStack_78 + 1);
LAB_00111434:
        uVar38 = (ulong)uVar11;
        uStack_78 = puVar26;
      }
      uVar22 = uVar22 | uVar32 << (0x38U - (char)uVar30 & 0x3f);
    }
    *(uint *)((long)p + 0x4f68) = (uint)(ushort)(uVar22 >> 0x30);
    uVar32 = uVar22 << 0x10;
    for (iVar48 = uVar30 - 0x10; iVar48 < 0x10; iVar48 = iVar48 + 8) {
      uVar11 = (uint)uVar38;
      if (uStack_78 == *(uint **)((long)p + 0x4a0)) {
        uVar22 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar14;
          *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
          *(ulong *)((long)p + 0x4c8) = uVar32;
          *(int *)((long)p + 0x4d0) = iVar48;
          *(uint **)((long)p + 0x498) = uStack_78;
          *(int *)((long)p + 0x4f2c) = iVar46;
          *(int *)((long)p + 0x4f30) = iStack_a4;
          *(int *)((long)p + 0x4f34) = (int)uStack_a0;
          *(int *)((long)p + 0x4f38) = iStack_a8;
          *(uint *)((long)p + 0x4f3c) = uStack_8c;
          *(uint *)((long)p + 0x4f44) = uVar11;
          *(int *)((long)p + 0x4f48) = (int)uVar45;
          *(int *)((long)p + 0x4f18) = (int)uStack_68;
          puVar26 = *(uint **)((long)p + 0x490);
          plVar19 = *(long **)((long)p + 0x558);
          puVar16 = *(ulong **)((long)p + 0x568);
          goto LAB_001119cd;
        }
      }
      else {
LAB_0011123f:
        uVar22 = (ulong)(byte)*uStack_78;
        puVar26 = (uint *)((long)uStack_78 + 1);
LAB_00111248:
        uVar38 = (ulong)uVar11;
        uStack_78 = puVar26;
      }
      uVar32 = uVar32 | uVar22 << (0x38U - (char)iVar48 & 0x3f);
    }
    uVar22 = uVar32 << 0x10;
    uVar30 = iVar48 - 0x10;
    uVar11 = *(int *)((long)p + 0x4f68) << 0x10 | (uint)(ushort)(uVar32 >> 0x30);
    *(uint *)((long)p + 0x4f68) = uVar11;
    if (*(int *)((long)p + 0x594) == 0) {
      lVar23 = 0x548;
    }
    else {
      uVar13 = adler32(pbVar5,uStack_68 & 0xffffffff,1);
      *(uint *)((long)p + 0x548) = uVar13;
      if (*(uint *)((long)p + 0x4f68) == uVar13) goto LAB_0011327c;
      uVar11 = 7;
      lVar23 = 0x598;
    }
    *(uint *)((long)p + lVar23) = uVar11;
  }
LAB_0011327c:
  *(uint *)((long)p + 0x510) = uVar14;
  *(uint *)((long)p + 0x514) = uStack_a0._4_4_;
  *(ulong *)((long)p + 0x4c8) = uVar22;
  *(uint *)((long)p + 0x4d0) = uVar30;
  *(uint **)((long)p + 0x498) = uStack_78;
  uVar18 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x490));
  **(uint64 **)((long)p + 0x558) = uVar18;
  **(ulong **)((long)p + 0x568) = uStack_68 & 0xffffffff;
LAB_001132c4:
  *(undefined4 *)p = 0x35c;
switchD_0010f80a_caseD_338:
  return *(lzham_decompress_status_t *)((long)p + 0x598);
  while( true ) {
    uVar24 = uVar38 << 8;
    uVar11 = uVar11 - 8;
    uVar39 = (int)uStack_70 + 1;
    pbVar5[uStack_70] = (byte)(uVar38 >> 0x38);
    uStack_70 = (ulong)uVar39;
    uVar38 = uVar24;
    if (uVar14 < uVar39) {
      *(undefined4 *)((long)p + 0x510) = uVar40;
      *(undefined4 *)((long)p + 0x514) = uVar29;
      *(ulong *)((long)p + 0x4c8) = uVar24;
      *(uint *)((long)p + 0x4d0) = uVar11;
      *(uint **)((long)p + 0x498) = uStack_a0;
      *(uint *)((long)p + 0x4f90) = uVar30;
      *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
      *(int *)((long)p + 0x4f30) = iStack_a8;
      *(int *)((long)p + 0x4f34) = iStack_a4;
      *(int *)((long)p + 0x4f38) = iVar48;
      *(int *)((long)p + 0x4f3c) = (int)uVar22;
      *(int *)((long)p + 0x4f44) = (int)uVar45;
      *(int *)((long)p + 0x4f48) = (int)uVar31;
      *(uint *)((long)p + 0x4f18) = uVar39;
      pvVar33 = *(void **)((long)p + 0x540);
      *(void **)((long)p + 0x4f50) = pvVar33;
      *(ulong *)((long)p + 0x4f58) = uVar32;
      uVar22 = uVar32;
      goto LAB_0011827f;
    }
LAB_00118171:
    uVar30 = uVar30 - 1;
    if (uVar30 == 0) break;
LAB_00118175:
    if ((int)uVar11 < 8) goto LAB_001181c5;
  }
  uVar30 = 0;
LAB_001181c5:
  *(undefined4 *)((long)p + 0x510) = uVar40;
  *(undefined4 *)((long)p + 0x514) = uVar29;
  *(ulong *)((long)p + 0x4c8) = uVar38;
  *(uint *)((long)p + 0x4d0) = uVar11;
  *(uint **)((long)p + 0x498) = uStack_a0;
LAB_00118360:
  while( true ) {
    uVar39 = (uint)uVar45;
    uVar11 = (uint)uVar22;
    if (uVar30 == 0) break;
    uStack_8c = (uint)uVar31;
    uVar38 = (long)uStack_a0 - *(long *)((long)p + 0x490);
    puVar16 = *(ulong **)((long)p + 0x558);
    uVar22 = *puVar16 - uVar38;
LAB_00118380:
    iVar46 = (int)uStack_70;
    if (uVar22 == 0) {
      *puVar16 = uVar38;
      **(undefined8 **)((long)p + 0x568) = 0;
      if (*(char *)((long)p + 0x570) != '\x01') {
        *(uint *)((long)p + 0x4f90) = uVar30;
        *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
        *(int *)((long)p + 0x4f30) = iStack_a8;
        *(int *)((long)p + 0x4f34) = iStack_a4;
        *(int *)((long)p + 0x4f38) = iVar48;
        *(uint *)((long)p + 0x4f3c) = uVar11;
        *(uint *)((long)p + 0x4f44) = uVar39;
        *(uint *)((long)p + 0x4f48) = uStack_8c;
        *(int *)((long)p + 0x4f18) = iVar46;
        *(undefined4 *)p = 0x15a;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      goto LAB_0011847d;
    }
    uVar21 = uVar30;
    if (uVar22 < uVar30) {
      uVar21 = (uint)uVar22;
    }
    uVar42 = (int)uVar32 - iVar46;
    if (uVar21 <= uVar42) {
      uVar42 = uVar21;
    }
    memcpy(pbVar5 + uStack_70,(void *)(*(long *)((long)p + 0x550) + uVar38),(ulong)uVar42);
    uVar30 = uVar30 - uVar42;
    lVar23 = *(long *)((long)p + 0x550);
    lVar6 = **(long **)((long)p + 0x558);
    uStack_a0 = (uint *)(uVar38 + lVar23 + (ulong)uVar42);
    *(long *)((long)p + 0x490) = lVar23;
    *(uint **)((long)p + 0x498) = uStack_a0;
    *(long *)((long)p + 0x4a8) = lVar6;
    *(long *)((long)p + 0x4a0) = lVar23 + lVar6;
    *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
    uVar42 = uVar42 + iVar46;
    if (uVar14 < uVar42) {
      *(uint *)((long)p + 0x4f90) = uVar30;
      *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
      *(int *)((long)p + 0x4f30) = iStack_a8;
      *(int *)((long)p + 0x4f34) = iStack_a4;
      *(int *)((long)p + 0x4f38) = iVar48;
      *(uint *)((long)p + 0x4f3c) = uVar11;
      *(uint *)((long)p + 0x4f44) = uVar39;
      *(uint *)((long)p + 0x4f48) = uStack_8c;
      *(uint *)((long)p + 0x4f18) = uVar42;
      pvVar33 = *(void **)((long)p + 0x540);
      *(void **)((long)p + 0x4f50) = pvVar33;
      *(ulong *)((long)p + 0x4f58) = uVar32;
      uVar22 = uVar32;
      goto LAB_001184fb;
    }
    uStack_70 = (ulong)uVar42;
    uVar45 = (ulong)uVar39;
    uVar22 = (ulong)uVar11;
    uVar31 = (ulong)uStack_8c;
  }
  uVar11 = *(uint *)((long)p + 0x510);
  uVar39 = *(uint *)((long)p + 0x514);
  uVar38 = *(ulong *)((long)p + 0x4c8);
  uVar21 = *(uint *)((long)p + 0x4d0);
LAB_001186a3:
  uStack_68 = uVar45;
  *(int *)((long)p + 0x4f28) = *(int *)((long)p + 0x4f28) + 1;
  iVar46 = *(int *)((long)p + 0x598);
  if (iVar46 == 0) {
LAB_0011863f:
    do {
      if (1 < (int)uVar21) {
        *(uint *)((long)p + 0x4f4c) = (uint)(uVar38 >> 0x3e);
        lVar10 = (*(code *)(&DAT_0011fa4c + *(int *)(&DAT_0011fa4c + (uVar38 >> 0x3e) * 4)))();
        return lVar10;
      }
      uVar14 = (uint)uVar31;
      if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
        uVar32 = 0;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar11;
          *(uint *)((long)p + 0x514) = uVar39;
          *(ulong *)((long)p + 0x4c8) = uVar38;
          *(uint *)((long)p + 0x4d0) = uVar21;
          *(uint **)((long)p + 0x498) = uStack_a0;
          *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
          *(int *)((long)p + 0x4f30) = iStack_a8;
          *(int *)((long)p + 0x4f34) = iStack_a4;
          *(int *)((long)p + 0x4f38) = iVar48;
          *(int *)((long)p + 0x4f3c) = (int)uVar22;
          *(int *)((long)p + 0x4f44) = (int)uStack_68;
          *(uint *)((long)p + 0x4f48) = uVar14;
          *(int *)((long)p + 0x4f18) = (int)uStack_70;
          puVar26 = *(uint **)((long)p + 0x490);
          plVar19 = *(long **)((long)p + 0x558);
          goto LAB_001170ae;
        }
      }
      else {
LAB_00115d27:
        uVar32 = (ulong)(byte)*uStack_a0;
        uStack_a0 = (uint *)((long)uStack_a0 + 1);
      }
LAB_00115d2d:
      cVar8 = (char)uVar21;
      uVar21 = uVar21 + 8;
      uVar38 = uVar38 | uVar32 << (0x38U - cVar8 & 0x3f);
      uVar31 = (ulong)uVar14;
    } while( true );
  }
  if ((int)uStack_70 == 0) {
    uVar40 = 0;
LAB_001187ff:
    if (iVar46 == 2) {
      if ((uVar21 & 7) != 0) {
        for (; (int)uVar21 < 0; uVar21 = uVar21 + 8) {
          uVar14 = (uint)uVar31;
          if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
            uVar32 = 0;
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar11;
              *(uint *)((long)p + 0x514) = uVar39;
              *(ulong *)((long)p + 0x4c8) = uVar38;
              *(uint *)((long)p + 0x4d0) = uVar21;
              *(uint **)((long)p + 0x498) = uStack_a0;
              *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
              *(int *)((long)p + 0x4f30) = iStack_a8;
              *(int *)((long)p + 0x4f34) = iStack_a4;
              *(int *)((long)p + 0x4f38) = iVar48;
              *(int *)((long)p + 0x4f3c) = (int)uVar22;
              *(int *)((long)p + 0x4f44) = (int)uStack_68;
              *(uint *)((long)p + 0x4f48) = uVar14;
              *(undefined4 *)((long)p + 0x4f18) = uVar40;
              puVar26 = *(uint **)((long)p + 0x490);
              plVar19 = *(long **)((long)p + 0x558);
              goto LAB_00117301;
            }
          }
          else {
LAB_00116de5:
            uVar32 = (ulong)(byte)*uStack_a0;
            uStack_a0 = (uint *)((long)uStack_a0 + 1);
          }
LAB_00116def:
          uVar38 = uVar38 | uVar32 << (0x38U - (char)uVar21 & 0x3f);
          uVar31 = (ulong)uVar14;
        }
        uVar38 = uVar38 << ((byte)uVar21 & 7);
        uVar21 = uVar21 & 0x7ffffff8;
      }
      for (; (int)uVar21 < 0x10; uVar21 = uVar21 + 8) {
        uVar14 = (uint)uVar31;
        if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
          uVar32 = 0;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar11;
            *(uint *)((long)p + 0x514) = uVar39;
            *(ulong *)((long)p + 0x4c8) = uVar38;
            *(uint *)((long)p + 0x4d0) = uVar21;
            *(uint **)((long)p + 0x498) = uStack_a0;
            *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
            *(int *)((long)p + 0x4f30) = iStack_a8;
            *(int *)((long)p + 0x4f34) = iStack_a4;
            *(int *)((long)p + 0x4f38) = iVar48;
            *(int *)((long)p + 0x4f3c) = (int)uVar22;
            *(int *)((long)p + 0x4f44) = (int)uStack_68;
            *(uint *)((long)p + 0x4f48) = uVar14;
            *(undefined4 *)((long)p + 0x4f18) = uVar40;
            puVar26 = *(uint **)((long)p + 0x490);
            plVar19 = *(long **)((long)p + 0x558);
            goto LAB_00117324;
          }
        }
        else {
LAB_00116ec5:
          uVar32 = (ulong)(byte)*uStack_a0;
          uStack_a0 = (uint *)((long)uStack_a0 + 1);
        }
LAB_00116ecf:
        uVar38 = uVar38 | uVar32 << (0x38U - (char)uVar21 & 0x3f);
        uVar31 = (ulong)uVar14;
      }
      *(uint *)((long)p + 0x4f68) = (uint)(ushort)(uVar38 >> 0x30);
      uVar32 = uVar38 << 0x10;
      for (iVar46 = uVar21 - 0x10; iVar46 < 0x10; iVar46 = iVar46 + 8) {
        uVar14 = (uint)uVar31;
        if (uStack_a0 == *(uint **)((long)p + 0x4a0)) {
          uVar38 = 0;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar11;
            *(uint *)((long)p + 0x514) = uVar39;
            *(ulong *)((long)p + 0x4c8) = uVar32;
            *(int *)((long)p + 0x4d0) = iVar46;
            *(uint **)((long)p + 0x498) = uStack_a0;
            *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
            *(int *)((long)p + 0x4f30) = iStack_a8;
            *(int *)((long)p + 0x4f34) = iStack_a4;
            *(int *)((long)p + 0x4f38) = iVar48;
            *(int *)((long)p + 0x4f3c) = (int)uVar22;
            *(int *)((long)p + 0x4f44) = (int)uStack_68;
            *(uint *)((long)p + 0x4f48) = uVar14;
            *(undefined4 *)((long)p + 0x4f18) = uVar40;
            puVar26 = *(uint **)((long)p + 0x490);
            plVar19 = *(long **)((long)p + 0x558);
            goto LAB_001172de;
          }
        }
        else {
LAB_00116d05:
          uVar38 = (ulong)(byte)*uStack_a0;
          uStack_a0 = (uint *)((long)uStack_a0 + 1);
        }
LAB_00116d0f:
        uVar32 = uVar32 | uVar38 << (0x38U - (char)iVar46 & 0x3f);
        uVar31 = (ulong)uVar14;
      }
      uVar38 = uVar32 << 0x10;
      uVar21 = iVar46 - 0x10;
      uVar14 = *(int *)((long)p + 0x4f68) << 0x10 | (uint)(ushort)(uVar32 >> 0x30);
      *(uint *)((long)p + 0x4f68) = uVar14;
      if (*(int *)((long)p + 0x594) == 0) {
        *(uint *)((long)p + 0x548) = uVar14;
      }
      else if (uVar14 != *(uint *)((long)p + 0x548)) {
        *(undefined4 *)((long)p + 0x598) = 7;
      }
    }
    *(uint *)((long)p + 0x510) = uVar11;
    *(uint *)((long)p + 0x514) = uVar39;
    *(ulong *)((long)p + 0x4c8) = uVar38;
    *(uint *)((long)p + 0x4d0) = uVar21;
    *(uint **)((long)p + 0x498) = uStack_a0;
    uVar18 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x490));
    **(uint64 **)((long)p + 0x558) = uVar18;
    **(undefined8 **)((long)p + 0x568) = 0;
LAB_0011892f:
    *(undefined4 *)p = 0x35c;
switchD_001152f2_caseD_338:
    lVar10 = *(lzham_decompress_status_t *)((long)p + 0x598);
  }
  else {
    *(uint *)((long)p + 0x510) = uVar11;
    *(uint *)((long)p + 0x514) = uVar39;
    *(ulong *)((long)p + 0x4c8) = uVar38;
    *(uint *)((long)p + 0x4d0) = uVar21;
    *(uint **)((long)p + 0x498) = uStack_a0;
    *(int *)((long)p + 0x4f2c) = uStack_78._4_4_;
    *(int *)((long)p + 0x4f30) = iStack_a8;
    *(int *)((long)p + 0x4f34) = iStack_a4;
    *(int *)((long)p + 0x4f38) = iVar48;
    *(int *)((long)p + 0x4f3c) = (int)uVar22;
    *(int *)((long)p + 0x4f44) = (int)uStack_68;
    *(int *)((long)p + 0x4f48) = (int)uVar31;
    *(int *)((long)p + 0x4f18) = (int)uStack_70;
    pvVar33 = *(void **)((long)p + 0x540);
    *(void **)((long)p + 0x4f50) = pvVar33;
    *(ulong *)((long)p + 0x4f58) = uStack_70;
LAB_0011874f:
    uVar32 = **(ulong **)((long)p + 0x568);
    if (uVar32 <= uStack_70) {
      uStack_70 = uVar32;
    }
    *(ulong *)((long)p + 0x4f60) = uStack_70;
    if (*(int *)((long)p + 0x594) == 0) {
      memcpy(*(void **)((long)p + 0x560),pvVar33,uStack_70);
    }
    else if (uVar32 != 0) {
      uVar32 = 0;
      do {
        sVar47 = uStack_70 - uVar32;
        if (0x1fff < sVar47) {
          sVar47 = 0x2000;
        }
        memcpy((void *)(*(long *)((long)p + 0x560) + uVar32),
               (void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47);
        uVar13 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar32),sVar47,
                         *(uint *)((long)p + 0x548));
        *(uint *)((long)p + 0x548) = uVar13;
        uVar32 = uVar32 + sVar47;
        uStack_70 = *(ulong *)((long)p + 0x4f60);
      } while (uVar32 < uStack_70);
    }
    **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
    **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
    *(undefined4 *)p = 0x337;
LAB_001188d7:
    lVar10 = LZHAM_DECOMP_STATUS_NOT_FINISHED;
  }
  return lVar10;
}

Assistant:

lzham_decompress_status_t lzham_lib_decompress(
      lzham_decompress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pOut_buf_size) && (!pOut_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      pState->m_pIn_buf = pIn_buf;
      pState->m_pIn_buf_size = pIn_buf_size;
      pState->m_pOut_buf = pOut_buf;
      pState->m_pOut_buf_size = pOut_buf_size;
      pState->m_no_more_input_bytes_flag = (no_more_input_bytes_flag != 0);

      if (pState->m_params.m_output_unbuffered)
      {
         if (!pState->m_pOrig_out_buf)
         {
            pState->m_pOrig_out_buf = pOut_buf;
            pState->m_orig_out_buf_size = *pOut_buf_size;
         }
         else
         {
            if ((pState->m_pOrig_out_buf != pOut_buf) || (pState->m_orig_out_buf_size != *pOut_buf_size))
            {
               return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
            }
         }
      }

      lzham_decompress_status_t status;
      if (pState->m_params.m_output_unbuffered)
         status = pState->decompress<true>();
      else
         status = pState->decompress<false>();

      //void *q = alloca(4096);
      //memset(q, 0xFE, 4096);

      return status;
   }